

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O3

void sequence_iterator_duplicate_test(void)

{
  fdb_encryption_key *pfVar1;
  undefined1 auVar2 [16];
  undefined1 *puVar3;
  bool *pbVar4;
  undefined8 uVar5;
  fdb_status fVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar11;
  btree *pbVar12;
  fdb_kvs_handle *pfVar13;
  fdb_iterator **ppfVar14;
  fdb_file_handle **ptr_fhandle;
  fdb_kvs_handle *pfVar15;
  int iVar16;
  ulong uVar17;
  fdb_file_handle *ptr_handle;
  fdb_kvs_handle *pfVar18;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar19;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 *ptr_handle_00;
  fdb_doc *pfVar20;
  fdb_doc *pfVar21;
  fdb_kvs_handle *pfVar22;
  fdb_kvs_handle **ptr_iterator;
  fdb_config **ptr_iterator_00;
  fdb_kvs_handle **ppfVar23;
  fdb_config *pfVar24;
  uint uVar25;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 unaff_RBP;
  fdb_doc **ppfVar26;
  char *pcVar27;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 unaff_R12;
  long lVar28;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar29;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 unaff_R13;
  fdb_kvs_config *pfVar30;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar31;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aVar32;
  fdb_doc *doc;
  fdb_kvs_handle *pfVar33;
  fdb_config *pfVar34;
  char *doc_00;
  uint uVar35;
  btree_kv_ops *ptr_fhandle_00;
  bool bVar36;
  fdb_kvs_handle *db;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_iterator *pfStack_61b8;
  fdb_kvs_handle *pfStack_61b0;
  fdb_file_handle *pfStack_61a8;
  fdb_doc *pfStack_61a0;
  fdb_kvs_config fStack_6198;
  timeval tStack_6180;
  fdb_config fStack_6170;
  fdb_config *pfStack_6078;
  fdb_iterator *pfStack_6060;
  fdb_kvs_handle *pfStack_6058;
  fdb_doc *pfStack_6050;
  fdb_file_handle *pfStack_6048;
  fdb_kvs_config fStack_6040;
  timeval tStack_6028;
  fdb_config fStack_6018;
  fdb_config *pfStack_5f20;
  fdb_iterator *pfStack_5f08;
  fdb_kvs_handle *pfStack_5f00;
  fdb_file_handle *pfStack_5ef8;
  fdb_doc *pfStack_5ef0;
  uint64_t uStack_5ee8;
  undefined1 uStack_5ee0;
  undefined7 uStack_5ed8;
  undefined4 uStack_5ed1;
  undefined8 uStack_5ec8;
  undefined7 uStack_5ec0;
  undefined4 uStack_5eb9;
  fdb_kvs_config fStack_5eb0;
  timeval tStack_5e98;
  undefined4 uStack_5e88;
  undefined1 uStack_5e84;
  fdb_config fStack_5d80;
  char acStack_5c88 [256];
  fdb_config *pfStack_5b88;
  char *pcStack_5b80;
  code *pcStack_5b78;
  fdb_doc *pfStack_5b60;
  fdb_iterator *pfStack_5b58;
  fdb_kvs_handle *pfStack_5b50;
  fdb_file_handle *pfStack_5b48;
  fdb_kvs_config fStack_5b40;
  timeval tStack_5b28;
  fdb_config fStack_5b18;
  fdb_iterator **ppfStack_5a20;
  fdb_iterator *pfStack_5a08;
  fdb_doc *pfStack_5a00;
  fdb_kvs_handle *pfStack_59f8;
  fdb_file_handle *pfStack_59f0;
  timeval tStack_59e8;
  fdb_iterator *apfStack_59d8 [33];
  fdb_kvs_config fStack_58d0;
  char acStack_58b8 [264];
  fdb_config fStack_57b0;
  char acStack_56b8 [256];
  fdb_kvs_handle *pfStack_55b8;
  fdb_kvs_handle *pfStack_55b0;
  fdb_doc **ppfStack_55a8;
  fdb_doc **ppfStack_55a0;
  fdb_doc **ppfStack_5598;
  fdb_kvs_handle *pfStack_5588;
  fdb_file_handle *pfStack_5580;
  fdb_iterator *pfStack_5578;
  fdb_doc *pfStack_5570;
  fdb_kvs_handle *pfStack_5568;
  fdb_doc *pfStack_5560;
  fdb_kvs_config fStack_5558;
  timeval tStack_5540;
  fdb_doc *apfStack_5530 [32];
  undefined1 auStack_5430 [272];
  uint8_t auStack_5320 [20];
  undefined4 uStack_530c;
  undefined4 uStack_5304;
  undefined1 uStack_52fa;
  fdb_doc *apfStack_5230 [500];
  fdb_kvs_handle afStack_4290 [7];
  fdb_kvs_handle **ppfStack_32e8;
  fdb_kvs_handle *pfStack_32e0;
  fdb_doc **ppfStack_32d0;
  fdb_doc **ppfStack_32c8;
  fdb_doc **ppfStack_32c0;
  fdb_kvs_handle *pfStack_32b0;
  fdb_iterator *pfStack_32a8;
  fdb_iterator *pfStack_32a0;
  fdb_kvs_handle *pfStack_3298;
  fdb_file_handle *pfStack_3290;
  fdb_doc *pfStack_3288;
  fdb_file_handle *pfStack_3280;
  undefined1 auStack_3278 [56];
  fdb_config fStack_3240;
  fdb_doc *apfStack_3148 [65];
  fdb_config **ppfStack_2f40;
  btree *pbStack_2f38;
  fdb_kvs_handle **ppfStack_2f30;
  fdb_config *pfStack_2f28;
  fdb_file_handle **ppfStack_2f20;
  fdb_kvs_handle *pfStack_2f18;
  fdb_config *pfStack_2f08;
  fdb_config *pfStack_2f00;
  fdb_kvs_handle *pfStack_2ef8;
  fdb_file_handle *pfStack_2ef0;
  fdb_kvs_config fStack_2ee8;
  fdb_doc *apfStack_2ed0 [5];
  fdb_kvs_handle *apfStack_2ea8 [5];
  timeval tStack_2e80;
  fdb_kvs_handle fStack_2e70;
  fdb_config fStack_2b70;
  fdb_kvs_handle **ppfStack_2a78;
  btree *pbStack_2a70;
  fdb_kvs_handle **ppfStack_2a68;
  undefined8 *puStack_2a60;
  undefined7 *puStack_2a58;
  fdb_kvs_handle *pfStack_2a50;
  fdb_kvs_handle *pfStack_2a40;
  fdb_kvs_handle *pfStack_2a38;
  fdb_kvs_handle *pfStack_2a30;
  undefined7 uStack_2a28;
  undefined4 uStack_2a21;
  fdb_kvs_handle *pfStack_2a18;
  fdb_file_handle *pfStack_2a10;
  undefined1 auStack_2a08 [16];
  undefined7 uStack_29f8;
  undefined1 uStack_29f1;
  undefined7 uStack_29f0;
  undefined8 uStack_29e8;
  void *pvStack_29e0;
  undefined1 uStack_29d8;
  timeval tStack_29d0;
  undefined1 auStack_29c0 [40];
  fdb_file_handle *pfStack_2998;
  undefined4 uStack_2984;
  fdb_iterator **ppfStack_28b0;
  char *pcStack_28a8;
  fdb_kvs_handle *pfStack_28a0;
  char *pcStack_2898;
  char *pcStack_2890;
  code *pcStack_2888;
  fdb_iterator *pfStack_2878;
  fdb_iterator *pfStack_2870;
  fdb_kvs_handle *pfStack_2868;
  fdb_kvs_handle *pfStack_2860;
  fdb_file_handle *pfStack_2858;
  timeval tStack_2850;
  fdb_kvs_config fStack_2840;
  fdb_config fStack_2828;
  char acStack_2730 [256];
  char acStack_2630 [264];
  fdb_kvs_handle *pfStack_2528;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_2520;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_2518;
  fdb_kvs_handle *pfStack_2510;
  fdb_kvs_handle *pfStack_2508;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_2500;
  undefined1 auStack_24f0 [16];
  fdb_kvs_handle *pfStack_24e0;
  fdb_file_handle *pfStack_24d8;
  fdb_kvs_handle *pfStack_24d0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_24c8 [11];
  undefined1 auStack_2470 [40];
  fdb_kvs_handle fStack_2448;
  fdb_config fStack_2148;
  fdb_config *pfStack_2050;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_2048;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_2040;
  fdb_doc *pfStack_2038;
  btree *pbStack_2030;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_2028;
  undefined1 auStack_2010 [24];
  fdb_file_handle *pfStack_1ff8;
  undefined1 auStack_1ff0 [48];
  timeval tStack_1fc0;
  fdb_doc *apfStack_1fb0 [24];
  long lStack_1ef0;
  long lStack_1ec0;
  fdb_config fStack_1c90;
  fdb_doc *pfStack_1b98;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1b90;
  fdb_doc *pfStack_1b88;
  btree *pbStack_1b80;
  undefined1 auStack_1b68 [24];
  fdb_file_handle *pfStack_1b50;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_1b48 [5];
  fdb_seqnum_t fStack_1b20;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1b18;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1b10;
  timeval tStack_1af0;
  fdb_doc afStack_1ae0 [3];
  char acStack_19c8 [256];
  char acStack_18c8 [256];
  fdb_config fStack_17c8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 *paStack_16d0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_16c8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_16c0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_16b8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_16b0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_16a8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1690;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1688;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1680;
  fdb_iterator *pfStack_1678;
  fdb_iterator *pfStack_1670;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1668;
  fdb_file_handle *pfStack_1660;
  fdb_kvs_handle *pfStack_1658;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_1650 [11];
  fdb_kvs_config fStack_15f8;
  timeval tStack_15e0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_15d0 [10];
  char acStack_1580 [256];
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_1480 [32];
  char acStack_1380 [256];
  fdb_config fStack_1280;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1188;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1180;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1178;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1170;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1168;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1160;
  fdb_iterator *pfStack_1148;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1140;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_1138;
  fdb_file_handle *pfStack_1130;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_1128 [11];
  timeval tStack_10d0;
  undefined1 auStack_10c0 [24];
  char acStack_10a8 [256];
  char acStack_fa8 [256];
  char acStack_ea8 [256];
  fdb_config fStack_da8;
  fdb_kvs_handle *pfStack_cb0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_ca8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_ca0;
  fdb_kvs_config *pfStack_c98;
  fdb_doc **ppfStack_c90;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_c88;
  undefined1 auStack_c78 [24];
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_c60;
  fdb_doc *pfStack_c58;
  fdb_doc *apfStack_c50 [5];
  long alStack_c28 [6];
  timeval tStack_bf8;
  fdb_kvs_config fStack_be8;
  char acStack_bd0 [256];
  fdb_doc afStack_ad0 [3];
  char acStack_9d0 [256];
  fdb_config fStack_8d0;
  fdb_file_handle *pfStack_7d8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_7d0;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_7c8;
  fdb_kvs_config *pfStack_7c0;
  btree_kv_ops *pbStack_7b8;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aStack_7b0;
  undefined1 local_798 [24];
  fdb_iterator *local_780;
  anon_union_8_2_c155ca52_for__fdb_iterator_13 local_778;
  timeval local_770;
  fdb_kvs_config local_760;
  char local_748 [256];
  anon_union_8_2_c155ca52_for__fdb_iterator_13 aaStack_648 [100];
  fdb_doc local_328 [3];
  char local_228 [256];
  fdb_config local_128;
  
  aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117208;
  gettimeofday(&local_770,(__timezone_ptr_t)0x0);
  aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11720d;
  memleak_start();
  local_798._8_8_ = (fdb_kvs_handle *)0x0;
  aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11721e;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11722e;
  fdb_get_default_config();
  pfVar30 = &local_760;
  aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11723b;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.seqtree_opt = '\x01';
  local_128.wal_threshold = 0x400;
  local_128.compaction_threshold = '\0';
  local_128.purging_interval = 1;
  ptr_fhandle_00 = (btree_kv_ops *)(local_798 + 0x10);
  aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11726d;
  fdb_open((fdb_file_handle **)ptr_fhandle_00,"./iterator_test1",&local_128);
  ptr_handle = (fdb_file_handle *)local_798;
  aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117280;
  fdb_kvs_open_default((fdb_file_handle *)local_798._16_8_,(fdb_kvs_handle **)ptr_handle,pfVar30);
  aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117296;
  fVar6 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_798._0_8_,logCallbackFunc,"sequence_iterator_test");
  if (fVar6 == FDB_RESULT_SUCCESS) {
    lVar28 = 0;
    uVar17 = 0;
    do {
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1172be;
      sprintf(local_228,"key%d",uVar17 & 0xffffffff);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1172d6;
      sprintf((char *)local_328,"meta%d",uVar17 & 0xffffffff);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1172eb;
      sprintf(local_748,"body%d(first)",uVar17 & 0xffffffff);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1172fe;
      sVar8 = strlen(local_228);
      unaff_RBP.end_seqnum = (fdb_seqnum_t)local_328;
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117311;
      sVar9 = strlen((char *)unaff_RBP);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11731e;
      sVar10 = strlen(local_748);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117340;
      fdb_doc_create((fdb_doc **)((long)aaStack_648 + lVar28),local_228,sVar8,(void *)unaff_RBP,
                     sVar9,local_748,sVar10);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117352;
      fdb_set((fdb_kvs_handle *)local_798._0_8_,(fdb_doc *)aaStack_648[uVar17]);
      uVar17 = uVar17 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar17 != 100);
    aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117372;
    fdb_commit((fdb_file_handle *)local_798._16_8_,'\x01');
    lVar28 = 0;
    uVar17 = 0;
    do {
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117394;
      sprintf(local_748,"body%d(second)",uVar17 & 0xffffffff);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1173a7;
      sVar8 = strlen(local_748);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1173b9;
      fdb_doc_update((fdb_doc **)((long)aaStack_648 + lVar28),(void *)0x0,0,local_748,sVar8);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1173cb;
      fdb_set((fdb_kvs_handle *)local_798._0_8_,(fdb_doc *)aaStack_648[uVar17]);
      uVar17 = uVar17 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar17 != 100);
    aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1173e7;
    fdb_commit((fdb_file_handle *)local_798._16_8_,'\x01');
    unaff_R13.end_seqnum = 0;
    uVar17 = 0;
    do {
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117409;
      sprintf(local_748,"body%d(third)",uVar17 & 0xffffffff);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11741c;
      sVar8 = strlen(local_748);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11742e;
      fdb_doc_update((fdb_doc **)((long)aaStack_648 + unaff_R13.end_seqnum),(void *)0x0,0,local_748,
                     sVar8);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117440;
      fdb_set((fdb_kvs_handle *)local_798._0_8_,(fdb_doc *)aaStack_648[uVar17]);
      ptr_fhandle_00 = (btree_kv_ops *)(uVar17 + 2);
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 0x10;
      bVar36 = uVar17 < 0x62;
      uVar17 = (ulong)ptr_fhandle_00;
    } while (bVar36);
    aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11745d;
    fdb_commit((fdb_file_handle *)local_798._16_8_,'\0');
    aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117476;
    fdb_iterator_sequence_init
              ((fdb_kvs_handle *)local_798._0_8_,(fdb_iterator **)(local_798 + 0x18),0,0xdc,0);
    ptr_handle = (fdb_file_handle *)0x64;
    pfVar30 = (fdb_kvs_config *)0x64;
    do {
      unaff_R12.end_seqnum = (fdb_seqnum_t)local_748;
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117495;
      fVar6 = fdb_iterator_get(local_780,(fdb_doc **)(local_798 + 8));
      if (fVar6 != FDB_RESULT_SUCCESS) {
LAB_00117648:
        aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11764d;
        sequence_iterator_duplicate_test();
LAB_0011764d:
        aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11765a;
        sequence_iterator_duplicate_test();
LAB_0011765a:
        aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117665;
        sequence_iterator_duplicate_test();
        goto LAB_00117665;
      }
      ptr_handle = (fdb_file_handle *)
                   ((long)&ptr_handle->root + (ulong)(ptr_handle < (fdb_file_handle *)0x8c) + 1);
      if (ptr_handle < (fdb_file_handle *)0xc9) {
        uVar35 = (int)ptr_handle - 0x65;
        pcVar27 = "body%d(second)";
      }
      else {
        puVar3 = (undefined1 *)((long)&ptr_handle[-3].cmp_func_list + 3);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (ulong)puVar3 >> 2;
        uVar35 = ((int)puVar3 + (SUB164(auVar2 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 2) * -100) * 2;
        pcVar27 = "body%d(third)";
      }
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1174f9;
      sprintf((char *)unaff_R12,pcVar27,(ulong)uVar35);
      unaff_R13 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)local_798._8_8_;
      unaff_RBP = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(local_798._8_8_ + 0x20);
      unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)aaStack_648[(int)uVar35].end_seqnum;
      ptr_fhandle_00 = *(btree_kv_ops **)(unaff_R12.end_seqnum + 0x20);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117521;
      iVar7 = bcmp((void *)unaff_RBP,ptr_fhandle_00,*(size_t *)local_798._8_8_);
      if (iVar7 != 0) {
        aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117648;
        sequence_iterator_duplicate_test();
        goto LAB_00117648;
      }
      ptr_fhandle_00 = *(btree_kv_ops **)(unaff_R13.end_seqnum + 0x38);
      unaff_RBP = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R12.end_seqnum + 0x38);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117541;
      iVar7 = bcmp(ptr_fhandle_00,(void *)unaff_RBP,
                   (size_t)*(list_elem **)(unaff_R13.end_seqnum + 8));
      if (iVar7 != 0) goto LAB_0011765a;
      ptr_fhandle_00 = (btree_kv_ops *)((list *)(unaff_R13.end_seqnum + 0x40))->head;
      unaff_R12.end_seqnum = (fdb_seqnum_t)local_748;
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117561;
      iVar7 = bcmp(ptr_fhandle_00,(void *)unaff_R12,
                   (size_t)((list *)(unaff_R13.end_seqnum + 0x10))->head);
      if (iVar7 != 0) goto LAB_0011764d;
      if (*(fdb_file_handle **)(unaff_R13.end_seqnum + 0x28) != ptr_handle) {
        aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1175aa;
        sequence_iterator_duplicate_test();
        unaff_R13 = local_778;
      }
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117577;
      fdb_doc_free((fdb_doc *)unaff_R13);
      local_798._8_8_ = (fdb_kvs_handle *)0x0;
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11758a;
      fVar6 = fdb_iterator_next(local_780);
      uVar35 = (int)pfVar30 - 1;
      pfVar30 = (fdb_kvs_config *)(ulong)uVar35;
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar35 == 0) {
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1175c4;
      fdb_iterator_close(local_780);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1175ce;
      fdb_kvs_close((fdb_kvs_handle *)local_798._0_8_);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1175d8;
      fdb_close((fdb_file_handle *)local_798._16_8_);
      lVar28 = 0;
      do {
        aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1175e7;
        fdb_doc_free((fdb_doc *)aaStack_648[lVar28]);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 100);
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1175f5;
      fdb_shutdown();
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1175fa;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (sequence_iterator_duplicate_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11762b;
      fprintf(_stderr,pcVar27,"sequence iterator duplicate test");
      return;
    }
  }
  else {
LAB_00117665:
    aStack_7b0 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11766a;
    sequence_iterator_duplicate_test();
  }
  aStack_7b0.end_seqnum = (fdb_seqnum_t)sequence_iterator_range_test;
  sequence_iterator_duplicate_test();
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117692;
  pfStack_7d8 = ptr_handle;
  aStack_7d0 = unaff_R12;
  aStack_7c8 = unaff_R13;
  pfStack_7c0 = pfVar30;
  pbStack_7b8 = ptr_fhandle_00;
  aStack_7b0 = unaff_RBP;
  gettimeofday(&tStack_bf8,(__timezone_ptr_t)0x0);
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117697;
  memleak_start();
  auStack_c78._8_8_ = (fdb_kvs_handle *)0x0;
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1176a8;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1176b8;
  fdb_get_default_config();
  pfVar30 = &fStack_be8;
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1176c8;
  fdb_get_default_kvs_config();
  fStack_8d0.buffercache_size = 0;
  fStack_8d0.seqtree_opt = '\x01';
  ppfVar26 = &pfStack_c58;
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1176e7;
  fdb_open((fdb_file_handle **)ppfVar26,"./iterator_test1",&fStack_8d0);
  pfVar18 = (fdb_kvs_handle *)(auStack_c78 + 0x10);
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1176fa;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_c58,(fdb_kvs_handle **)pfVar18,pfVar30);
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117710;
  fVar6 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_c78._16_8_,logCallbackFunc,"sequence_iterator_test");
  if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00117beb;
  aVar29.end_seqnum = 0;
  uVar17 = 0;
  do {
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117738;
    sprintf(acStack_9d0,"key%d",uVar17 & 0xffffffff);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117750;
    sprintf((char *)afStack_ad0,"meta%d",uVar17 & 0xffffffff);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117768;
    sprintf(acStack_bd0,"body%d",uVar17 & 0xffffffff);
    ppfVar26 = (fdb_doc **)((long)apfStack_c50 + (long)aVar29);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117778;
    unaff_R13.end_seqnum = strlen(acStack_9d0);
    unaff_RBP.end_seqnum = (fdb_seqnum_t)afStack_ad0;
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11778b;
    pfVar30 = (fdb_kvs_config *)strlen((char *)unaff_RBP);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11779b;
    sVar8 = strlen(acStack_bd0);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1177c0;
    fdb_doc_create(ppfVar26,acStack_9d0,unaff_R13.end_keylen,(void *)unaff_RBP,(size_t)pfVar30,
                   acStack_bd0,sVar8);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1177cf;
    fdb_set((fdb_kvs_handle *)auStack_c78._16_8_,apfStack_c50[uVar17]);
    uVar17 = uVar17 + 1;
    aVar29.end_seqnum = aVar29.end_seqnum + 8;
  } while (uVar17 != 10);
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1177ef;
  fdb_commit((fdb_file_handle *)pfStack_c58,'\x01');
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117805;
  fVar6 = fdb_iterator_sequence_init
                    ((fdb_kvs_handle *)auStack_c78._16_8_,(fdb_iterator **)auStack_c78,0,0,0);
  pfVar18 = (fdb_kvs_handle *)0xa;
  if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00117bf0;
  pfVar18 = (fdb_kvs_handle *)0x1;
  pfVar30 = (fdb_kvs_config *)(auStack_c78 + 8);
  do {
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117824;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_c78._0_8_,(fdb_doc **)pfVar30);
    uVar5 = auStack_c78._8_8_;
    unaff_R12 = aVar29;
    if (fVar6 != FDB_RESULT_SUCCESS) {
LAB_00117b84:
      aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b89;
      sequence_iterator_range_test();
LAB_00117b89:
      aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b94;
      sequence_iterator_range_test();
LAB_00117b94:
      aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b9f;
      sequence_iterator_range_test();
      goto LAB_00117b9f;
    }
    unaff_R13 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(auStack_c78._8_8_ + 0x20);
    ppfVar26 = (fdb_doc **)apfStack_c50[(long)(pfVar18 + 0xffffffffffffffff) + 0x207];
    unaff_RBP = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(ppfVar26 + 4);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11784e;
    iVar7 = bcmp((void *)unaff_R13,(void *)unaff_RBP,*(size_t *)auStack_c78._8_8_);
    unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)uVar5;
    if (iVar7 != 0) {
      aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b84;
      sequence_iterator_range_test();
      goto LAB_00117b84;
    }
    unaff_R13 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(uVar5 + 0x38);
    unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)ppfVar26[7];
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11786f;
    iVar7 = bcmp((void *)unaff_R13,(void *)unaff_RBP,(size_t)*(list **)(uVar5 + 8));
    if (iVar7 != 0) goto LAB_00117b94;
    unaff_R13 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(uVar5 + 0x40);
    unaff_RBP = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(ppfVar26 + 8);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117890;
    iVar7 = bcmp((void *)unaff_R13,(void *)unaff_RBP,(size_t)*(list **)(uVar5 + 0x10));
    if (iVar7 != 0) goto LAB_00117b89;
    aVar29 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)uVar5;
    if (pfVar18 != ((fdb_file_handle *)(uVar5 + 0x28))->root) {
      aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1178d8;
      sequence_iterator_range_test();
      aVar29 = aStack_c60;
    }
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1178a7;
    fdb_doc_free((fdb_doc *)aVar29);
    auStack_c78._8_8_ = (fdb_kvs_handle *)0x0;
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1178ba;
    fVar6 = fdb_iterator_next((fdb_iterator *)auStack_c78._0_8_);
    pfVar18 = (fdb_kvs_handle *)&(pfVar18->kvs_config).field_0x1;
  } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
  if (pfVar18 != (fdb_kvs_handle *)0xb) goto LAB_00117bf5;
  pfVar18 = (fdb_kvs_handle *)auStack_c78;
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1178f6;
  fdb_iterator_close((fdb_iterator *)auStack_c78._0_8_);
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11790d;
  fVar6 = fdb_iterator_sequence_init
                    ((fdb_kvs_handle *)auStack_c78._16_8_,(fdb_iterator **)pfVar18,0,5,0);
  if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00117bfa;
  pfVar18 = (fdb_kvs_handle *)0x1;
  pfVar30 = (fdb_kvs_config *)(auStack_c78 + 8);
  do {
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11792c;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_c78._0_8_,(fdb_doc **)pfVar30);
    unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)auStack_c78._8_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00117baa;
    unaff_R13 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(auStack_c78._8_8_ + 0x20);
    ppfVar26 = (fdb_doc **)apfStack_c50[(long)(pfVar18 + 0xffffffffffffffff) + 0x207];
    unaff_RBP = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(ppfVar26 + 4);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117956;
    iVar7 = bcmp((void *)unaff_R13,(void *)unaff_RBP,*(size_t *)auStack_c78._8_8_);
    if (iVar7 != 0) goto LAB_00117b9f;
    unaff_R13 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R12.end_seqnum + 0x38);
    unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)ppfVar26[7];
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117977;
    iVar7 = bcmp((void *)unaff_R13,(void *)unaff_RBP,(size_t)*(list **)(unaff_R12.end_seqnum + 8));
    if (iVar7 != 0) goto LAB_00117bba;
    unaff_R13 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R12.end_seqnum + 0x40);
    unaff_RBP = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(ppfVar26 + 8);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117998;
    iVar7 = bcmp((void *)unaff_R13,(void *)unaff_RBP,(size_t)*(list **)(unaff_R12.end_seqnum + 0x10)
                );
    if (iVar7 != 0) goto LAB_00117baf;
    aVar29 = unaff_R12;
    if (pfVar18 != ((fdb_file_handle *)(unaff_R12.end_seqnum + 0x28))->root) {
      aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1179e0;
      sequence_iterator_range_test();
      aVar29 = aStack_c60;
    }
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1179af;
    fdb_doc_free((fdb_doc *)aVar29);
    auStack_c78._8_8_ = (fdb_kvs_handle *)0x0;
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1179c2;
    fVar6 = fdb_iterator_next((fdb_iterator *)auStack_c78._0_8_);
    pfVar18 = (fdb_kvs_handle *)&(pfVar18->kvs_config).field_0x1;
  } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
  if (pfVar18 != (fdb_kvs_handle *)0x6) goto LAB_00117bff;
  pfVar30 = (fdb_kvs_config *)auStack_c78;
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1179fe;
  fdb_iterator_close((fdb_iterator *)auStack_c78._0_8_);
  pfVar18 = (fdb_kvs_handle *)0x6;
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a1a;
  fVar6 = fdb_iterator_sequence_init
                    ((fdb_kvs_handle *)auStack_c78._16_8_,(fdb_iterator **)pfVar30,6,0,0);
  if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00117c04;
  pfVar30 = (fdb_kvs_config *)(auStack_c78 + 8);
  do {
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a34;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_c78._0_8_,(fdb_doc **)pfVar30);
    unaff_R12 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)auStack_c78._8_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00117bd0;
    unaff_R13 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(auStack_c78._8_8_ + 0x20);
    ppfVar26 = (fdb_doc **)apfStack_c50[(long)(pfVar18 + 0xffffffffffffffff) + 0x207];
    unaff_RBP = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(ppfVar26 + 4);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a5e;
    iVar7 = bcmp((void *)unaff_R13,(void *)unaff_RBP,*(size_t *)auStack_c78._8_8_);
    if (iVar7 != 0) goto LAB_00117bc5;
    unaff_R13 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R12.end_seqnum + 0x38);
    unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)ppfVar26[7];
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117a7f;
    iVar7 = bcmp((void *)unaff_R13,(void *)unaff_RBP,(size_t)*(list **)(unaff_R12.end_seqnum + 8));
    if (iVar7 != 0) goto LAB_00117be0;
    unaff_R13 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R12.end_seqnum + 0x40);
    unaff_RBP = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(ppfVar26 + 8);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117aa0;
    iVar7 = bcmp((void *)unaff_R13,(void *)unaff_RBP,(size_t)*(list **)(unaff_R12.end_seqnum + 0x10)
                );
    if (iVar7 != 0) goto LAB_00117bd5;
    aVar29 = unaff_R12;
    if (pfVar18 != ((fdb_file_handle *)(unaff_R12.end_seqnum + 0x28))->root) {
      aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ae8;
      sequence_iterator_range_test();
      aVar29 = aStack_c60;
    }
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ab7;
    fdb_doc_free((fdb_doc *)aVar29);
    auStack_c78._8_8_ = (fdb_kvs_handle *)0x0;
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117aca;
    fVar6 = fdb_iterator_next((fdb_iterator *)auStack_c78._0_8_);
    pfVar18 = (fdb_kvs_handle *)&(pfVar18->kvs_config).field_0x1;
  } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
  if (pfVar18 == (fdb_kvs_handle *)0xb) {
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b03;
    fdb_iterator_close((fdb_iterator *)auStack_c78._0_8_);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b0d;
    fdb_kvs_close((fdb_kvs_handle *)auStack_c78._16_8_);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b17;
    fdb_close((fdb_file_handle *)pfStack_c58);
    lVar28 = 0;
    do {
      aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b23;
      fdb_doc_free(apfStack_c50[lVar28]);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 10);
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b31;
    fdb_shutdown();
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b36;
    memleak_end();
    pcVar27 = "%s PASSED\n";
    if (sequence_iterator_range_test()::__test_pass != '\0') {
      pcVar27 = "%s FAILED\n";
    }
    aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117b67;
    fprintf(_stderr,pcVar27,"sequence iterator range test");
    return;
  }
  goto LAB_00117c09;
LAB_0011827c:
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118287;
  reverse_sequence_iterator_test();
  aVar32 = aVar31;
LAB_00118287:
  aVar31 = aVar32;
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11828c;
  reverse_sequence_iterator_test();
LAB_0011828c:
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118297;
  reverse_sequence_iterator_test();
LAB_00118297:
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182a2;
  reverse_sequence_iterator_test();
LAB_001182a2:
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182a7;
  reverse_sequence_iterator_test();
LAB_001182a7:
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182b2;
  reverse_sequence_iterator_test();
LAB_001182b2:
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182bd;
  reverse_sequence_iterator_test();
LAB_001182bd:
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182c8;
  reverse_sequence_iterator_test();
  goto LAB_001182c8;
LAB_00118bb4:
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118bb9;
  reverse_sequence_iterator_kvs_test();
LAB_00118bb9:
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118bbe;
  reverse_sequence_iterator_kvs_test();
LAB_00118bbe:
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118bc3;
  reverse_sequence_iterator_kvs_test();
LAB_00118bc3:
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118bce;
  reverse_sequence_iterator_kvs_test();
  aVar19 = aVar11;
LAB_00118bce:
  aVar11 = aVar19;
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118bd3;
  reverse_sequence_iterator_kvs_test();
LAB_00118bd3:
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118bde;
  reverse_sequence_iterator_kvs_test();
LAB_00118bde:
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118be9;
  reverse_sequence_iterator_kvs_test();
  goto LAB_00118be9;
LAB_001193b0:
  pbStack_1b80 = (btree *)0x1193bb;
  reverse_iterator_test();
  pfVar20 = doc;
LAB_001193bb:
  doc = pfVar20;
  pbStack_1b80 = (btree *)0x1193c0;
  reverse_iterator_test();
LAB_001193c0:
  pbStack_1b80 = (btree *)0x1193cb;
  reverse_iterator_test();
LAB_001193cb:
  pbStack_1b80 = (btree *)0x1193d6;
  reverse_iterator_test();
LAB_001193d6:
  pbStack_1b80 = (btree *)0x1193e1;
  reverse_iterator_test();
  pfVar20 = doc;
LAB_001193e1:
  doc = pfVar20;
  pbStack_1b80 = (btree *)0x1193e6;
  reverse_iterator_test();
LAB_001193e6:
  pbStack_1b80 = (btree *)0x1193f1;
  reverse_iterator_test();
LAB_001193f1:
  pbStack_1b80 = (btree *)0x1193fc;
  reverse_iterator_test();
  pfVar20 = doc;
LAB_001193fc:
  doc = pfVar20;
  pbStack_1b80 = (btree *)0x119401;
  reverse_iterator_test();
LAB_00119401:
  pbStack_1b80 = (btree *)0x11940c;
  reverse_iterator_test();
LAB_0011940c:
  pbStack_1b80 = (btree *)0x119417;
  reverse_iterator_test();
LAB_00119417:
  pfVar21 = (fdb_doc *)auStack_1b68;
  pbStack_1b80 = (btree *)0x119422;
  reverse_iterator_test();
  goto LAB_00119422;
LAB_0011a3a3:
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3ae;
  iterator_seek_wal_only_test();
  pfVar33 = pfVar13;
LAB_0011a3ae:
  pfVar13 = pfVar33;
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3b3;
  iterator_seek_wal_only_test();
  pfVar15 = pfVar22;
LAB_0011a3b3:
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3be;
  iterator_seek_wal_only_test();
LAB_0011a3be:
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3c9;
  iterator_seek_wal_only_test();
LAB_0011a3c9:
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3d4;
  iterator_seek_wal_only_test();
  pfVar22 = pfVar13;
LAB_0011a3d4:
  pfVar13 = pfVar22;
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3d9;
  iterator_seek_wal_only_test();
LAB_0011a3d9:
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3e4;
  iterator_seek_wal_only_test();
LAB_0011a3e4:
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3ef;
  iterator_seek_wal_only_test();
  goto LAB_0011a3ef;
LAB_0011a830:
  pcStack_2888 = (code *)0x11a835;
  iterator_after_wal_threshold();
  goto LAB_0011a835;
LAB_0011acdb:
  pfStack_2a50 = (fdb_kvs_handle *)0x11ace0;
  iterator_manual_wal_flush();
LAB_0011ace0:
  ptr_iterator = &pfStack_2a38;
  pfStack_2a50 = (fdb_kvs_handle *)0x11ace5;
  iterator_manual_wal_flush();
  goto LAB_0011ace5;
LAB_0011b2d3:
  pfStack_2f18 = (fdb_kvs_handle *)0x11b2de;
  sequence_iterator_seek_test();
  pfVar34 = pfVar24;
LAB_0011b2de:
  pfVar24 = pfVar34;
  pfStack_2f18 = (fdb_kvs_handle *)0x11b2e3;
  sequence_iterator_seek_test();
LAB_0011b2e3:
  pfStack_2f18 = (fdb_kvs_handle *)0x11b2ee;
  sequence_iterator_seek_test();
LAB_0011b2ee:
  pfStack_2f18 = (fdb_kvs_handle *)0x11b2f9;
  sequence_iterator_seek_test();
LAB_0011b2f9:
  pfStack_2f18 = (fdb_kvs_handle *)0x11b304;
  sequence_iterator_seek_test();
  pfVar34 = pfVar24;
  goto LAB_0011b304;
LAB_0011b623:
  ppfVar23 = &pfStack_32b0;
  ppfStack_32c0 = (fdb_doc **)0x11b628;
  iterator_concurrent_compaction();
  goto LAB_0011b628;
LAB_0011bb51:
  ppfStack_5598 = (fdb_doc **)0x11bb56;
  iterator_offset_access_test();
LAB_0011bb56:
  ppfStack_5598 = (fdb_doc **)0x11bb5b;
  iterator_offset_access_test();
LAB_0011bb5b:
  ppfStack_5598 = (fdb_doc **)0x11bb60;
  iterator_offset_access_test();
LAB_0011bb60:
  ppfStack_5598 = (fdb_doc **)0x11bb65;
  iterator_offset_access_test();
LAB_0011bb65:
  ppfStack_5598 = (fdb_doc **)0x11bb6a;
  iterator_offset_access_test();
LAB_0011bb6a:
  ppfStack_5598 = (fdb_doc **)0x11bb6f;
  iterator_offset_access_test();
LAB_0011bb6f:
  ppfStack_5598 = (fdb_doc **)0x11bb74;
  iterator_offset_access_test();
  goto LAB_0011bb74;
LAB_00117b9f:
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117baa;
  sequence_iterator_range_test();
  aVar29 = unaff_R12;
LAB_00117baa:
  unaff_R12 = aVar29;
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117baf;
  sequence_iterator_range_test();
LAB_00117baf:
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117bba;
  sequence_iterator_range_test();
LAB_00117bba:
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117bc5;
  sequence_iterator_range_test();
LAB_00117bc5:
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117bd0;
  sequence_iterator_range_test();
  aVar29 = unaff_R12;
LAB_00117bd0:
  unaff_R12 = aVar29;
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117bd5;
  sequence_iterator_range_test();
LAB_00117bd5:
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117be0;
  sequence_iterator_range_test();
LAB_00117be0:
  pfVar30 = (fdb_kvs_config *)(auStack_c78 + 8);
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117beb;
  sequence_iterator_range_test();
LAB_00117beb:
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117bf0;
  sequence_iterator_range_test();
  aVar29 = unaff_R12;
LAB_00117bf0:
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117bf5;
  sequence_iterator_range_test();
LAB_00117bf5:
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117bfa;
  sequence_iterator_range_test();
LAB_00117bfa:
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117bff;
  sequence_iterator_range_test();
LAB_00117bff:
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c04;
  sequence_iterator_range_test();
LAB_00117c04:
  aStack_c88 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c09;
  sequence_iterator_range_test();
LAB_00117c09:
  aStack_c88.end_seqnum = (fdb_seqnum_t)reverse_sequence_iterator_test;
  sequence_iterator_range_test();
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c31;
  pfStack_cb0 = pfVar18;
  aStack_ca8 = aVar29;
  aStack_ca0 = unaff_R13;
  pfStack_c98 = pfVar30;
  ppfStack_c90 = ppfVar26;
  aStack_c88 = unaff_RBP;
  gettimeofday(&tStack_10d0,(__timezone_ptr_t)0x0);
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c36;
  memleak_start();
  aStack_1140.end_seqnum = 0;
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c47;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c57;
  fdb_get_default_config();
  aVar31.end_seqnum = (fdb_seqnum_t)auStack_10c0;
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c67;
  fdb_get_default_kvs_config();
  fStack_da8.buffercache_size = 0;
  fStack_da8.seqtree_opt = '\x01';
  fStack_da8.wal_threshold = 0x400;
  fStack_da8.flags = 1;
  fStack_da8.compaction_threshold = '\0';
  aVar11.end_seqnum = (fdb_seqnum_t)&pfStack_1130;
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117c99;
  fdb_open((fdb_file_handle **)aVar11,"./iterator_test1",&fStack_da8);
  aVar19.end_seqnum = (fdb_seqnum_t)&aStack_1138;
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117cac;
  fdb_kvs_open_default(pfStack_1130,(fdb_kvs_handle **)aVar19,(fdb_kvs_config *)aVar31);
  aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117cc2;
  fVar6 = fdb_set_log_callback
                    ((fdb_kvs_handle *)aStack_1138,logCallbackFunc,"reverse_sequence_iterator_test")
  ;
  if (fVar6 == FDB_RESULT_SUCCESS) {
    lVar28 = 0;
    uVar17 = 0;
    do {
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117cea;
      sprintf(acStack_ea8,"key%d",uVar17 & 0xffffffff);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d02;
      sprintf(acStack_fa8,"meta%d",uVar17 & 0xffffffff);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d1a;
      sprintf(auStack_10c0 + 0x18,"body%d",uVar17 & 0xffffffff);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d2a;
      sVar8 = strlen(acStack_ea8);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d3d;
      sVar9 = strlen(acStack_fa8);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d4d;
      sVar10 = strlen(auStack_10c0 + 0x18);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d72;
      fdb_doc_create((fdb_doc **)((long)aaStack_1128 + lVar28),acStack_ea8,sVar8,acStack_fa8,sVar9,
                     auStack_10c0 + 0x18,sVar10);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117d81;
      fdb_set((fdb_kvs_handle *)aStack_1138,(fdb_doc *)aaStack_1128[uVar17]);
      lVar28 = lVar28 + 0x10;
      bVar36 = uVar17 < 8;
      uVar17 = uVar17 + 2;
    } while (bVar36);
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117da5;
    fdb_commit(pfStack_1130,'\x01');
    lVar28 = 8;
    uVar17 = 1;
    do {
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117dcd;
      sprintf(acStack_ea8,"key%d",uVar17 & 0xffffffff);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117de6;
      sprintf(acStack_fa8,"meta%d",uVar17 & 0xffffffff);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117dff;
      sprintf(auStack_10c0 + 0x18,"body%d",uVar17 & 0xffffffff);
      aVar29.end_seqnum = (long)aaStack_1128 + lVar28;
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117e0f;
      unaff_RBP.end_seqnum = strlen(acStack_ea8);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117e22;
      aVar11.end_seqnum = strlen(acStack_fa8);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117e32;
      sVar8 = strlen(auStack_10c0 + 0x18);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117e57;
      fdb_doc_create((fdb_doc **)aVar29,acStack_ea8,unaff_RBP.end_keylen,acStack_fa8,
                     aVar11.end_keylen,auStack_10c0 + 0x18,sVar8);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117e66;
      fdb_set((fdb_kvs_handle *)aStack_1138,(fdb_doc *)aaStack_1128[uVar17]);
      aVar31.end_seqnum = uVar17 + 2;
      lVar28 = lVar28 + 0x10;
      bVar36 = uVar17 < 8;
      uVar17 = (ulong)aVar31;
    } while (bVar36);
    unaff_R13.end_seqnum = 0;
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117e8a;
    fdb_commit(pfStack_1130,'\0');
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ea0;
    fdb_iterator_sequence_init((fdb_kvs_handle *)aStack_1138,&pfStack_1148,0,0,0);
    do {
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117eb2;
      fVar6 = fdb_iterator_get(pfStack_1148,(fdb_doc **)&aStack_1140);
      aVar32 = aStack_1140;
      aVar19.end_seqnum = (fdb_seqnum_t)&aStack_1140;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001182a2;
      aVar11 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1140.end_seqnum + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  aaStack_1128[unaff_R13.end_seqnum].end_seqnum;
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x20);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117eda;
      iVar7 = bcmp((void *)aVar11,(void *)aVar29,*(size_t *)aStack_1140);
      aVar31 = aVar32;
      if (iVar7 != 0) goto LAB_001182b2;
      aVar11 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar32.end_seqnum + 0x38);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ef9;
      iVar7 = bcmp((void *)aVar11,(void *)aVar29,
                   (size_t)((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar32.end_seqnum + 8))
                           ->end_seqnum);
      if (iVar7 != 0) goto LAB_001182a7;
      aVar11 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar32.end_seqnum + 0x40);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x40);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117f18;
      iVar7 = bcmp((void *)aVar11,(void *)aVar29,
                   (size_t)((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                           (aVar32.end_seqnum + 0x10))->end_seqnum);
      if (iVar7 != 0) goto LAB_001182bd;
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117f28;
      fdb_doc_free((fdb_doc *)aVar32);
      aStack_1140.end_seqnum = 0;
      if ((int)unaff_R13.end_seqnum == 8) goto LAB_00117f59;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 2;
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117f45;
      fVar6 = fdb_iterator_next(pfStack_1148);
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13.end_seqnum != 10) {
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117f59;
      reverse_sequence_iterator_test();
LAB_00117f59:
      unaff_R13.end_seqnum = 8;
    }
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117f69;
    fVar6 = fdb_iterator_prev(pfStack_1148);
    if (fVar6 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001182cd;
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117f81;
    fVar6 = fdb_iterator_get(pfStack_1148,(fdb_doc **)&aStack_1140);
    aVar19 = aStack_1140;
    aVar32.end_seqnum = (fdb_seqnum_t)&aStack_1140;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001182d2;
    aVar31 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1140.end_seqnum + 0x20);
    aVar29 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
             (&aStack_1138)[(int)unaff_R13.end_seqnum].end_seqnum;
    aVar11 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar29.end_seqnum + 0x20);
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117fad;
    iVar7 = bcmp((void *)aVar31,(void *)aVar11,*(size_t *)aStack_1140);
    if (iVar7 != 0) goto LAB_001182d7;
    aVar31 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar19.end_seqnum + 0x38);
    aVar11 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar29.end_seqnum + 0x38);
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117fcd;
    iVar7 = bcmp((void *)aVar31,(void *)aVar11,
                 (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)(aVar19.end_seqnum + 8));
    if (iVar7 != 0) goto LAB_001182e2;
    aVar31 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar19.end_seqnum + 0x40);
    aVar11 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar29.end_seqnum + 0x40);
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117fed;
    iVar7 = bcmp((void *)aVar31,(void *)aVar11,
                 (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                          (aVar19.end_seqnum + 0x10));
    if (iVar7 != 0) goto LAB_001182ed;
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x117ffd;
    fdb_doc_free((fdb_doc *)aVar19);
    aStack_1140.end_seqnum = 0;
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118010;
    fVar6 = fdb_iterator_next(pfStack_1148);
    if (fVar6 == FDB_RESULT_ITERATOR_FAIL) {
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11801f;
      reverse_sequence_iterator_test();
    }
    unaff_RBP.end_seqnum = 6;
    aVar32 = aVar31;
    do {
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118033;
      fVar6 = fdb_iterator_get(pfStack_1148,(fdb_doc **)&aStack_1140);
      aVar31 = aStack_1140;
      if (fVar6 != FDB_RESULT_SUCCESS) {
LAB_00118261:
        aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118266;
        reverse_sequence_iterator_test();
        aVar31 = aVar32;
LAB_00118266:
        aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118271;
        reverse_sequence_iterator_test();
LAB_00118271:
        aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11827c;
        reverse_sequence_iterator_test();
        goto LAB_0011827c;
      }
      aVar11 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1140.end_seqnum + 0x20);
      iVar16 = (int)unaff_R13.end_seqnum;
      aVar19 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)aaStack_1128[iVar16].end_seqnum;
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar19.end_seqnum + 0x20);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11805e;
      iVar7 = bcmp((void *)aVar11,(void *)aVar29,*(size_t *)aStack_1140);
      aVar32 = aVar31;
      if (iVar7 != 0) {
        aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118261;
        reverse_sequence_iterator_test();
        goto LAB_00118261;
      }
      aVar11 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar31.end_seqnum + 0x38);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar19.end_seqnum + 0x38);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11807d;
      iVar7 = bcmp((void *)aVar11,(void *)aVar29,
                   (size_t)((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar31.end_seqnum + 8))
                           ->end_seqnum);
      if (iVar7 != 0) goto LAB_00118271;
      aVar11 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar31.end_seqnum + 0x40);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar19.end_seqnum + 0x40);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11809c;
      iVar7 = bcmp((void *)aVar11,(void *)aVar29,
                   (size_t)((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                           (aVar31.end_seqnum + 0x10))->end_seqnum);
      if (iVar7 != 0) goto LAB_00118266;
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1180ac;
      fdb_doc_free((fdb_doc *)aVar31);
      aStack_1140.end_seqnum = 0;
      uVar35 = iVar16 + 2;
      if (7 < iVar16) {
        uVar35 = 1;
      }
      aVar19.end_seqnum._4_4_ = 0;
      aVar19.end_seqnum._0_4_ = uVar35;
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1180cf;
      fVar6 = fdb_iterator_next(pfStack_1148);
      unaff_RBP._0_4_ = (int)unaff_RBP.end_seqnum - 1;
      unaff_RBP.end_seqnum._4_4_ = 0;
      unaff_R13.end_seqnum._4_4_ = 0;
      unaff_R13.end_seqnum._0_4_ = uVar35;
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if (unaff_RBP._0_4_ != 0) goto LAB_001182f8;
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1180ef;
    fVar6 = fdb_iterator_prev(pfStack_1148);
    if (fVar6 == FDB_RESULT_ITERATOR_FAIL) goto LAB_001182fd;
    aVar19.end_seqnum = 9;
    aVar31.end_seqnum = 10;
    do {
      unaff_RBP = aVar31;
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118115;
      fVar6 = fdb_iterator_get(pfStack_1148,(fdb_doc **)&aStack_1140);
      aVar31 = aStack_1140;
      aVar32 = unaff_RBP;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00118287;
      aVar11 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1140.end_seqnum + 0x20);
      iVar16 = (int)aVar19.end_seqnum;
      unaff_R13 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)aaStack_1128[iVar16].end_seqnum;
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x20);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118140;
      iVar7 = bcmp((void *)aVar11,(void *)aVar29,*(size_t *)aStack_1140);
      if (iVar7 != 0) goto LAB_0011827c;
      aVar11 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar31.end_seqnum + 0x38);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x38);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11815f;
      iVar7 = bcmp((void *)aVar11,(void *)aVar29,
                   (size_t)((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar31.end_seqnum + 8))
                           ->end_seqnum);
      if (iVar7 != 0) goto LAB_00118297;
      aVar11 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar31.end_seqnum + 0x40);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_R13.end_seqnum + 0x40);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11817e;
      iVar7 = bcmp((void *)aVar11,(void *)aVar29,
                   (size_t)((anon_union_8_2_c155ca52_for__fdb_iterator_13 *)
                           (aVar31.end_seqnum + 0x10))->end_seqnum);
      if (iVar7 != 0) goto LAB_0011828c;
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11818e;
      fdb_doc_free((fdb_doc *)aVar31);
      aStack_1140.end_seqnum = 0;
      uVar35 = iVar16 - 2;
      if (iVar16 < 2) {
        uVar35 = 8;
      }
      aVar19.end_seqnum._4_4_ = 0;
      aVar19.end_seqnum._0_4_ = uVar35;
      uVar25 = (uint)unaff_RBP.end_seqnum;
      uVar35 = uVar25 - 1;
      if (uVar25 == 0) {
        uVar35 = 0;
      }
      aVar31.end_seqnum._4_4_ = 0;
      aVar31.end_seqnum._0_4_ = uVar35;
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181c1;
      fVar6 = fdb_iterator_prev(pfStack_1148);
      aVar11 = aVar19;
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar25 < 2) {
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181e0;
      fdb_iterator_close(pfStack_1148);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181ea;
      fdb_kvs_close((fdb_kvs_handle *)aStack_1138);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1181f4;
      fdb_close(pfStack_1130);
      lVar28 = 0;
      do {
        aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118200;
        fdb_doc_free((fdb_doc *)aaStack_1128[lVar28]);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 10);
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11820e;
      fdb_shutdown();
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118213;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (reverse_sequence_iterator_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118244;
      fprintf(_stderr,pcVar27,"reverse sequence iterator test");
      return;
    }
  }
  else {
LAB_001182c8:
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182cd;
    reverse_sequence_iterator_test();
LAB_001182cd:
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182d2;
    reverse_sequence_iterator_test();
    aVar32 = aVar19;
LAB_001182d2:
    aVar19 = aVar32;
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182d7;
    reverse_sequence_iterator_test();
LAB_001182d7:
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182e2;
    reverse_sequence_iterator_test();
LAB_001182e2:
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182ed;
    reverse_sequence_iterator_test();
LAB_001182ed:
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182f8;
    reverse_sequence_iterator_test();
LAB_001182f8:
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1182fd;
    reverse_sequence_iterator_test();
LAB_001182fd:
    aStack_1160 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118302;
    reverse_sequence_iterator_test();
  }
  aStack_1160.end_seqnum = (fdb_seqnum_t)reverse_sequence_iterator_kvs_test;
  reverse_sequence_iterator_test();
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11832a;
  aStack_1188 = aVar19;
  aStack_1180 = aVar29;
  aStack_1178 = unaff_R13;
  aStack_1170 = aVar31;
  aStack_1168 = aVar11;
  aStack_1160 = unaff_RBP;
  gettimeofday(&tStack_15e0,(__timezone_ptr_t)0x0);
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11832f;
  memleak_start();
  aStack_1690.end_seqnum = 0;
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118340;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118350;
  fdb_get_default_config();
  aVar11.end_seqnum = (fdb_seqnum_t)&fStack_15f8;
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118360;
  fdb_get_default_kvs_config();
  fStack_1280.buffercache_size = 0;
  fStack_1280.seqtree_opt = '\x01';
  fStack_1280.wal_threshold = 0x400;
  fStack_1280.flags = 1;
  fStack_1280.compaction_threshold = '\0';
  aVar31.end_seqnum = (fdb_seqnum_t)&pfStack_1660;
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118392;
  fdb_open((fdb_file_handle **)aVar31,"./iterator_test1",&fStack_1280);
  ptr_handle_00 = &aStack_1668;
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1183a5;
  fdb_kvs_open_default(pfStack_1660,(fdb_kvs_handle **)ptr_handle_00,(fdb_kvs_config *)aVar11);
  aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1183bb;
  fVar6 = fdb_set_log_callback
                    ((fdb_kvs_handle *)aStack_1668,logCallbackFunc,
                     "reverse_sequence_iterator_kvs_test");
  if (fVar6 == FDB_RESULT_SUCCESS) {
    aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1183e1;
    fVar6 = fdb_kvs_open(pfStack_1660,&pfStack_1658,"kv2",&fStack_15f8);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00118bf8;
    aVar29.end_seqnum = 0;
    ptr_handle_00 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0x0;
    do {
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118409;
      sprintf(acStack_1380,"kEy%d",(ulong)ptr_handle_00 & 0xffffffff);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118421;
      sprintf((char *)&aaStack_1480[0].end_seqnum,"mEta%d",(ulong)ptr_handle_00 & 0xffffffff);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118439;
      sprintf(acStack_1580,"bOdy%d",(ulong)ptr_handle_00 & 0xffffffff);
      aVar31.end_seqnum = (long)aaStack_15d0 + aVar29.end_seqnum;
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11844c;
      unaff_R13.end_seqnum = strlen(acStack_1380);
      unaff_RBP.end_seqnum = (fdb_seqnum_t)aaStack_1480;
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11845f;
      aVar11.end_seqnum = strlen((char *)unaff_RBP);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11846f;
      sVar8 = strlen(acStack_1580);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118494;
      fdb_doc_create((fdb_doc **)aVar31,acStack_1380,unaff_R13.end_keylen,(void *)unaff_RBP,
                     aVar11.end_keylen,acStack_1580,sVar8);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1184a6;
      fVar6 = fdb_set(pfStack_1658,(fdb_doc *)aaStack_15d0[(long)ptr_handle_00]);
      if (fVar6 != FDB_RESULT_SUCCESS) {
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118bb4;
        reverse_sequence_iterator_kvs_test();
        goto LAB_00118bb4;
      }
      ptr_handle_00 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)((long)ptr_handle_00 + 1);
      aVar29.end_seqnum = aVar29.end_seqnum + 8;
    } while (ptr_handle_00 != (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)0xa);
    lVar28 = 0;
    uVar17 = 0;
    do {
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1184df;
      sprintf(acStack_1380,"key%d",uVar17 & 0xffffffff);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1184f7;
      sprintf((char *)&aaStack_1480[0].end_seqnum,"meta%d",uVar17 & 0xffffffff);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11850f;
      sprintf(acStack_1580,"body%d",uVar17 & 0xffffffff);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11851f;
      sVar8 = strlen(acStack_1380);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118532;
      sVar9 = strlen((char *)&aaStack_1480[0].end_seqnum);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118542;
      sVar10 = strlen(acStack_1580);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118567;
      fdb_doc_create((fdb_doc **)((long)aaStack_1650 + lVar28),acStack_1380,sVar8,aaStack_1480,sVar9
                     ,acStack_1580,sVar10);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118576;
      fdb_set((fdb_kvs_handle *)aStack_1668,(fdb_doc *)aaStack_1650[uVar17]);
      lVar28 = lVar28 + 0x10;
      bVar36 = uVar17 < 8;
      uVar17 = uVar17 + 2;
    } while (bVar36);
    aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11859a;
    fdb_commit(pfStack_1660,'\x01');
    unaff_R13.end_seqnum = 8;
    aVar19.end_seqnum = 1;
    do {
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1185c2;
      sprintf(acStack_1380,"key%d",aVar19.end_seqnum & 0xffffffff);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1185db;
      sprintf((char *)&aaStack_1480[0].end_seqnum,"meta%d",aVar19.end_seqnum & 0xffffffff);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1185f4;
      sprintf(acStack_1580,"body%d",aVar19.end_seqnum & 0xffffffff);
      aVar29.end_seqnum = (long)aaStack_1650 + unaff_R13.end_seqnum;
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118604;
      unaff_RBP.end_seqnum = strlen(acStack_1380);
      ptr_handle_00 = aaStack_1480;
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118617;
      aVar31.end_seqnum = strlen((char *)&ptr_handle_00->end_seqnum);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118627;
      sVar8 = strlen(acStack_1580);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11864c;
      fdb_doc_create((fdb_doc **)aVar29,acStack_1380,unaff_RBP.end_keylen,ptr_handle_00,
                     aVar31.end_keylen,acStack_1580,sVar8);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11865b;
      fdb_set((fdb_kvs_handle *)aStack_1668,(fdb_doc *)aaStack_1650[aVar19.end_seqnum]);
      aVar11.end_seqnum = aVar19.end_seqnum + 2;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 0x10;
      bVar36 = aVar19.end_seqnum < (fdb_kvs_handle *)0x8;
      aVar19.end_seqnum = aVar11.end_seqnum;
    } while (bVar36);
    aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11867c;
    fdb_commit(pfStack_1660,'\0');
    aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118692;
    fVar6 = fdb_iterator_sequence_init((fdb_kvs_handle *)aStack_1668,&pfStack_1678,0,0,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00118bfd;
    unaff_RBP.end_seqnum = 0;
    ptr_handle_00 = &aStack_1690;
    aVar11.end_seqnum = (fdb_seqnum_t)&aStack_1680;
    do {
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1186b3;
      fdb_iterator_get(pfStack_1678,(fdb_doc **)ptr_handle_00);
      unaff_R13 = aStack_1690;
      aVar29.end_seqnum = (long)aaStack_1650 + unaff_RBP.end_seqnum;
      aVar31.end_seqnum = *aVar29.end_seqnum;
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1186d5;
      iVar7 = bcmp(*(kvs_ops_stat **)(aStack_1690.end_seqnum + 0x20),
                   (void *)(((atomic<unsigned_long> *)(aVar31.end_seqnum + 0x20))->
                           super___atomic_base<unsigned_long>)._M_i,*(size_t *)aStack_1690);
      if (iVar7 != 0) {
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118745;
        reverse_sequence_iterator_kvs_test();
        unaff_R13 = aStack_1688;
        aVar31 = aStack_1680;
      }
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1186ea;
      iVar7 = bcmp(*(btree **)(unaff_R13.end_seqnum + 0x38),*(list **)(aVar31.end_seqnum + 0x38),
                   (size_t)*(fdb_custom_cmp_variable *)(unaff_R13.end_seqnum + 8));
      if (iVar7 != 0) {
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118764;
        reverse_sequence_iterator_kvs_test();
        unaff_R13 = aStack_1688;
        aVar31 = aStack_1680;
      }
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1186ff;
      iVar7 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(unaff_R13.end_seqnum + 0x40))
                   ->seqtree,
                   ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar31.end_seqnum + 0x40))->
                   seqtree,(size_t)*(void **)(unaff_R13.end_seqnum + 0x10));
      if (iVar7 != 0) {
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118781;
        reverse_sequence_iterator_kvs_test();
        unaff_R13 = aStack_1680;
      }
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11870b;
      fdb_doc_free((fdb_doc *)unaff_R13);
      aStack_1690.end_seqnum = 0;
      if ((int)unaff_RBP.end_seqnum == 0x40) goto LAB_00118794;
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118723;
      fVar6 = fdb_iterator_next(pfStack_1678);
      unaff_RBP.end_seqnum = unaff_RBP.end_seqnum + 0x10;
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_RBP.end_seqnum == 0x50) {
LAB_00118794:
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1187aa;
      fVar6 = fdb_iterator_sequence_init(pfStack_1658,&pfStack_1670,0,0,0);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00118c02;
      ptr_handle_00 = &aStack_1690;
      do {
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1187c4;
        fVar6 = fdb_iterator_get(pfStack_1670,(fdb_doc **)ptr_handle_00);
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00118bb4;
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1187d6;
        fdb_doc_free((fdb_doc *)aStack_1690);
        aStack_1690.end_seqnum = 0;
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1187e9;
        fVar6 = fdb_iterator_next(pfStack_1670);
      } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1187fd;
      fdb_commit(pfStack_1660,'\x01');
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118807;
      fVar6 = fdb_iterator_prev(pfStack_1678);
      if (fVar6 == FDB_RESULT_ITERATOR_FAIL) {
LAB_00118be9:
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118bee;
        reverse_sequence_iterator_kvs_test();
LAB_00118bee:
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118bf3;
        reverse_sequence_iterator_kvs_test();
        goto LAB_00118bf3;
      }
      unaff_RBP.end_seqnum = 4;
      ptr_handle_00 = aaStack_1650 + 6;
      aVar11.end_seqnum = (fdb_seqnum_t)&aStack_1690;
      aVar31.end_seqnum = (fdb_seqnum_t)&aStack_1680;
      do {
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118834;
        fVar6 = fdb_iterator_get(pfStack_1678,(fdb_doc **)aVar11);
        aVar19 = aStack_1690;
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00118bb9;
        aVar29 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)ptr_handle_00->end_seqnum;
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118856;
        iVar7 = bcmp(*(kvs_ops_stat **)(aStack_1690.end_seqnum + 0x20),
                     *(kvs_ops_stat **)(aVar29.end_seqnum + 0x20),*(size_t *)aStack_1690);
        if (iVar7 != 0) {
          aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1188c5;
          reverse_sequence_iterator_kvs_test();
          aVar29 = aStack_1680;
          aVar19 = aStack_1688;
        }
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11886c;
        iVar7 = bcmp(*(btree **)(aVar19.end_seqnum + 0x38),*(btree **)(aVar29.end_seqnum + 0x38),
                     (size_t)*(fdb_custom_cmp_variable *)(aVar19.end_seqnum + 8));
        if (iVar7 != 0) {
          aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1188e4;
          reverse_sequence_iterator_kvs_test();
          aVar29 = aStack_1680;
          aVar19 = aStack_1688;
        }
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118882;
        iVar7 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar19.end_seqnum + 0x40))->
                     seqtree,((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                             (aVar29.end_seqnum + 0x40))->seqtree,
                     (size_t)*(void **)(aVar19.end_seqnum + 0x10));
        unaff_R13 = aVar19;
        if (iVar7 != 0) {
          aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1188fe;
          reverse_sequence_iterator_kvs_test();
          unaff_R13 = aStack_1680;
        }
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11888e;
        fdb_doc_free((fdb_doc *)unaff_R13);
        aStack_1690.end_seqnum = 0;
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1188a1;
        fVar6 = fdb_iterator_prev(pfStack_1678);
        ptr_handle_00 = ptr_handle_00 + -2;
        unaff_RBP._0_4_ = (int)unaff_RBP.end_seqnum - 1;
        unaff_RBP.end_seqnum._4_4_ = 0;
      } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
      if (unaff_RBP._0_4_ != 0) goto LAB_00118be9;
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118917;
      fdb_iterator_close(pfStack_1678);
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118921;
      fVar6 = fdb_iterator_prev(pfStack_1670);
      if (fVar6 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00118bee;
      unaff_RBP.end_seqnum = 10;
      ptr_handle_00 = aaStack_15d0 + 9;
      aVar11.end_seqnum = (fdb_seqnum_t)&aStack_1690;
      aVar31.end_seqnum = (fdb_seqnum_t)&aStack_1680;
      do {
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11894e;
        fVar6 = fdb_iterator_get(pfStack_1670,(fdb_doc **)aVar11);
        aVar19 = aStack_1690;
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00118bbe;
        aVar29 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)ptr_handle_00->end_seqnum;
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118970;
        iVar7 = bcmp(*(kvs_ops_stat **)(aStack_1690.end_seqnum + 0x20),
                     *(kvs_ops_stat **)(aVar29.end_seqnum + 0x20),*(size_t *)aStack_1690);
        if (iVar7 != 0) {
          aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1189df;
          reverse_sequence_iterator_kvs_test();
          aVar29 = aStack_1680;
          aVar19 = aStack_1688;
        }
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118986;
        iVar7 = bcmp(*(btree **)(aVar19.end_seqnum + 0x38),*(btree **)(aVar29.end_seqnum + 0x38),
                     (size_t)*(fdb_custom_cmp_variable *)(aVar19.end_seqnum + 8));
        if (iVar7 != 0) {
          aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1189fe;
          reverse_sequence_iterator_kvs_test();
          aVar29 = aStack_1680;
          aVar19 = aStack_1688;
        }
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11899c;
        iVar7 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar19.end_seqnum + 0x40))->
                     seqtree,((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                             (aVar29.end_seqnum + 0x40))->seqtree,
                     (size_t)*(void **)(aVar19.end_seqnum + 0x10));
        unaff_R13 = aVar19;
        if (iVar7 != 0) {
          aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a18;
          reverse_sequence_iterator_kvs_test();
          unaff_R13 = aStack_1680;
        }
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1189a8;
        fdb_doc_free((fdb_doc *)unaff_R13);
        aStack_1690.end_seqnum = 0;
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1189bb;
        fVar6 = fdb_iterator_prev(pfStack_1670);
        ptr_handle_00 = ptr_handle_00 + -1;
        unaff_RBP._0_4_ = (int)unaff_RBP.end_seqnum - 1;
        unaff_RBP.end_seqnum._4_4_ = 0;
      } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
      if (unaff_RBP._0_4_ != 0) goto LAB_00118bee;
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a31;
      fdb_iterator_close(pfStack_1670);
      unaff_R13.end_seqnum = 0;
      aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a4a;
      fVar6 = fdb_iterator_sequence_init((fdb_kvs_handle *)aStack_1668,&pfStack_1678,0,0,0);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00118c07;
      unaff_RBP.end_seqnum = 10;
      aVar19.end_seqnum = aVar11.end_seqnum;
      do {
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a66;
        fVar6 = fdb_iterator_get(pfStack_1678,(fdb_doc **)&aStack_1690);
        aVar11 = aStack_1690;
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00118bce;
        aVar31 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aStack_1690.end_seqnum + 0x20);
        iVar16 = (int)unaff_R13.end_seqnum;
        ptr_handle_00 =
             (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)aaStack_1650[iVar16].end_seqnum;
        aVar29 = ptr_handle_00[4];
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118a91;
        iVar7 = bcmp((void *)aVar31,(void *)aVar29,*(size_t *)aStack_1690);
        if (iVar7 != 0) goto LAB_00118bc3;
        aVar31 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar11.end_seqnum + 0x38);
        aVar29 = ptr_handle_00[7];
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118ab0;
        iVar7 = bcmp((void *)aVar31,(void *)aVar29,
                     (size_t)*(fdb_custom_cmp_variable *)(aVar11.end_seqnum + 8));
        if (iVar7 != 0) goto LAB_00118bde;
        aVar31 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(aVar11.end_seqnum + 0x40);
        aVar29 = ptr_handle_00[8];
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118acf;
        iVar7 = bcmp((void *)aVar31,(void *)aVar29,(size_t)*(void **)(aVar11.end_seqnum + 0x10));
        if (iVar7 != 0) goto LAB_00118bd3;
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118adf;
        fdb_doc_free((fdb_doc *)aVar11);
        aStack_1690.end_seqnum = 0;
        uVar35 = iVar16 + 2;
        if (iVar16 == 8) {
          uVar35 = 1;
        }
        ptr_handle_00 = (anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(ulong)uVar35;
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118b02;
        fVar6 = fdb_iterator_next(pfStack_1678);
        unaff_RBP._0_4_ = (int)unaff_RBP.end_seqnum - 1;
        unaff_RBP.end_seqnum._4_4_ = 0;
        unaff_R13.end_seqnum._4_4_ = 0;
        unaff_R13.end_seqnum._0_4_ = uVar35;
        aVar19 = aVar11;
      } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
      if (unaff_RBP._0_4_ == 0) {
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118b22;
        fdb_iterator_close(pfStack_1678);
        lVar28 = 0;
        do {
          aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118b2e;
          fdb_doc_free((fdb_doc *)aaStack_1650[lVar28]);
          aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118b3b;
          fdb_doc_free((fdb_doc *)aaStack_15d0[lVar28]);
          lVar28 = lVar28 + 1;
        } while (lVar28 != 10);
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118b4e;
        fdb_kvs_close((fdb_kvs_handle *)aStack_1668);
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118b58;
        fdb_kvs_close(pfStack_1658);
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118b62;
        fdb_close(pfStack_1660);
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118b67;
        fdb_shutdown();
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118b6c;
        memleak_end();
        pcVar27 = "%s PASSED\n";
        if (reverse_sequence_iterator_kvs_test()::__test_pass != '\0') {
          pcVar27 = "%s FAILED\n";
        }
        aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118b9d;
        fprintf(_stderr,pcVar27,"reverse sequence iterator kvs test");
        return;
      }
      goto LAB_00118c0c;
    }
  }
  else {
LAB_00118bf3:
    aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118bf8;
    reverse_sequence_iterator_kvs_test();
LAB_00118bf8:
    aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118bfd;
    reverse_sequence_iterator_kvs_test();
LAB_00118bfd:
    aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118c02;
    reverse_sequence_iterator_kvs_test();
LAB_00118c02:
    aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118c07;
    reverse_sequence_iterator_kvs_test();
LAB_00118c07:
    aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118c0c;
    reverse_sequence_iterator_kvs_test();
LAB_00118c0c:
    aStack_16a8 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x118c11;
    reverse_sequence_iterator_kvs_test();
  }
  aStack_16a8.end_seqnum = (fdb_seqnum_t)reverse_iterator_test;
  reverse_sequence_iterator_kvs_test();
  pbStack_1b80 = (btree *)0x118c39;
  paStack_16d0 = ptr_handle_00;
  aStack_16c8 = aVar29;
  aStack_16c0 = unaff_R13;
  aStack_16b8 = aVar11;
  aStack_16b0 = aVar31;
  aStack_16a8 = unaff_RBP;
  gettimeofday(&tStack_1af0,(__timezone_ptr_t)0x0);
  pbStack_1b80 = (btree *)0x118c3e;
  memleak_start();
  auStack_1b68._0_8_ = (fdb_doc *)0x0;
  pbStack_1b80 = (btree *)0x118c4f;
  system("rm -rf  iterator_test* > errorlog.txt");
  pbStack_1b80 = (btree *)0x118c5f;
  fdb_get_default_config();
  doc = afStack_1ae0;
  pbStack_1b80 = (btree *)0x118c6f;
  fdb_get_default_kvs_config();
  fStack_17c8.buffercache_size = 0;
  fStack_17c8.wal_threshold = 0x400;
  fStack_17c8.flags = 1;
  fStack_17c8.compaction_threshold = '\0';
  pbVar12 = (btree *)&pfStack_1b50;
  pbStack_1b80 = (btree *)0x118c9d;
  fdb_open((fdb_file_handle **)pbVar12,"./iterator_test1",&fStack_17c8);
  pfVar21 = (fdb_doc *)(auStack_1b68 + 0x10);
  pbStack_1b80 = (btree *)0x118cb0;
  fdb_kvs_open_default(pfStack_1b50,(fdb_kvs_handle **)pfVar21,(fdb_kvs_config *)doc);
  pbStack_1b80 = (btree *)0x118cc6;
  fVar6 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1b68._16_8_,logCallbackFunc,"reverse_iterator_test");
  if (fVar6 == FDB_RESULT_SUCCESS) {
    lVar28 = 0;
    uVar17 = 0;
    do {
      pbStack_1b80 = (btree *)0x118cee;
      sprintf(acStack_18c8,"key%d",uVar17 & 0xffffffff);
      pbStack_1b80 = (btree *)0x118d06;
      sprintf(acStack_19c8,"meta%d",uVar17 & 0xffffffff);
      pbStack_1b80 = (btree *)0x118d1e;
      sprintf((char *)&afStack_1ae0[0].size_ondisk,"body%d",uVar17 & 0xffffffff);
      pbStack_1b80 = (btree *)0x118d2e;
      sVar8 = strlen(acStack_18c8);
      pbStack_1b80 = (btree *)0x118d41;
      sVar9 = strlen(acStack_19c8);
      pbStack_1b80 = (btree *)0x118d51;
      sVar10 = strlen((char *)&afStack_1ae0[0].size_ondisk);
      pbStack_1b80 = (btree *)0x118d76;
      fdb_doc_create((fdb_doc **)((long)aaStack_1b48 + lVar28),acStack_18c8,sVar8,acStack_19c8,sVar9
                     ,&afStack_1ae0[0].size_ondisk,sVar10);
      pbStack_1b80 = (btree *)0x118d85;
      fdb_set((fdb_kvs_handle *)auStack_1b68._16_8_,(fdb_doc *)aaStack_1b48[uVar17]);
      lVar28 = lVar28 + 0x10;
      bVar36 = uVar17 < 8;
      uVar17 = uVar17 + 2;
    } while (bVar36);
    pbStack_1b80 = (btree *)0x118da9;
    fdb_commit(pfStack_1b50,'\x01');
    lVar28 = 8;
    pfVar21 = (fdb_doc *)0x1;
    do {
      pbStack_1b80 = (btree *)0x118dd1;
      sprintf(acStack_18c8,"key%d",(ulong)pfVar21 & 0xffffffff);
      pbStack_1b80 = (btree *)0x118dea;
      sprintf(acStack_19c8,"meta%d",(ulong)pfVar21 & 0xffffffff);
      pbStack_1b80 = (btree *)0x118e03;
      sprintf((char *)&afStack_1ae0[0].size_ondisk,"body%d",(ulong)pfVar21 & 0xffffffff);
      aVar29.end_seqnum = (long)aaStack_1b48 + lVar28;
      pbStack_1b80 = (btree *)0x118e13;
      unaff_RBP.end_seqnum = strlen(acStack_18c8);
      pbStack_1b80 = (btree *)0x118e26;
      pbVar12 = (btree *)strlen(acStack_19c8);
      pbStack_1b80 = (btree *)0x118e36;
      sVar8 = strlen((char *)&afStack_1ae0[0].size_ondisk);
      pbStack_1b80 = (btree *)0x118e5b;
      fdb_doc_create((fdb_doc **)aVar29,acStack_18c8,unaff_RBP.end_keylen,acStack_19c8,
                     (size_t)pbVar12,&afStack_1ae0[0].size_ondisk,sVar8);
      pbStack_1b80 = (btree *)0x118e6a;
      fdb_set((fdb_kvs_handle *)auStack_1b68._16_8_,(fdb_doc *)aaStack_1b48[(long)pfVar21]);
      pbVar4 = (bool *)&pfVar21->keylen;
      lVar28 = lVar28 + 0x10;
      bVar36 = pfVar21 < (fdb_doc *)0x8;
      pfVar21 = (fdb_doc *)(pbVar4 + 2);
    } while (bVar36);
    unaff_R13.end_seqnum = 0;
    pbStack_1b80 = (btree *)0x118e8e;
    fdb_commit(pfStack_1b50,'\0');
    pbStack_1b80 = (btree *)0x118eae;
    fdb_iterator_init((fdb_kvs_handle *)auStack_1b68._16_8_,(fdb_iterator **)(auStack_1b68 + 8),
                      (void *)0x0,0,(void *)0x0,0,0);
    pfVar21 = (fdb_doc *)auStack_1b68;
    pfVar20 = (fdb_doc *)(pbVar4 + 2);
    do {
      pbStack_1b80 = (btree *)0x118ec0;
      fVar6 = fdb_iterator_get((fdb_iterator *)auStack_1b68._8_8_,(fdb_doc **)pfVar21);
      doc = (fdb_doc *)auStack_1b68._0_8_;
      if (fVar6 != FDB_RESULT_SUCCESS) {
LAB_00119395:
        pbStack_1b80 = (btree *)0x11939a;
        reverse_iterator_test();
        doc = pfVar20;
LAB_0011939a:
        pbStack_1b80 = (btree *)0x1193a5;
        reverse_iterator_test();
LAB_001193a5:
        pbStack_1b80 = (btree *)0x1193b0;
        reverse_iterator_test();
        goto LAB_001193b0;
      }
      pbVar12 = *(btree **)(auStack_1b68._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  aaStack_1b48[unaff_R13.end_seqnum].end_seqnum;
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x20);
      pbStack_1b80 = (btree *)0x118ee8;
      iVar7 = bcmp(pbVar12,(void *)aVar29,*(size_t *)auStack_1b68._0_8_);
      pfVar20 = doc;
      if (iVar7 != 0) {
        pbStack_1b80 = (btree *)0x119395;
        reverse_iterator_test();
        goto LAB_00119395;
      }
      pbVar12 = *(btree **)((long)doc + 0x38);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
      pbStack_1b80 = (btree *)0x118f07;
      iVar7 = bcmp(pbVar12,(void *)aVar29,*(size_t *)((long)doc + 8));
      if (iVar7 != 0) goto LAB_001193a5;
      pbVar12 = *(btree **)((long)doc + 0x40);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x40);
      pbStack_1b80 = (btree *)0x118f26;
      iVar7 = bcmp(pbVar12,(void *)aVar29,*(size_t *)((long)doc + 0x10));
      if (iVar7 != 0) goto LAB_0011939a;
      pbStack_1b80 = (btree *)0x118f36;
      fdb_doc_free(doc);
      auStack_1b68._0_8_ = (fdb_doc *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 1;
      pbStack_1b80 = (btree *)0x118f4c;
      fVar6 = fdb_iterator_next((fdb_iterator *)auStack_1b68._8_8_);
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if ((fdb_kvs_handle *)unaff_R13.end_seqnum != (fdb_kvs_handle *)0xa) goto LAB_00119431;
    pbStack_1b80 = (btree *)0x118f69;
    fVar6 = fdb_iterator_prev((fdb_iterator *)auStack_1b68._8_8_);
    if (fVar6 == FDB_RESULT_ITERATOR_FAIL) {
LAB_00119427:
      pbStack_1b80 = (btree *)0x11942c;
      reverse_iterator_test();
      goto LAB_0011942c;
    }
    unaff_R13.end_seqnum = 4;
    pfVar21 = (fdb_doc *)auStack_1b68;
    do {
      pbStack_1b80 = (btree *)0x118f8a;
      fVar6 = fdb_iterator_get((fdb_iterator *)auStack_1b68._8_8_,(fdb_doc **)pfVar21);
      doc = (fdb_doc *)auStack_1b68._0_8_;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001193fc;
      pbVar12 = *(btree **)(auStack_1b68._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  aaStack_1b48[(long)(unaff_R13.end_seqnum + 5)].end_seqnum;
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x20);
      pbStack_1b80 = (btree *)0x118fb2;
      iVar7 = bcmp(pbVar12,(void *)aVar29,*(size_t *)auStack_1b68._0_8_);
      if (iVar7 != 0) goto LAB_0011940c;
      pbVar12 = *(btree **)((long)doc + 0x38);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
      pbStack_1b80 = (btree *)0x118fd1;
      iVar7 = bcmp(pbVar12,(void *)aVar29,*(size_t *)((long)doc + 8));
      if (iVar7 != 0) goto LAB_00119401;
      pbVar12 = *(btree **)((long)doc + 0x40);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x40);
      pbStack_1b80 = (btree *)0x118ff0;
      iVar7 = bcmp(pbVar12,(void *)aVar29,*(size_t *)((long)doc + 0x10));
      if (iVar7 != 0) goto LAB_00119417;
      pbStack_1b80 = (btree *)0x119000;
      fdb_doc_free(doc);
      auStack_1b68._0_8_ = (fdb_doc *)0x0;
      bVar36 = (fdb_kvs_handle *)unaff_R13.end_seqnum == (fdb_kvs_handle *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum - 1;
      if (bVar36) goto LAB_0011902b;
      pbStack_1b80 = (btree *)0x119019;
      fVar6 = fdb_iterator_prev((fdb_iterator *)auStack_1b68._8_8_);
      pfVar20 = doc;
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if ((fdb_kvs_handle *)unaff_R13.end_seqnum != (fdb_kvs_handle *)0x0) goto LAB_00119427;
LAB_0011902b:
    pbStack_1b80 = (btree *)0x119035;
    fVar6 = fdb_iterator_next((fdb_iterator *)auStack_1b68._8_8_);
    if (fVar6 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00119436;
    pbStack_1b80 = (btree *)0x11904d;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_1b68._8_8_,(fdb_doc **)auStack_1b68);
    pfVar20 = (fdb_doc *)auStack_1b68._0_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011943b;
    doc = *(fdb_doc **)(auStack_1b68._0_8_ + 0x20);
    pbVar12 = *(btree **)(aStack_1b18.end_seqnum + 0x20);
    pbStack_1b80 = (btree *)0x119076;
    iVar7 = bcmp(doc,pbVar12,*(size_t *)auStack_1b68._0_8_);
    aVar29 = aStack_1b18;
    if (iVar7 != 0) goto LAB_00119440;
    doc = *(fdb_doc **)((long)pfVar20 + 0x38);
    pbVar12 = *(btree **)(aStack_1b18.end_seqnum + 0x38);
    pbStack_1b80 = (btree *)0x119096;
    iVar7 = bcmp(doc,pbVar12,*(size_t *)((long)pfVar20 + 8));
    if (iVar7 != 0) goto LAB_0011944b;
    doc = *(fdb_doc **)((long)pfVar20 + 0x40);
    pbVar12 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aStack_1b18.end_seqnum + 0x40))->
              seqtree;
    pbStack_1b80 = (btree *)0x1190b6;
    iVar7 = bcmp(doc,pbVar12,*(size_t *)((long)pfVar20 + 0x10));
    if (iVar7 != 0) goto LAB_00119456;
    pbStack_1b80 = (btree *)0x1190c6;
    fdb_doc_free(pfVar20);
    auStack_1b68._0_8_ = (fdb_doc *)0x0;
    pbStack_1b80 = (btree *)0x1190d9;
    fVar6 = fdb_iterator_next((fdb_iterator *)auStack_1b68._8_8_);
    if (fVar6 == FDB_RESULT_ITERATOR_FAIL) goto LAB_00119461;
    pbStack_1b80 = (btree *)0x1190f1;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_1b68._8_8_,(fdb_doc **)auStack_1b68);
    pfVar21 = (fdb_doc *)auStack_1b68._0_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    doc = *(fdb_doc **)(auStack_1b68._0_8_ + 0x20);
    pbVar12 = *(btree **)(aStack_1b10.end_seqnum + 0x20);
    pbStack_1b80 = (btree *)0x11911a;
    iVar7 = bcmp(doc,pbVar12,*(size_t *)auStack_1b68._0_8_);
    aVar29 = aStack_1b10;
    if (iVar7 != 0) goto LAB_0011946b;
    doc = *(fdb_doc **)((long)pfVar21 + 0x38);
    pbVar12 = *(btree **)(aStack_1b10.end_seqnum + 0x38);
    pbStack_1b80 = (btree *)0x11913a;
    iVar7 = bcmp(doc,pbVar12,*(size_t *)((long)pfVar21 + 8));
    if (iVar7 != 0) goto LAB_00119476;
    doc = *(fdb_doc **)((long)pfVar21 + 0x40);
    pbVar12 = ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aStack_1b10.end_seqnum + 0x40))->
              seqtree;
    pbStack_1b80 = (btree *)0x11915a;
    iVar7 = bcmp(doc,pbVar12,*(size_t *)((long)pfVar21 + 0x10));
    if (iVar7 != 0) goto LAB_00119481;
    pbStack_1b80 = (btree *)0x11916a;
    fdb_doc_free(pfVar21);
    auStack_1b68._0_8_ = (fdb_doc *)0x0;
    pbStack_1b80 = (btree *)0x11917d;
    fVar6 = fdb_iterator_prev((fdb_iterator *)auStack_1b68._8_8_);
    if (fVar6 == FDB_RESULT_ITERATOR_FAIL) {
LAB_00119422:
      pbStack_1b80 = (btree *)0x119427;
      reverse_iterator_test();
      goto LAB_00119427;
    }
    unaff_R13.end_seqnum = 6;
    pfVar21 = (fdb_doc *)auStack_1b68;
    pfVar20 = doc;
    do {
      pbStack_1b80 = (btree *)0x11919e;
      fVar6 = fdb_iterator_get((fdb_iterator *)auStack_1b68._8_8_,(fdb_doc **)pfVar21);
      doc = (fdb_doc *)auStack_1b68._0_8_;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001193bb;
      pbVar12 = *(btree **)(auStack_1b68._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  aaStack_1b48[unaff_R13.end_seqnum].end_seqnum;
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x20);
      pbStack_1b80 = (btree *)0x1191c6;
      iVar7 = bcmp(pbVar12,(void *)aVar29,*(size_t *)auStack_1b68._0_8_);
      if (iVar7 != 0) goto LAB_001193b0;
      pbVar12 = *(btree **)((long)doc + 0x38);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
      pbStack_1b80 = (btree *)0x1191e5;
      iVar7 = bcmp(pbVar12,(void *)aVar29,*(size_t *)((long)doc + 8));
      if (iVar7 != 0) goto LAB_001193cb;
      pbVar12 = *(btree **)((long)doc + 0x40);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x40);
      pbStack_1b80 = (btree *)0x119204;
      iVar7 = bcmp(pbVar12,(void *)aVar29,*(size_t *)((long)doc + 0x10));
      if (iVar7 != 0) goto LAB_001193c0;
      pbStack_1b80 = (btree *)0x119214;
      fdb_doc_free(doc);
      auStack_1b68._0_8_ = (fdb_doc *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum - 1;
      pbStack_1b80 = (btree *)0x11922a;
      fVar6 = fdb_iterator_prev((fdb_iterator *)auStack_1b68._8_8_);
      pfVar20 = doc;
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if ((fdb_kvs_handle *)unaff_R13.end_seqnum != (fdb_kvs_handle *)0xffffffffffffffff)
    goto LAB_00119422;
    pbStack_1b80 = (btree *)0x119247;
    fVar6 = fdb_iterator_next((fdb_iterator *)auStack_1b68._8_8_);
    if (fVar6 == FDB_RESULT_ITERATOR_FAIL) {
      pbStack_1b80 = (btree *)0x119256;
      reverse_iterator_test();
    }
    unaff_R13.end_seqnum = 0;
    pfVar21 = (fdb_doc *)auStack_1b68;
    do {
      pbStack_1b80 = (btree *)0x11926b;
      fVar6 = fdb_iterator_get((fdb_iterator *)auStack_1b68._8_8_,(fdb_doc **)pfVar21);
      doc = (fdb_doc *)auStack_1b68._0_8_;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001193e1;
      pbVar12 = *(btree **)(auStack_1b68._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  aaStack_1b48[unaff_R13.end_seqnum].end_seqnum;
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x20);
      pbStack_1b80 = (btree *)0x119293;
      iVar7 = bcmp(pbVar12,(void *)aVar29,*(size_t *)auStack_1b68._0_8_);
      if (iVar7 != 0) goto LAB_001193d6;
      pbVar12 = *(btree **)((long)doc + 0x38);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
      pbStack_1b80 = (btree *)0x1192b2;
      iVar7 = bcmp(pbVar12,(void *)aVar29,*(size_t *)((long)doc + 8));
      if (iVar7 != 0) goto LAB_001193f1;
      pbVar12 = *(btree **)((long)doc + 0x40);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x40);
      pbStack_1b80 = (btree *)0x1192d1;
      iVar7 = bcmp(pbVar12,(void *)aVar29,*(size_t *)((long)doc + 0x10));
      if (iVar7 != 0) goto LAB_001193e6;
      pbStack_1b80 = (btree *)0x1192e1;
      fdb_doc_free(doc);
      auStack_1b68._0_8_ = (fdb_doc *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 1;
      pbStack_1b80 = (btree *)0x1192f7;
      fVar6 = fdb_iterator_next((fdb_iterator *)auStack_1b68._8_8_);
      pfVar20 = doc;
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if ((fdb_kvs_handle *)unaff_R13.end_seqnum == (fdb_kvs_handle *)0xa) {
      pbStack_1b80 = (btree *)0x119314;
      fdb_iterator_close((fdb_iterator *)auStack_1b68._8_8_);
      pbStack_1b80 = (btree *)0x11931e;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1b68._16_8_);
      pbStack_1b80 = (btree *)0x119328;
      fdb_close(pfStack_1b50);
      lVar28 = 0;
      do {
        pbStack_1b80 = (btree *)0x119334;
        fdb_doc_free((fdb_doc *)aaStack_1b48[lVar28]);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 10);
      pbStack_1b80 = (btree *)0x119342;
      fdb_shutdown();
      pbStack_1b80 = (btree *)0x119347;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (reverse_iterator_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pbStack_1b80 = (btree *)0x119378;
      fprintf(_stderr,pcVar27,"reverse iterator test");
      return;
    }
  }
  else {
LAB_0011942c:
    pbStack_1b80 = (btree *)0x119431;
    reverse_iterator_test();
LAB_00119431:
    pbStack_1b80 = (btree *)0x119436;
    reverse_iterator_test();
LAB_00119436:
    pbStack_1b80 = (btree *)0x11943b;
    reverse_iterator_test();
LAB_0011943b:
    pfVar20 = pfVar21;
    pbStack_1b80 = (btree *)0x119440;
    reverse_iterator_test();
LAB_00119440:
    pbStack_1b80 = (btree *)0x11944b;
    reverse_iterator_test();
LAB_0011944b:
    pbStack_1b80 = (btree *)0x119456;
    reverse_iterator_test();
LAB_00119456:
    pbStack_1b80 = (btree *)0x119461;
    reverse_iterator_test();
LAB_00119461:
    pbStack_1b80 = (btree *)0x119466;
    reverse_iterator_test();
LAB_00119466:
    pfVar21 = pfVar20;
    pbStack_1b80 = (btree *)0x11946b;
    reverse_iterator_test();
LAB_0011946b:
    pbStack_1b80 = (btree *)0x119476;
    reverse_iterator_test();
LAB_00119476:
    pbStack_1b80 = (btree *)0x119481;
    reverse_iterator_test();
LAB_00119481:
    pbStack_1b80 = (btree *)0x11948c;
    reverse_iterator_test();
  }
  pbStack_1b80 = (btree *)reverse_seek_to_max_nokey;
  reverse_iterator_test();
  aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1194ab;
  pfStack_1b98 = pfVar21;
  aStack_1b90 = aVar29;
  pfStack_1b88 = doc;
  pbStack_1b80 = pbVar12;
  gettimeofday(&tStack_1fc0,(__timezone_ptr_t)0x0);
  aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1194b0;
  memleak_start();
  aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1194bc;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcVar27 = (char *)&fStack_1c90;
  aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1194cc;
  fdb_get_default_config();
  aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1194d6;
  fdb_get_default_kvs_config();
  fStack_1c90.buffercache_size = 0;
  aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1194f2;
  fVar6 = fdb_open(&pfStack_1ff8,"./iterator_test1",(fdb_config *)pcVar27);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11950e;
    fVar6 = fdb_kvs_open_default
                      (pfStack_1ff8,(fdb_kvs_handle **)(auStack_2010 + 8),
                       (fdb_kvs_config *)(auStack_1ff0 + 0x18));
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00119783;
    pcVar27 = "doc-%03d";
    doc = (fdb_doc *)auStack_1ff0;
    aVar29.end_seqnum = 0;
    uVar17 = 0;
    do {
      aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119538;
      sprintf((char *)doc,"doc-%03d",uVar17 & 0xffffffff);
      auStack_1ff0._7_2_ = 0;
      aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119564;
      fdb_doc_create((fdb_doc **)((long)apfStack_1fb0 + aVar29.end_seqnum),doc,10,(void *)0x0,0,doc,
                     10);
      aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119573;
      fdb_set((fdb_kvs_handle *)auStack_2010._8_8_,apfStack_1fb0[uVar17]);
      uVar17 = uVar17 + 1;
      aVar29.end_seqnum = aVar29.end_seqnum + 8;
    } while (uVar17 != 100);
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11958c;
    fdb_commit(pfStack_1ff8,'\0');
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1195a4;
    fVar6 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2010._8_8_,logCallbackFunc,
                       "reverse_seek_to_max_nokey");
    pbVar12 = (btree *)0x64;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00119788;
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1195e0;
    fVar6 = fdb_iterator_init((fdb_kvs_handle *)auStack_2010._8_8_,(fdb_iterator **)auStack_2010,
                              *(void **)(lStack_1ef0 + 0x20),10,"doc-029b",10,2);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011978d;
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1195f2;
    fVar6 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_2010._0_8_);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00119792;
    pcVar27 = auStack_2010 + 0x10;
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11961b;
    fdb_doc_create((fdb_doc **)pcVar27,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119628;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_2010._0_8_,(fdb_doc **)pcVar27);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00119797;
    if (**(long **)(auStack_2010._16_8_ + 0x20) != 0x3932302d636f64) goto LAB_0011979c;
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119651;
    fdb_doc_free((fdb_doc *)auStack_2010._16_8_);
    pcVar27 = auStack_2010;
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11965e;
    fdb_iterator_close((fdb_iterator *)auStack_2010._0_8_);
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119690;
    fVar6 = fdb_iterator_init((fdb_kvs_handle *)auStack_2010._8_8_,(fdb_iterator **)pcVar27,
                              "doc-024b",10,*(void **)(lStack_1ec0 + 0x20),10,2);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001197a4;
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1196a2;
    fVar6 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_2010._0_8_);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001197a9;
    pcVar27 = auStack_2010 + 0x10;
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1196cb;
    fdb_doc_create((fdb_doc **)pcVar27,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1196d8;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_2010._0_8_,(fdb_doc **)pcVar27);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_001197ae;
    if (**(long **)(auStack_2010._16_8_ + 0x20) == 0x3532302d636f64) {
      aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119701;
      fdb_doc_free((fdb_doc *)auStack_2010._16_8_);
      aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11970b;
      fdb_iterator_close((fdb_iterator *)auStack_2010._0_8_);
      aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119715;
      fdb_kvs_close((fdb_kvs_handle *)auStack_2010._8_8_);
      aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11971f;
      fdb_close(pfStack_1ff8);
      lVar28 = 0;
      do {
        aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11972b;
        fdb_doc_free(apfStack_1fb0[lVar28]);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 100);
      aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119739;
      fdb_shutdown();
      aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11973e;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (reverse_seek_to_max_nokey()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11976f;
      fprintf(_stderr,pcVar27,"reverse seek to max non-existent key test");
      return;
    }
  }
  else {
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119783;
    reverse_seek_to_max_nokey();
LAB_00119783:
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119788;
    reverse_seek_to_max_nokey();
LAB_00119788:
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11978d;
    reverse_seek_to_max_nokey();
LAB_0011978d:
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119792;
    reverse_seek_to_max_nokey();
LAB_00119792:
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119797;
    reverse_seek_to_max_nokey();
LAB_00119797:
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11979c;
    reverse_seek_to_max_nokey();
LAB_0011979c:
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1197a4;
    reverse_seek_to_max_nokey();
LAB_001197a4:
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1197a9;
    reverse_seek_to_max_nokey();
LAB_001197a9:
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1197ae;
    reverse_seek_to_max_nokey();
LAB_001197ae:
    aStack_2028 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1197b3;
    reverse_seek_to_max_nokey();
  }
  aStack_2028.end_seqnum = (fdb_seqnum_t)iterator_seek_wal_only_test;
  reverse_seek_to_max_nokey();
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1197de;
  pfStack_2050 = (fdb_config *)pcVar27;
  aStack_2048 = aVar29;
  aStack_2040 = unaff_R13;
  pfStack_2038 = doc;
  pbStack_2030 = pbVar12;
  aStack_2028 = unaff_RBP;
  gettimeofday((timeval *)(auStack_2470 + 0x18),(__timezone_ptr_t)0x0);
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1197e3;
  memleak_start();
  auStack_24f0._0_8_ = (fdb_kvs_handle *)0x0;
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1197f4;
  system("rm -rf  iterator_test* > errorlog.txt");
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119804;
  fdb_get_default_config();
  pfVar13 = (fdb_kvs_handle *)auStack_2470;
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119814;
  fdb_get_default_kvs_config();
  fStack_2148.buffercache_size = 0;
  fStack_2148.wal_threshold = 0x400;
  fStack_2148.flags = 1;
  fStack_2148.compaction_threshold = '\0';
  pfVar18 = (fdb_kvs_handle *)&pfStack_24d8;
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119842;
  fdb_open((fdb_file_handle **)pfVar18,"./iterator_test1",&fStack_2148);
  pfVar15 = (fdb_kvs_handle *)&pfStack_24e0;
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119855;
  fdb_kvs_open_default(pfStack_24d8,(fdb_kvs_handle **)pfVar15,(fdb_kvs_config *)pfVar13);
  aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11986b;
  fVar6 = fdb_set_log_callback(pfStack_24e0,logCallbackFunc,"iterator_seek_wal_only_test");
  if (fVar6 == FDB_RESULT_SUCCESS) {
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119891;
    fVar6 = fdb_kvs_open(pfStack_24d8,&pfStack_24d0,"kv1",(fdb_kvs_config *)auStack_2470);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a3f4;
    aVar29.end_seqnum = 0;
    pfVar22 = (fdb_kvs_handle *)0x0;
    do {
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1198b9;
      sprintf((char *)&fStack_2448,"kEy%d",(ulong)pfVar22 & 0xffffffff);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1198d1;
      sprintf((char *)&fStack_2448.bub_ctx.handle,"mEta%d",(ulong)pfVar22 & 0xffffffff);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1198e9;
      sprintf((char *)&fStack_2448.config.encryption_key,"bOdy%d",(ulong)pfVar22 & 0xffffffff);
      pfVar18 = (fdb_kvs_handle *)((long)aaStack_24c8 + aVar29.end_seqnum);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1198f9;
      unaff_R13.end_seqnum = strlen((char *)&fStack_2448);
      unaff_RBP.end_seqnum = (fdb_seqnum_t)&fStack_2448.bub_ctx.handle;
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11990c;
      pfVar13 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11991c;
      sVar8 = strlen((char *)&fStack_2448.config.encryption_key);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119941;
      fdb_doc_create((fdb_doc **)pfVar18,&fStack_2448,unaff_R13.end_keylen,(void *)unaff_RBP,
                     (size_t)pfVar13,&fStack_2448.config.encryption_key,sVar8);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119950;
      fVar6 = fdb_set(pfStack_24d0,(fdb_doc *)aaStack_24c8[(long)pfVar22]);
      if (fVar6 != FDB_RESULT_SUCCESS) {
        aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3a3;
        iterator_seek_wal_only_test();
        goto LAB_0011a3a3;
      }
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119962;
      fdb_doc_free((fdb_doc *)aaStack_24c8[(long)pfVar22]);
      pfVar22 = (fdb_kvs_handle *)&(pfVar22->kvs_config).field_0x1;
      aVar29.end_seqnum = aVar29.end_seqnum + 8;
    } while (pfVar22 != (fdb_kvs_handle *)0xa);
    aVar29.end_seqnum = 0;
    uVar17 = 0;
    do {
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119993;
      sprintf((char *)&fStack_2448,"key%d",uVar17 & 0xffffffff);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1199ab;
      sprintf((char *)&fStack_2448.bub_ctx.handle,"meta%d",uVar17 & 0xffffffff);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1199c3;
      sprintf((char *)&fStack_2448.config.encryption_key,"body%d",uVar17 & 0xffffffff);
      pfVar18 = (fdb_kvs_handle *)((long)aaStack_24c8 + aVar29.end_seqnum);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1199d3;
      unaff_R13.end_seqnum = strlen((char *)&fStack_2448);
      unaff_RBP.end_seqnum = (fdb_seqnum_t)&fStack_2448.bub_ctx.handle;
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1199e6;
      pfVar13 = (fdb_kvs_handle *)strlen((char *)unaff_RBP);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x1199f6;
      sVar8 = strlen((char *)&fStack_2448.config.encryption_key);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119a1b;
      fdb_doc_create((fdb_doc **)pfVar18,&fStack_2448,unaff_R13.end_keylen,(void *)unaff_RBP,
                     (size_t)pfVar13,&fStack_2448.config.encryption_key,sVar8);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119a2a;
      fdb_set(pfStack_24e0,(fdb_doc *)aaStack_24c8[uVar17]);
      uVar17 = uVar17 + 1;
      aVar29.end_seqnum = aVar29.end_seqnum + 8;
    } while (uVar17 != 10);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119a47;
    fdb_commit(pfStack_24d8,'\0');
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119a6a;
    fdb_iterator_init(pfStack_24e0,(fdb_iterator **)(auStack_24f0 + 8),(void *)0x0,0,(void *)0x0,0,0
                     );
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119a77;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_24f0._8_8_,(fdb_doc **)auStack_24f0);
    aVar11 = aaStack_24c8[0];
    pfVar22 = (fdb_kvs_handle *)auStack_24f0._0_8_;
    pfVar15 = (fdb_kvs_handle *)(auStack_24f0 + 8);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a3f9;
    pfVar13 = *(fdb_kvs_handle **)(auStack_24f0._0_8_ + 0x20);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[0].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119aa0;
    iVar7 = bcmp(pfVar13,pfVar18,*(size_t *)(fdb_kvs_config *)auStack_24f0._0_8_);
    if (iVar7 != 0) goto LAB_0011a3fe;
    pfVar13 = *(fdb_kvs_handle **)((long)pfVar22 + 0x38);
    pfVar18 = *(fdb_kvs_handle **)(aVar11.end_seqnum + 0x38);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ac0;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar22->kvs_config).custom_cmp);
    if (iVar7 != 0) goto LAB_0011a409;
    pfVar13 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar22 + 0x40))->seqtree;
    pfVar18 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar11.end_seqnum + 0x40))->seqtree
    ;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ae0;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar22->kvs_config).custom_cmp_param);
    if (iVar7 != 0) goto LAB_0011a414;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119af0;
    fdb_doc_free((fdb_doc *)pfVar22);
    pfVar22 = (fdb_kvs_handle *)auStack_24f0._8_8_;
    auStack_24f0._0_8_ = (fdb_kvs_handle *)0x0;
    pfVar13 = *(fdb_kvs_handle **)(aaStack_24c8[2].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119b14;
    sVar8 = strlen((char *)&fStack_2448);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119b24;
    fVar6 = fdb_iterator_seek((fdb_iterator *)pfVar22,pfVar13,sVar8,'\0');
    if (fVar6 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a41f;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119b3c;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_24f0._8_8_,(fdb_doc **)auStack_24f0);
    aVar29 = aaStack_24c8[2];
    pfVar15 = (fdb_kvs_handle *)auStack_24f0._0_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a424;
    pfVar13 = *(fdb_kvs_handle **)(auStack_24f0._0_8_ + 0x20);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[2].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119b65;
    iVar7 = bcmp(pfVar13,pfVar18,*(size_t *)(fdb_kvs_config *)auStack_24f0._0_8_);
    if (iVar7 != 0) goto LAB_0011a429;
    pfVar13 = *(fdb_kvs_handle **)((long)pfVar15 + 0x38);
    pfVar18 = *(fdb_kvs_handle **)(aVar29.end_seqnum + 0x38);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119b85;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar15->kvs_config).custom_cmp);
    if (iVar7 != 0) goto LAB_0011a434;
    pfVar13 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar15 + 0x40))->seqtree;
    pfVar18 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar29.end_seqnum + 0x40))->seqtree
    ;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ba5;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar15->kvs_config).custom_cmp_param);
    if (iVar7 != 0) goto LAB_0011a43f;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119bb5;
    fdb_doc_free((fdb_doc *)pfVar15);
    auStack_24f0._0_8_ = (fdb_kvs_handle *)0x0;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119bc8;
    fVar6 = fdb_iterator_next((fdb_iterator *)auStack_24f0._8_8_);
    if (fVar6 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a44a;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119be0;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_24f0._8_8_,(fdb_doc **)auStack_24f0);
    aVar11 = aaStack_24c8[3];
    pfVar22 = (fdb_kvs_handle *)auStack_24f0._0_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a44f;
    pfVar13 = *(fdb_kvs_handle **)(auStack_24f0._0_8_ + 0x20);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[3].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119c09;
    iVar7 = bcmp(pfVar13,pfVar18,*(size_t *)(fdb_kvs_config *)auStack_24f0._0_8_);
    if (iVar7 != 0) goto LAB_0011a454;
    pfVar13 = *(fdb_kvs_handle **)((long)pfVar22 + 0x38);
    pfVar18 = *(fdb_kvs_handle **)(aVar11.end_seqnum + 0x38);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119c29;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar22->kvs_config).custom_cmp);
    if (iVar7 != 0) goto LAB_0011a45f;
    pfVar13 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar22 + 0x40))->seqtree;
    pfVar18 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar11.end_seqnum + 0x40))->seqtree
    ;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119c49;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar22->kvs_config).custom_cmp_param);
    if (iVar7 != 0) goto LAB_0011a46a;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119c59;
    fdb_doc_free((fdb_doc *)pfVar22);
    pfVar22 = (fdb_kvs_handle *)auStack_24f0._8_8_;
    auStack_24f0._0_8_ = (fdb_kvs_handle *)0x0;
    pfVar13 = *(fdb_kvs_handle **)(aaStack_24c8[9].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119c7d;
    sVar8 = strlen((char *)&fStack_2448);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119c8d;
    fVar6 = fdb_iterator_seek((fdb_iterator *)pfVar22,pfVar13,sVar8,'\0');
    if (fVar6 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a475;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ca5;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_24f0._8_8_,(fdb_doc **)auStack_24f0);
    aVar31 = aaStack_24c8[9];
    pfVar15 = (fdb_kvs_handle *)auStack_24f0._0_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a47a;
    pfVar13 = *(fdb_kvs_handle **)(auStack_24f0._0_8_ + 0x20);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[9].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119cce;
    iVar7 = bcmp(pfVar13,pfVar18,*(size_t *)(fdb_kvs_config *)auStack_24f0._0_8_);
    if (iVar7 != 0) goto LAB_0011a47f;
    pfVar13 = *(fdb_kvs_handle **)((long)pfVar15 + 0x38);
    pfVar18 = *(fdb_kvs_handle **)(aVar31.end_seqnum + 0x38);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119cee;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar15->kvs_config).custom_cmp);
    if (iVar7 != 0) goto LAB_0011a48a;
    pfVar13 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar15 + 0x40))->seqtree;
    pfVar18 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar31.end_seqnum + 0x40))->seqtree
    ;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119d0e;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar15->kvs_config).custom_cmp_param);
    if (iVar7 != 0) goto LAB_0011a495;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119d1e;
    fdb_doc_free((fdb_doc *)pfVar15);
    pfVar15 = (fdb_kvs_handle *)auStack_24f0._8_8_;
    auStack_24f0._0_8_ = (fdb_kvs_handle *)0x0;
    pfVar13 = *(fdb_kvs_handle **)(aaStack_24c8[0].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119d42;
    sVar8 = strlen((char *)&fStack_2448);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119d52;
    fVar6 = fdb_iterator_seek((fdb_iterator *)pfVar15,pfVar13,sVar8,'\0');
    if (fVar6 == FDB_RESULT_ITERATOR_FAIL) goto LAB_0011a4a0;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119d6a;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_24f0._8_8_,(fdb_doc **)auStack_24f0);
    aVar29 = aaStack_24c8[0];
    pfVar22 = (fdb_kvs_handle *)auStack_24f0._0_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a4a5;
    pfVar13 = *(fdb_kvs_handle **)(auStack_24f0._0_8_ + 0x20);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[0].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119d93;
    iVar7 = bcmp(pfVar13,pfVar18,*(size_t *)(fdb_kvs_config *)auStack_24f0._0_8_);
    if (iVar7 != 0) goto LAB_0011a4aa;
    pfVar13 = *(fdb_kvs_handle **)((long)pfVar22 + 0x38);
    pfVar18 = *(fdb_kvs_handle **)(aVar29.end_seqnum + 0x38);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119db3;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar22->kvs_config).custom_cmp);
    if (iVar7 != 0) goto LAB_0011a4b5;
    pfVar13 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar22 + 0x40))->seqtree;
    pfVar18 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aVar29.end_seqnum + 0x40))->seqtree
    ;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119dd3;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar22->kvs_config).custom_cmp_param);
    if (iVar7 != 0) goto LAB_0011a4c0;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119de3;
    fdb_doc_free((fdb_doc *)pfVar22);
    pfVar22 = (fdb_kvs_handle *)auStack_24f0._8_8_;
    auStack_24f0._0_8_ = (fdb_kvs_handle *)0x0;
    pfVar13 = *(fdb_kvs_handle **)(aaStack_24c8[2].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119e07;
    sVar8 = strlen((char *)&fStack_2448);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119e17;
    fVar6 = fdb_iterator_seek((fdb_iterator *)pfVar22,pfVar13,sVar8,'\0');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a4cb;
    unaff_R13.end_seqnum = 2;
    pfVar22 = (fdb_kvs_handle *)auStack_24f0;
    pfVar33 = pfVar13;
    do {
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119e37;
      fVar6 = fdb_iterator_get((fdb_iterator *)auStack_24f0._8_8_,(fdb_doc **)pfVar22);
      pfVar13 = (fdb_kvs_handle *)auStack_24f0._0_8_;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a3ae;
      pfVar18 = *(fdb_kvs_handle **)(auStack_24f0._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  aaStack_24c8[unaff_R13.end_seqnum].end_seqnum;
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x20);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119e5f;
      iVar7 = bcmp(pfVar18,(void *)aVar29,*(size_t *)(fdb_kvs_config *)auStack_24f0._0_8_);
      if (iVar7 != 0) goto LAB_0011a3a3;
      pfVar18 = *(fdb_kvs_handle **)((long)pfVar13 + 0x38);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119e7e;
      iVar7 = bcmp(pfVar18,(void *)aVar29,(size_t)(pfVar13->kvs_config).custom_cmp);
      pfVar15 = pfVar22;
      if (iVar7 != 0) goto LAB_0011a3be;
      pfVar18 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar13 + 0x40))->seqtree;
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x40);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119e9d;
      iVar7 = bcmp(pfVar18,(void *)aVar29,(size_t)(pfVar13->kvs_config).custom_cmp_param);
      if (iVar7 != 0) goto LAB_0011a3b3;
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ead;
      fdb_doc_free((fdb_doc *)pfVar13);
      auStack_24f0._0_8_ = (fdb_kvs_handle *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 1;
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ec3;
      fVar6 = fdb_iterator_next((fdb_iterator *)auStack_24f0._8_8_);
      pfVar15 = (fdb_kvs_handle *)auStack_24f0._8_8_;
      pfVar33 = pfVar13;
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if ((fdb_kvs_handle *)unaff_R13.end_seqnum != (fdb_kvs_handle *)0xa) goto LAB_0011a4d0;
    pfVar13 = *(fdb_kvs_handle **)(aaStack_24c8[3].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119ef1;
    sVar8 = strlen((char *)&fStack_2448);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119f01;
    fVar6 = fdb_iterator_seek((fdb_iterator *)pfVar15,pfVar13,sVar8,'\0');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a4d5;
    unaff_R13.end_seqnum = 3;
    pfVar15 = (fdb_kvs_handle *)auStack_24f0;
    pfVar22 = pfVar13;
    do {
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119f21;
      fVar6 = fdb_iterator_get((fdb_iterator *)auStack_24f0._8_8_,(fdb_doc **)pfVar15);
      pfVar13 = (fdb_kvs_handle *)auStack_24f0._0_8_;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a3d4;
      pfVar18 = *(fdb_kvs_handle **)(auStack_24f0._0_8_ + 0x20);
      unaff_RBP = (anon_union_8_2_c155ca52_for__fdb_iterator_13)
                  aaStack_24c8[unaff_R13.end_seqnum].end_seqnum;
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x20);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119f49;
      iVar7 = bcmp(pfVar18,(void *)aVar29,*(size_t *)(fdb_kvs_config *)auStack_24f0._0_8_);
      if (iVar7 != 0) goto LAB_0011a3c9;
      pfVar18 = *(fdb_kvs_handle **)((long)pfVar13 + 0x38);
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x38);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119f68;
      iVar7 = bcmp(pfVar18,(void *)aVar29,(size_t)(pfVar13->kvs_config).custom_cmp);
      if (iVar7 != 0) goto LAB_0011a3e4;
      pfVar18 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar13 + 0x40))->seqtree;
      aVar29 = *(anon_union_8_2_c155ca52_for__fdb_iterator_13 *)(unaff_RBP.end_seqnum + 0x40);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119f87;
      iVar7 = bcmp(pfVar18,(void *)aVar29,(size_t)(pfVar13->kvs_config).custom_cmp_param);
      if (iVar7 != 0) goto LAB_0011a3d9;
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119f97;
      fdb_doc_free((fdb_doc *)pfVar13);
      auStack_24f0._0_8_ = (fdb_kvs_handle *)0x0;
      unaff_R13.end_seqnum = unaff_R13.end_seqnum + 1;
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119fad;
      fVar6 = fdb_iterator_next((fdb_iterator *)auStack_24f0._8_8_);
      pfVar22 = pfVar13;
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    if ((fdb_kvs_handle *)unaff_R13.end_seqnum != (fdb_kvs_handle *)0xa) goto LAB_0011a4da;
    pfVar15 = (fdb_kvs_handle *)(auStack_24f0 + 8);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119fcd;
    fdb_iterator_close((fdb_iterator *)auStack_24f0._8_8_);
    pfVar13 = &fStack_2448;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x119fee;
    sprintf((char *)pfVar13,"key%d",4);
    aVar29.end_seqnum = (fdb_seqnum_t)&fStack_2448.bub_ctx.handle;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a008;
    sprintf((char *)aVar29,"key%d",8);
    pfVar18 = pfStack_24e0;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a015;
    unaff_R13.end_seqnum = strlen((char *)pfVar13);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a020;
    sVar8 = strlen((char *)aVar29);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a03e;
    fVar6 = fdb_iterator_init(pfVar18,(fdb_iterator **)pfVar15,pfVar13,unaff_R13.end_keylen,
                              (void *)aVar29,sVar8,2);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a4df;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a050;
    fVar6 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_24f0._8_8_);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a4e4;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a067;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_24f0._8_8_,(fdb_doc **)auStack_24f0);
    pfVar22 = (fdb_kvs_handle *)auStack_24f0._0_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a4e9;
    pfVar13 = *(fdb_kvs_handle **)(auStack_24f0._0_8_ + 0x20);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[8].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a090;
    iVar7 = bcmp(pfVar13,pfVar18,*(size_t *)(fdb_kvs_config *)auStack_24f0._0_8_);
    aVar29 = aaStack_24c8[8];
    if (iVar7 != 0) goto LAB_0011a4ee;
    pfVar13 = *(fdb_kvs_handle **)((long)pfVar22 + 0x38);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[8].end_seqnum + 0x38);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a0b0;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar22->kvs_config).custom_cmp);
    if (iVar7 != 0) goto LAB_0011a4f9;
    pfVar13 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar22 + 0x40))->seqtree;
    pfVar18 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aaStack_24c8[8].end_seqnum + 0x40))
              ->seqtree;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a0d0;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar22->kvs_config).custom_cmp_param);
    if (iVar7 != 0) goto LAB_0011a504;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a0e0;
    fdb_doc_free((fdb_doc *)pfVar22);
    auStack_24f0._0_8_ = (fdb_kvs_handle *)0x0;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a0f3;
    fVar6 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_24f0._8_8_);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a50f;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a10a;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_24f0._8_8_,(fdb_doc **)auStack_24f0);
    pfVar15 = (fdb_kvs_handle *)auStack_24f0._0_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a514;
    pfVar13 = *(fdb_kvs_handle **)(auStack_24f0._0_8_ + 0x20);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[4].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a133;
    iVar7 = bcmp(pfVar13,pfVar18,*(size_t *)(fdb_kvs_config *)auStack_24f0._0_8_);
    aVar29 = aaStack_24c8[4];
    if (iVar7 != 0) goto LAB_0011a519;
    pfVar13 = *(fdb_kvs_handle **)((long)pfVar15 + 0x38);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[4].end_seqnum + 0x38);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a153;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar15->kvs_config).custom_cmp);
    if (iVar7 != 0) goto LAB_0011a524;
    pfVar13 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar15 + 0x40))->seqtree;
    pfVar18 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aaStack_24c8[4].end_seqnum + 0x40))
              ->seqtree;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a173;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar15->kvs_config).custom_cmp_param);
    if (iVar7 != 0) goto LAB_0011a52f;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a183;
    fdb_doc_free((fdb_doc *)pfVar15);
    auStack_24f0._0_8_ = (fdb_kvs_handle *)0x0;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a196;
    fVar6 = fdb_iterator_close((fdb_iterator *)auStack_24f0._8_8_);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a53a;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a1be;
    fVar6 = fdb_iterator_init(pfStack_24e0,(fdb_iterator **)(auStack_24f0 + 8),(void *)0x0,0,
                              (void *)0x0,0,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a53f;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a1d0;
    fVar6 = fdb_iterator_seek_to_max((fdb_iterator *)auStack_24f0._8_8_);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a544;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a1e7;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_24f0._8_8_,(fdb_doc **)auStack_24f0);
    pfVar22 = (fdb_kvs_handle *)auStack_24f0._0_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a549;
    pfVar13 = *(fdb_kvs_handle **)(auStack_24f0._0_8_ + 0x20);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[9].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a210;
    iVar7 = bcmp(pfVar13,pfVar18,*(size_t *)(fdb_kvs_config *)auStack_24f0._0_8_);
    aVar29 = aaStack_24c8[9];
    if (iVar7 != 0) goto LAB_0011a54e;
    pfVar13 = *(fdb_kvs_handle **)((long)pfVar22 + 0x38);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[9].end_seqnum + 0x38);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a230;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar22->kvs_config).custom_cmp);
    if (iVar7 != 0) goto LAB_0011a559;
    pfVar13 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar22 + 0x40))->seqtree;
    pfVar18 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aaStack_24c8[9].end_seqnum + 0x40))
              ->seqtree;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a250;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar22->kvs_config).custom_cmp_param);
    if (iVar7 != 0) goto LAB_0011a564;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a260;
    fdb_doc_free((fdb_doc *)pfVar22);
    auStack_24f0._0_8_ = (fdb_kvs_handle *)0x0;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a273;
    fVar6 = fdb_iterator_seek_to_min((fdb_iterator *)auStack_24f0._8_8_);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a56f;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a28a;
    fVar6 = fdb_iterator_get((fdb_iterator *)auStack_24f0._8_8_,(fdb_doc **)auStack_24f0);
    pfVar15 = (fdb_kvs_handle *)auStack_24f0._0_8_;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a574;
    pfVar13 = *(fdb_kvs_handle **)(auStack_24f0._0_8_ + 0x20);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[0].end_seqnum + 0x20);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2b3;
    iVar7 = bcmp(pfVar13,pfVar18,*(size_t *)(fdb_kvs_config *)auStack_24f0._0_8_);
    aVar29 = aaStack_24c8[0];
    if (iVar7 != 0) goto LAB_0011a579;
    pfVar13 = *(fdb_kvs_handle **)((long)pfVar15 + 0x38);
    pfVar18 = *(fdb_kvs_handle **)(aaStack_24c8[0].end_seqnum + 0x38);
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2d3;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar15->kvs_config).custom_cmp);
    if (iVar7 != 0) goto LAB_0011a584;
    pfVar13 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar15 + 0x40))->seqtree;
    pfVar18 = (fdb_kvs_handle *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(aaStack_24c8[0].end_seqnum + 0x40))
              ->seqtree;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a2f3;
    iVar7 = bcmp(pfVar13,pfVar18,(size_t)(pfVar15->kvs_config).custom_cmp_param);
    if (iVar7 != 0) goto LAB_0011a58f;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a303;
    fdb_doc_free((fdb_doc *)pfVar15);
    auStack_24f0._0_8_ = (fdb_kvs_handle *)0x0;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a316;
    fVar6 = fdb_iterator_close((fdb_iterator *)auStack_24f0._8_8_);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a328;
      fdb_kvs_close(pfStack_24d0);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a332;
      fdb_kvs_close(pfStack_24e0);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a33c;
      fdb_close(pfStack_24d8);
      lVar28 = 0;
      do {
        aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a348;
        fdb_doc_free((fdb_doc *)aaStack_24c8[lVar28]);
        lVar28 = lVar28 + 1;
      } while (lVar28 != 10);
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a356;
      fdb_shutdown();
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a35b;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_seek_wal_only_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a38c;
      fprintf(_stderr,pcVar27,"iterator seek wal only test");
      return;
    }
  }
  else {
LAB_0011a3ef:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3f4;
    iterator_seek_wal_only_test();
LAB_0011a3f4:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3f9;
    iterator_seek_wal_only_test();
LAB_0011a3f9:
    aVar11 = aVar29;
    pfVar22 = pfVar15;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a3fe;
    iterator_seek_wal_only_test();
LAB_0011a3fe:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a409;
    iterator_seek_wal_only_test();
LAB_0011a409:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a414;
    iterator_seek_wal_only_test();
LAB_0011a414:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a41f;
    iterator_seek_wal_only_test();
LAB_0011a41f:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a424;
    iterator_seek_wal_only_test();
LAB_0011a424:
    aVar29 = aVar11;
    pfVar15 = pfVar22;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a429;
    iterator_seek_wal_only_test();
LAB_0011a429:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a434;
    iterator_seek_wal_only_test();
LAB_0011a434:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a43f;
    iterator_seek_wal_only_test();
LAB_0011a43f:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a44a;
    iterator_seek_wal_only_test();
LAB_0011a44a:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a44f;
    iterator_seek_wal_only_test();
LAB_0011a44f:
    aVar11 = aVar29;
    pfVar22 = pfVar15;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a454;
    iterator_seek_wal_only_test();
LAB_0011a454:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a45f;
    iterator_seek_wal_only_test();
LAB_0011a45f:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a46a;
    iterator_seek_wal_only_test();
LAB_0011a46a:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a475;
    iterator_seek_wal_only_test();
LAB_0011a475:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a47a;
    iterator_seek_wal_only_test();
LAB_0011a47a:
    aVar31 = aVar11;
    pfVar15 = pfVar22;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a47f;
    iterator_seek_wal_only_test();
LAB_0011a47f:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a48a;
    iterator_seek_wal_only_test();
LAB_0011a48a:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a495;
    iterator_seek_wal_only_test();
LAB_0011a495:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4a0;
    iterator_seek_wal_only_test();
LAB_0011a4a0:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4a5;
    iterator_seek_wal_only_test();
LAB_0011a4a5:
    aVar29 = aVar31;
    pfVar22 = pfVar15;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4aa;
    iterator_seek_wal_only_test();
LAB_0011a4aa:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4b5;
    iterator_seek_wal_only_test();
LAB_0011a4b5:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4c0;
    iterator_seek_wal_only_test();
LAB_0011a4c0:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4cb;
    iterator_seek_wal_only_test();
LAB_0011a4cb:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4d0;
    iterator_seek_wal_only_test();
LAB_0011a4d0:
    pfVar15 = pfVar22;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4d5;
    iterator_seek_wal_only_test();
LAB_0011a4d5:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4da;
    iterator_seek_wal_only_test();
LAB_0011a4da:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4df;
    iterator_seek_wal_only_test();
LAB_0011a4df:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4e4;
    iterator_seek_wal_only_test();
LAB_0011a4e4:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4e9;
    iterator_seek_wal_only_test();
LAB_0011a4e9:
    pfVar22 = pfVar15;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4ee;
    iterator_seek_wal_only_test();
LAB_0011a4ee:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a4f9;
    iterator_seek_wal_only_test();
LAB_0011a4f9:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a504;
    iterator_seek_wal_only_test();
LAB_0011a504:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a50f;
    iterator_seek_wal_only_test();
LAB_0011a50f:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a514;
    iterator_seek_wal_only_test();
LAB_0011a514:
    pfVar15 = pfVar22;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a519;
    iterator_seek_wal_only_test();
LAB_0011a519:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a524;
    iterator_seek_wal_only_test();
LAB_0011a524:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a52f;
    iterator_seek_wal_only_test();
LAB_0011a52f:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a53a;
    iterator_seek_wal_only_test();
LAB_0011a53a:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a53f;
    iterator_seek_wal_only_test();
LAB_0011a53f:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a544;
    iterator_seek_wal_only_test();
LAB_0011a544:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a549;
    iterator_seek_wal_only_test();
LAB_0011a549:
    pfVar22 = pfVar15;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a54e;
    iterator_seek_wal_only_test();
LAB_0011a54e:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a559;
    iterator_seek_wal_only_test();
LAB_0011a559:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a564;
    iterator_seek_wal_only_test();
LAB_0011a564:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a56f;
    iterator_seek_wal_only_test();
LAB_0011a56f:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a574;
    iterator_seek_wal_only_test();
LAB_0011a574:
    pfVar15 = pfVar22;
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a579;
    iterator_seek_wal_only_test();
LAB_0011a579:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a584;
    iterator_seek_wal_only_test();
LAB_0011a584:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a58f;
    iterator_seek_wal_only_test();
LAB_0011a58f:
    aStack_2500 = (anon_union_8_2_c155ca52_for__fdb_iterator_13)0x11a59a;
    iterator_seek_wal_only_test();
  }
  aStack_2500.end_seqnum = (fdb_seqnum_t)iterator_after_wal_threshold;
  iterator_seek_wal_only_test();
  pcStack_2888 = (code *)0x11a5bc;
  pfStack_2528 = pfVar15;
  aStack_2520 = aVar29;
  aStack_2518 = unaff_R13;
  pfStack_2510 = pfVar13;
  pfStack_2508 = pfVar18;
  aStack_2500 = unaff_RBP;
  gettimeofday(&tStack_2850,(__timezone_ptr_t)0x0);
  pcStack_2888 = (code *)0x11a5c1;
  memleak_start();
  pfStack_2878 = (fdb_iterator *)0x0;
  pcStack_2888 = (code *)0x11a5d7;
  fdb_get_default_config();
  pcStack_2888 = (code *)0x11a5e4;
  fdb_get_default_kvs_config();
  fStack_2828.wal_threshold = 10;
  fStack_2828.flags = 1;
  fStack_2828.seqtree_opt = '\x01';
  pcStack_2888 = (code *)0x11a605;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_2888 = (code *)0x11a61c;
  fdb_open(&pfStack_2858,"./iterator_test1",&fStack_2828);
  pcStack_2888 = (code *)0x11a633;
  fdb_kvs_open(pfStack_2858,&pfStack_2868,"db1",&fStack_2840);
  pcStack_2888 = (code *)0x11a64a;
  fdb_kvs_open(pfStack_2858,&pfStack_2860,"db2",&fStack_2840);
  uVar17 = 0;
  do {
    pcStack_2888 = (code *)0x11a676;
    sprintf(acStack_2630,"key%d",uVar17);
    pcStack_2888 = (code *)0x11a685;
    sprintf(acStack_2730,"body%d",uVar17);
    pfVar18 = pfStack_2868;
    pcStack_2888 = (code *)0x11a692;
    ppfVar14 = (fdb_iterator **)strlen(acStack_2630);
    pcStack_2888 = (code *)0x11a69d;
    sVar8 = strlen(acStack_2730);
    pcStack_2888 = (code *)0x11a6b1;
    fdb_set_kv(pfVar18,acStack_2630,(size_t)ppfVar14,acStack_2730,sVar8);
    uVar35 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar35;
  } while (uVar35 != 6);
  pcStack_2888 = (code *)0x11a6ce;
  fVar6 = fdb_iterator_sequence_init(pfStack_2868,&pfStack_2870,0,0,0);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    do {
      pcStack_2888 = (code *)0x11a6e8;
      fVar6 = fdb_iterator_get(pfStack_2870,(fdb_doc **)&pfStack_2878);
      if (fVar6 != FDB_RESULT_SUCCESS) {
LAB_0011a82b:
        pcStack_2888 = (code *)0x11a830;
        iterator_after_wal_threshold();
        goto LAB_0011a830;
      }
      pcStack_2888 = (code *)0x11a70b;
      fVar6 = fdb_set_kv(pfStack_2860,(void *)pfStack_2878->_seqnum,(size_t)pfStack_2878->handle,
                         (void *)0x0,0);
      if (fVar6 != FDB_RESULT_SUCCESS) {
        pcStack_2888 = (code *)0x11a82b;
        iterator_after_wal_threshold();
        goto LAB_0011a82b;
      }
      pcStack_2888 = (code *)0x11a71d;
      fdb_doc_free((fdb_doc *)pfStack_2878);
      pfStack_2878 = (fdb_iterator *)0x0;
      pcStack_2888 = (code *)0x11a730;
      fVar6 = fdb_iterator_next(pfStack_2870);
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    ppfVar14 = &pfStack_2870;
    pcStack_2888 = (code *)0x11a742;
    fdb_iterator_close(pfStack_2870);
    pcStack_2888 = (code *)0x11a756;
    fVar6 = fdb_iterator_sequence_init(pfStack_2868,ppfVar14,0,0,0);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      while( true ) {
        pcStack_2888 = (code *)0x11a770;
        fVar6 = fdb_iterator_get(pfStack_2870,(fdb_doc **)&pfStack_2878);
        if (fVar6 != FDB_RESULT_SUCCESS) break;
        pcStack_2888 = (code *)0x11a787;
        fVar6 = fdb_get(pfStack_2868,(fdb_doc *)pfStack_2878);
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011a830;
        pcStack_2888 = (code *)0x11a799;
        fdb_doc_free((fdb_doc *)pfStack_2878);
        pfStack_2878 = (fdb_iterator *)0x0;
        pcStack_2888 = (code *)0x11a7ac;
        fVar6 = fdb_iterator_next(pfStack_2870);
        if (fVar6 == FDB_RESULT_ITERATOR_FAIL) {
          pcStack_2888 = (code *)0x11a7bb;
          fdb_iterator_close(pfStack_2870);
          pcStack_2888 = (code *)0x11a7c5;
          fdb_kvs_close(pfStack_2868);
          pcStack_2888 = (code *)0x11a7cf;
          fdb_kvs_close(pfStack_2860);
          pcStack_2888 = (code *)0x11a7d9;
          fdb_close(pfStack_2858);
          pcStack_2888 = (code *)0x11a7de;
          fdb_shutdown();
          pcStack_2888 = (code *)0x11a7e3;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (iterator_after_wal_threshold()::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pcStack_2888 = (code *)0x11a814;
          fprintf(_stderr,pcVar27,"iterator after wal threshold");
          return;
        }
      }
LAB_0011a835:
      ppfVar14 = &pfStack_2878;
      pcStack_2888 = (code *)0x11a83a;
      iterator_after_wal_threshold();
      goto LAB_0011a83a;
    }
  }
  else {
LAB_0011a83a:
    pcStack_2888 = (code *)0x11a83f;
    iterator_after_wal_threshold();
  }
  pcStack_2888 = iterator_manual_wal_flush;
  iterator_after_wal_threshold();
  pcStack_2890 = "body%d";
  pfStack_28a0 = pfVar18;
  pfStack_2a50 = (fdb_kvs_handle *)0x11a861;
  ppfStack_28b0 = ppfVar14;
  pcStack_28a8 = acStack_2730;
  pcStack_2898 = acStack_2630;
  pcStack_2888 = (code *)uVar17;
  gettimeofday(&tStack_29d0,(__timezone_ptr_t)0x0);
  pfStack_2a50 = (fdb_kvs_handle *)0x11a866;
  memleak_start();
  uStack_29f0 = 0x3106002d;
  uStack_29f8 = 0x3032343e3e0508;
  uStack_29f1 = 0x31;
  uStack_29e8._0_2_ = 0x508;
  uStack_29e8._2_6_ = 0x313032343e3e;
  pvStack_29e0 = (void *)0x323106002d31;
  uStack_29d8 = 0;
  ptr_iterator = (fdb_kvs_handle **)auStack_2a08;
  auStack_2a08._0_7_ = 0x3931343e3e0508;
  auStack_2a08._7_4_ = 0x2d3939;
  uStack_2a28 = 0x3433343e3e0508;
  uStack_2a21 = 0x140a35;
  pfStack_2a38 = (fdb_kvs_handle *)0x0;
  pfStack_2a50 = (fdb_kvs_handle *)0x11a8e4;
  fdb_get_default_config();
  pfVar18 = (fdb_kvs_handle *)auStack_29c0;
  pfStack_2a50 = (fdb_kvs_handle *)0x11a8f4;
  fdb_get_default_kvs_config();
  pfStack_2998 = (fdb_file_handle *)0x400;
  uStack_2984 = 1;
  pfStack_2a50 = (fdb_kvs_handle *)0x11a910;
  system("rm -rf  iterator_test* > errorlog.txt");
  pbVar12 = (btree *)&pfStack_2a10;
  pfStack_2a50 = (fdb_kvs_handle *)0x11a927;
  fdb_open((fdb_file_handle **)pbVar12,"./iterator_test1",(fdb_config *)(auStack_29c0 + 0x18));
  ppfVar23 = &pfStack_2a18;
  pfStack_2a50 = (fdb_kvs_handle *)0x11a942;
  fdb_kvs_open(pfStack_2a10,ppfVar23,"db1",(fdb_kvs_config *)pfVar18);
  pfStack_2a50 = (fdb_kvs_handle *)0x11a95a;
  fdb_kvs_open(pfStack_2a10,&pfStack_2a30,"db2",(fdb_kvs_config *)pfVar18);
  pfStack_2a50 = (fdb_kvs_handle *)0x11a970;
  fdb_set_kv(pfStack_2a18,&uStack_29f8,0xf,(void *)0x0,0);
  pfStack_2a50 = (fdb_kvs_handle *)0x11a986;
  fdb_set_kv(pfStack_2a18,&uStack_29e8,0x11,(void *)0x0,0);
  pfStack_2a50 = (fdb_kvs_handle *)0x11a991;
  fdb_commit(pfStack_2a10,'\0');
  pfStack_2a50 = (fdb_kvs_handle *)0x11a9b4;
  pfVar15 = pfStack_2a18;
  fVar6 = fdb_iterator_init(pfStack_2a18,(fdb_iterator **)&pfStack_2a40,ptr_iterator,0xb,(void *)0x0
                            ,0,0);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    do {
      pfStack_2a50 = (fdb_kvs_handle *)0x11a9ce;
      pfVar15 = pfStack_2a40;
      fVar6 = fdb_iterator_get((fdb_iterator *)pfStack_2a40,(fdb_doc **)&pfStack_2a38);
      if (fVar6 != FDB_RESULT_SUCCESS) {
        pfStack_2a50 = (fdb_kvs_handle *)0x11acdb;
        iterator_manual_wal_flush();
        goto LAB_0011acdb;
      }
      pfStack_2a50 = (fdb_kvs_handle *)0x11a9e0;
      fdb_doc_free((fdb_doc *)pfStack_2a38);
      pfStack_2a38 = (fdb_kvs_handle *)0x0;
      pfStack_2a50 = (fdb_kvs_handle *)0x11a9f3;
      fVar6 = fdb_iterator_next((fdb_iterator *)pfStack_2a40);
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator = &pfStack_2a40;
    pfStack_2a50 = (fdb_kvs_handle *)0x11aa05;
    fdb_iterator_close((fdb_iterator *)pfStack_2a40);
    pfStack_2a50 = (fdb_kvs_handle *)0x11aa29;
    pfVar15 = pfStack_2a18;
    fVar6 = fdb_iterator_init(pfStack_2a18,(fdb_iterator **)ptr_iterator,&uStack_2a28,0xb,
                              (void *)0x0,0,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011acea;
    pfStack_2a50 = (fdb_kvs_handle *)0x11aa40;
    pfVar15 = pfStack_2a40;
    fVar6 = fdb_iterator_get((fdb_iterator *)pfStack_2a40,(fdb_doc **)&pfStack_2a38);
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_0011acef;
    ptr_iterator = &pfStack_2a40;
    pfStack_2a50 = (fdb_kvs_handle *)0x11aa55;
    fdb_iterator_close((fdb_iterator *)pfStack_2a40);
    pfStack_2a50 = (fdb_kvs_handle *)0x11aa6e;
    fdb_set_kv(pfStack_2a30,&uStack_29f8,0xf,(void *)0x0,0);
    pfStack_2a50 = (fdb_kvs_handle *)0x11aa87;
    fdb_set_kv(pfStack_2a30,&uStack_29e8,0x11,(void *)0x0,0);
    pfStack_2a50 = (fdb_kvs_handle *)0x11aa96;
    fdb_commit(pfStack_2a10,'\x01');
    pfStack_2a50 = (fdb_kvs_handle *)0x11aaba;
    pfVar15 = pfStack_2a30;
    fVar6 = fdb_iterator_init(pfStack_2a30,(fdb_iterator **)ptr_iterator,auStack_2a08,0xb,
                              (void *)0x0,0,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011acf4;
    do {
      pfStack_2a50 = (fdb_kvs_handle *)0x11aad4;
      pfVar15 = pfStack_2a40;
      fVar6 = fdb_iterator_get((fdb_iterator *)pfStack_2a40,(fdb_doc **)&pfStack_2a38);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011acdb;
      pfStack_2a50 = (fdb_kvs_handle *)0x11aae6;
      fdb_doc_free((fdb_doc *)pfStack_2a38);
      pfStack_2a38 = (fdb_kvs_handle *)0x0;
      pfStack_2a50 = (fdb_kvs_handle *)0x11aaf9;
      fVar6 = fdb_iterator_next((fdb_iterator *)pfStack_2a40);
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator = &pfStack_2a40;
    pfStack_2a50 = (fdb_kvs_handle *)0x11ab0b;
    fdb_iterator_close((fdb_iterator *)pfStack_2a40);
    pfStack_2a50 = (fdb_kvs_handle *)0x11ab2f;
    pfVar15 = pfStack_2a18;
    fVar6 = fdb_iterator_init(pfStack_2a18,(fdb_iterator **)ptr_iterator,&uStack_2a28,0xb,
                              (void *)0x0,0,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011acf9;
    pfStack_2a50 = (fdb_kvs_handle *)0x11ab46;
    pfVar15 = pfStack_2a40;
    fVar6 = fdb_iterator_get((fdb_iterator *)pfStack_2a40,(fdb_doc **)&pfStack_2a38);
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_0011acfe;
    ptr_iterator = &pfStack_2a40;
    pfStack_2a50 = (fdb_kvs_handle *)0x11ab5b;
    fdb_iterator_close((fdb_iterator *)pfStack_2a40);
    pfStack_2a50 = (fdb_kvs_handle *)0x11ab7e;
    fVar6 = fdb_iterator_init(pfStack_2a30,(fdb_iterator **)ptr_iterator,(void *)0x0,0,auStack_2a08,
                              0xb,0);
    pfVar15 = pfStack_2a30;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011ad03;
    pfStack_2a50 = (fdb_kvs_handle *)0x11ab9f;
    pfVar15 = pfStack_2a40;
    fVar6 = fdb_iterator_seek((fdb_iterator *)pfStack_2a40,auStack_2a08,0xb,'\x01');
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_0011ad08;
    ptr_iterator = &pfStack_2a40;
    pfStack_2a50 = (fdb_kvs_handle *)0x11abb4;
    fdb_iterator_close((fdb_iterator *)pfStack_2a40);
    pfStack_2a50 = (fdb_kvs_handle *)0x11abd7;
    fVar6 = fdb_iterator_init(pfStack_2a18,(fdb_iterator **)ptr_iterator,(void *)0x0,0,&uStack_2a28,
                              0xb,0);
    pfVar15 = pfStack_2a18;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011ad0d;
    pfStack_2a50 = (fdb_kvs_handle *)0x11abf8;
    pfVar15 = pfStack_2a40;
    fVar6 = fdb_iterator_seek((fdb_iterator *)pfStack_2a40,&uStack_2a28,0xb,'\x01');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011ad12;
    pfStack_2a50 = (fdb_kvs_handle *)0x11ac0f;
    pfVar15 = pfStack_2a40;
    fVar6 = fdb_iterator_get((fdb_iterator *)pfStack_2a40,(fdb_doc **)&pfStack_2a38);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pfStack_2a50 = (fdb_kvs_handle *)0x11ac21;
      fdb_doc_free((fdb_doc *)pfStack_2a38);
      pfStack_2a38 = (fdb_kvs_handle *)0x0;
      pfStack_2a50 = (fdb_kvs_handle *)0x11ac34;
      fVar6 = fdb_iterator_prev((fdb_iterator *)pfStack_2a40);
      if (fVar6 != FDB_RESULT_ITERATOR_FAIL) {
        do {
          pfStack_2a50 = (fdb_kvs_handle *)0x11ac4b;
          pfVar15 = pfStack_2a40;
          fVar6 = fdb_iterator_get((fdb_iterator *)pfStack_2a40,(fdb_doc **)&pfStack_2a38);
          if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011ace0;
          pfStack_2a50 = (fdb_kvs_handle *)0x11ac5d;
          fdb_doc_free((fdb_doc *)pfStack_2a38);
          pfStack_2a38 = (fdb_kvs_handle *)0x0;
          pfStack_2a50 = (fdb_kvs_handle *)0x11ac70;
          fVar6 = fdb_iterator_prev((fdb_iterator *)pfStack_2a40);
        } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
      }
      pfStack_2a50 = (fdb_kvs_handle *)0x11ac7f;
      fdb_iterator_close((fdb_iterator *)pfStack_2a40);
      pfStack_2a50 = (fdb_kvs_handle *)0x11ac89;
      fdb_close(pfStack_2a10);
      pfStack_2a50 = (fdb_kvs_handle *)0x11ac8e;
      fdb_shutdown();
      pfStack_2a50 = (fdb_kvs_handle *)0x11ac93;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_manual_wal_flush()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pfStack_2a50 = (fdb_kvs_handle *)0x11acc4;
      fprintf(_stderr,pcVar27,"iterator manual wal flush");
      return;
    }
  }
  else {
LAB_0011ace5:
    pfStack_2a50 = (fdb_kvs_handle *)0x11acea;
    iterator_manual_wal_flush();
LAB_0011acea:
    pfStack_2a50 = (fdb_kvs_handle *)0x11acef;
    iterator_manual_wal_flush();
LAB_0011acef:
    pfStack_2a50 = (fdb_kvs_handle *)0x11acf4;
    iterator_manual_wal_flush();
LAB_0011acf4:
    pfStack_2a50 = (fdb_kvs_handle *)0x11acf9;
    iterator_manual_wal_flush();
LAB_0011acf9:
    pfStack_2a50 = (fdb_kvs_handle *)0x11acfe;
    iterator_manual_wal_flush();
LAB_0011acfe:
    pfStack_2a50 = (fdb_kvs_handle *)0x11ad03;
    iterator_manual_wal_flush();
LAB_0011ad03:
    pfStack_2a50 = (fdb_kvs_handle *)0x11ad08;
    iterator_manual_wal_flush();
LAB_0011ad08:
    pfStack_2a50 = (fdb_kvs_handle *)0x11ad0d;
    iterator_manual_wal_flush();
LAB_0011ad0d:
    pfStack_2a50 = (fdb_kvs_handle *)0x11ad12;
    iterator_manual_wal_flush();
LAB_0011ad12:
    pfStack_2a50 = (fdb_kvs_handle *)0x11ad17;
    iterator_manual_wal_flush();
  }
  pfStack_2a50 = (fdb_kvs_handle *)sequence_iterator_seek_test;
  iterator_manual_wal_flush();
  ptr_iterator_00 = (fdb_config **)((ulong)pfVar15 & 0xffffffff);
  pfStack_2f18 = (fdb_kvs_handle *)0x11ad41;
  ppfStack_2a78 = ptr_iterator;
  pbStack_2a70 = pbVar12;
  ppfStack_2a68 = ppfVar23;
  puStack_2a60 = &uStack_29e8;
  puStack_2a58 = &uStack_29f8;
  pfStack_2a50 = pfVar18;
  gettimeofday(&tStack_2e80,(__timezone_ptr_t)0x0);
  pfStack_2f18 = (fdb_kvs_handle *)0x11ad46;
  memleak_start();
  pfStack_2f00 = (fdb_config *)0x0;
  pfStack_2f18 = (fdb_kvs_handle *)0x11ad57;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar24 = &fStack_2b70;
  pfStack_2f18 = (fdb_kvs_handle *)0x11ad67;
  fdb_get_default_config();
  pfStack_2f18 = (fdb_kvs_handle *)0x11ad71;
  fdb_get_default_kvs_config();
  fStack_2b70.buffercache_size = 0;
  fStack_2b70.wal_threshold = 0x400;
  fStack_2b70.seqtree_opt = '\x01';
  fStack_2b70.flags = 1;
  fStack_2b70.multi_kv_instances = SUB81(ptr_iterator_00,0);
  fStack_2b70.compaction_threshold = '\0';
  ptr_fhandle = &pfStack_2ef0;
  pfStack_2f18 = (fdb_kvs_handle *)0x11adaa;
  fdb_open(ptr_fhandle,"./iterator_test7",pfVar24);
  if ((int)pfVar15 == 0) {
    pfStack_2f18 = (fdb_kvs_handle *)0x11add8;
    fdb_kvs_open_default(pfStack_2ef0,&pfStack_2ef8,&fStack_2ee8);
  }
  else {
    pfStack_2f18 = (fdb_kvs_handle *)0x11adc7;
    fdb_kvs_open(pfStack_2ef0,&pfStack_2ef8,"kv1",&fStack_2ee8);
  }
  pfStack_2f18 = (fdb_kvs_handle *)0x11adf0;
  fVar6 = fdb_set_log_callback(pfStack_2ef8,logCallbackFunc,"sequence_iterator_seek_test");
  if (fVar6 == FDB_RESULT_SUCCESS) {
    lVar28 = 0;
    uVar17 = 0;
    do {
      pfVar1 = &fStack_2e70.config.encryption_key;
      pfStack_2f18 = (fdb_kvs_handle *)0x11ae18;
      sprintf((char *)pfVar1,"key%d",uVar17 & 0xffffffff);
      pfStack_2f18 = (fdb_kvs_handle *)0x11ae30;
      sprintf((char *)&fStack_2e70.bub_ctx.handle,"meta%d",uVar17 & 0xffffffff);
      pfStack_2f18 = (fdb_kvs_handle *)0x11ae48;
      sprintf((char *)&fStack_2e70,"body%d",uVar17 & 0xffffffff);
      pfStack_2f18 = (fdb_kvs_handle *)0x11ae58;
      sVar8 = strlen((char *)pfVar1);
      ppfVar23 = &fStack_2e70.bub_ctx.handle;
      pfStack_2f18 = (fdb_kvs_handle *)0x11ae6b;
      sVar9 = strlen((char *)ppfVar23);
      pfStack_2f18 = (fdb_kvs_handle *)0x11ae7b;
      sVar10 = strlen((char *)&fStack_2e70);
      pfStack_2f18 = (fdb_kvs_handle *)0x11aea0;
      fdb_doc_create((fdb_doc **)((long)apfStack_2ed0 + lVar28),&fStack_2e70.config.encryption_key,
                     sVar8,ppfVar23,sVar9,&fStack_2e70,sVar10);
      pfStack_2f18 = (fdb_kvs_handle *)0x11aeaf;
      fdb_set(pfStack_2ef8,apfStack_2ed0[uVar17]);
      uVar17 = uVar17 + 1;
      lVar28 = lVar28 + 8;
    } while (uVar17 != 5);
    pfStack_2f18 = (fdb_kvs_handle *)0x11aecf;
    fdb_commit(pfStack_2ef0,'\x01');
    uVar17 = 5;
    pfVar24 = (fdb_config *)apfStack_2ea8;
    do {
      pfVar1 = &fStack_2e70.config.encryption_key;
      pfStack_2f18 = (fdb_kvs_handle *)0x11aef4;
      sprintf((char *)pfVar1,"key%d",uVar17 & 0xffffffff);
      ppfVar23 = &fStack_2e70.bub_ctx.handle;
      pfStack_2f18 = (fdb_kvs_handle *)0x11af0f;
      sprintf((char *)ppfVar23,"meta%d",uVar17 & 0xffffffff);
      pfVar18 = &fStack_2e70;
      pfStack_2f18 = (fdb_kvs_handle *)0x11af2a;
      sprintf((char *)pfVar18,"body%d",uVar17 & 0xffffffff);
      pfStack_2f18 = (fdb_kvs_handle *)0x11af32;
      ptr_fhandle = (fdb_file_handle **)strlen((char *)pfVar1);
      pfStack_2f18 = (fdb_kvs_handle *)0x11af3d;
      pbVar12 = (btree *)strlen((char *)ppfVar23);
      pfStack_2f18 = (fdb_kvs_handle *)0x11af48;
      sVar8 = strlen((char *)pfVar18);
      pfStack_2f18 = (fdb_kvs_handle *)0x11af68;
      fdb_doc_create((fdb_doc **)pfVar24,&fStack_2e70.config.encryption_key,(size_t)ptr_fhandle,
                     ppfVar23,(size_t)pbVar12,pfVar18,sVar8);
      pfStack_2f18 = (fdb_kvs_handle *)0x11af75;
      fdb_set(pfStack_2ef8,(fdb_doc *)*(fdb_kvs_handle **)pfVar24);
      uVar17 = uVar17 + 1;
      pfVar24 = (fdb_config *)((long)pfVar24 + 8);
    } while (uVar17 != 10);
    pfStack_2f18 = (fdb_kvs_handle *)0x11af92;
    fdb_commit(pfStack_2ef0,'\0');
    ptr_iterator_00 = &pfStack_2f08;
    pfStack_2f18 = (fdb_kvs_handle *)0x11afab;
    fdb_iterator_sequence_init(pfStack_2ef8,(fdb_iterator **)ptr_iterator_00,0,0,0);
    pfStack_2f18 = (fdb_kvs_handle *)0x11afb3;
    fVar6 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_2f08);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011b324;
    ppfVar23 = apfStack_2ea8 + 4;
    pfVar34 = pfVar24;
    do {
      pfStack_2f18 = (fdb_kvs_handle *)0x11afd5;
      fVar6 = fdb_iterator_get((fdb_iterator *)pfStack_2f08,(fdb_doc **)&pfStack_2f00);
      pfVar24 = pfStack_2f00;
      if (fVar6 != FDB_RESULT_SUCCESS) {
LAB_0011b2b8:
        pfStack_2f18 = (fdb_kvs_handle *)0x11b2bd;
        sequence_iterator_seek_test();
        pfVar24 = pfVar34;
LAB_0011b2bd:
        pfStack_2f18 = (fdb_kvs_handle *)0x11b2c8;
        sequence_iterator_seek_test();
LAB_0011b2c8:
        pfStack_2f18 = (fdb_kvs_handle *)0x11b2d3;
        sequence_iterator_seek_test();
        goto LAB_0011b2d3;
      }
      sVar8._0_2_ = pfStack_2f00->chunksize;
      sVar8._2_2_ = *(undefined2 *)&pfStack_2f00->field_0x2;
      sVar8._4_4_ = pfStack_2f00->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_2f00->seqtree_opt;
      pfVar18 = *ppfVar23;
      pbVar12 = (btree *)pfVar18->op_stats;
      pfStack_2f18 = (fdb_kvs_handle *)0x11affc;
      iVar7 = bcmp(ptr_fhandle,pbVar12,sVar8);
      pfVar34 = pfVar24;
      if (iVar7 != 0) {
        pfStack_2f18 = (fdb_kvs_handle *)0x11b2b8;
        sequence_iterator_seek_test();
        goto LAB_0011b2b8;
      }
      ptr_fhandle = (fdb_file_handle **)pfVar24->compactor_sleep_duration;
      pbVar12 = pfVar18->staletree;
      pfStack_2f18 = (fdb_kvs_handle *)0x11b01b;
      iVar7 = bcmp(ptr_fhandle,pbVar12,pfVar24->buffercache_size);
      if (iVar7 != 0) goto LAB_0011b2c8;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar24->multi_kv_instances;
      pbVar12 = (pfVar18->field_6).seqtree;
      pfStack_2f18 = (fdb_kvs_handle *)0x11b03a;
      iVar7 = bcmp(ptr_fhandle,pbVar12,pfVar24->wal_threshold);
      if (iVar7 != 0) goto LAB_0011b2bd;
      pfStack_2f18 = (fdb_kvs_handle *)0x11b04a;
      fdb_doc_free((fdb_doc *)pfVar24);
      pfStack_2f00 = (fdb_config *)0x0;
      pfStack_2f18 = (fdb_kvs_handle *)0x11b05d;
      fVar6 = fdb_iterator_prev((fdb_iterator *)pfStack_2f08);
      ppfVar23 = ppfVar23 + -1;
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_2f08;
    pfStack_2f18 = (fdb_kvs_handle *)0x11b077;
    fdb_iterator_close((fdb_iterator *)pfStack_2f08);
    pfStack_2f18 = (fdb_kvs_handle *)0x11b08e;
    fdb_iterator_sequence_init(pfStack_2ef8,(fdb_iterator **)ptr_iterator_00,0,7,0);
    pfStack_2f18 = (fdb_kvs_handle *)0x11b096;
    fVar6 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_2f08);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011b329;
    ppfVar23 = apfStack_2ea8 + 1;
    do {
      pfStack_2f18 = (fdb_kvs_handle *)0x11b0b5;
      fVar6 = fdb_iterator_get((fdb_iterator *)pfStack_2f08,(fdb_doc **)&pfStack_2f00);
      pfVar24 = pfStack_2f00;
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011b2de;
      sVar9._0_2_ = pfStack_2f00->chunksize;
      sVar9._2_2_ = *(undefined2 *)&pfStack_2f00->field_0x2;
      sVar9._4_4_ = pfStack_2f00->blocksize;
      ptr_fhandle = *(fdb_file_handle ***)&pfStack_2f00->seqtree_opt;
      pfVar18 = *ppfVar23;
      pbVar12 = (btree *)pfVar18->op_stats;
      pfStack_2f18 = (fdb_kvs_handle *)0x11b0dc;
      iVar7 = bcmp(ptr_fhandle,pbVar12,sVar9);
      if (iVar7 != 0) goto LAB_0011b2d3;
      ptr_fhandle = (fdb_file_handle **)pfVar24->compactor_sleep_duration;
      pbVar12 = pfVar18->staletree;
      pfStack_2f18 = (fdb_kvs_handle *)0x11b0fb;
      iVar7 = bcmp(ptr_fhandle,pbVar12,pfVar24->buffercache_size);
      if (iVar7 != 0) goto LAB_0011b2ee;
      ptr_fhandle = *(fdb_file_handle ***)&pfVar24->multi_kv_instances;
      pbVar12 = (pfVar18->field_6).seqtree;
      pfStack_2f18 = (fdb_kvs_handle *)0x11b11a;
      iVar7 = bcmp(ptr_fhandle,pbVar12,pfVar24->wal_threshold);
      if (iVar7 != 0) goto LAB_0011b2e3;
      pfStack_2f18 = (fdb_kvs_handle *)0x11b12a;
      fdb_doc_free((fdb_doc *)pfVar24);
      pfStack_2f00 = (fdb_config *)0x0;
      pfStack_2f18 = (fdb_kvs_handle *)0x11b13d;
      fVar6 = fdb_iterator_prev((fdb_iterator *)pfStack_2f08);
      ppfVar23 = ppfVar23 + -1;
      pfVar34 = pfVar24;
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    ptr_iterator_00 = &pfStack_2f08;
    pfStack_2f18 = (fdb_kvs_handle *)0x11b157;
    fdb_iterator_close((fdb_iterator *)pfStack_2f08);
    pfStack_2f18 = (fdb_kvs_handle *)0x11b171;
    fdb_iterator_sequence_init(pfStack_2ef8,(fdb_iterator **)ptr_iterator_00,0,7,8);
    pfStack_2f18 = (fdb_kvs_handle *)0x11b179;
    fVar6 = fdb_iterator_seek_to_max((fdb_iterator *)pfStack_2f08);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      ppfVar23 = apfStack_2ea8;
      while( true ) {
        pfStack_2f18 = (fdb_kvs_handle *)0x11b198;
        fVar6 = fdb_iterator_get((fdb_iterator *)pfStack_2f08,(fdb_doc **)&pfStack_2f00);
        pfVar24 = pfStack_2f00;
        if (fVar6 != FDB_RESULT_SUCCESS) break;
        sVar10._0_2_ = pfStack_2f00->chunksize;
        sVar10._2_2_ = *(undefined2 *)&pfStack_2f00->field_0x2;
        sVar10._4_4_ = pfStack_2f00->blocksize;
        ptr_fhandle = *(fdb_file_handle ***)&pfStack_2f00->seqtree_opt;
        pfVar18 = *ppfVar23;
        pbVar12 = (btree *)pfVar18->op_stats;
        pfStack_2f18 = (fdb_kvs_handle *)0x11b1bf;
        iVar7 = bcmp(ptr_fhandle,pbVar12,sVar10);
        if (iVar7 != 0) goto LAB_0011b2f9;
        ptr_fhandle = (fdb_file_handle **)pfVar24->compactor_sleep_duration;
        pbVar12 = pfVar18->staletree;
        pfStack_2f18 = (fdb_kvs_handle *)0x11b1de;
        iVar7 = bcmp(ptr_fhandle,pbVar12,pfVar24->buffercache_size);
        if (iVar7 != 0) goto LAB_0011b314;
        ptr_fhandle = *(fdb_file_handle ***)&pfVar24->multi_kv_instances;
        pbVar12 = (pfVar18->field_6).seqtree;
        pfStack_2f18 = (fdb_kvs_handle *)0x11b1fd;
        iVar7 = bcmp(ptr_fhandle,pbVar12,pfVar24->wal_threshold);
        if (iVar7 != 0) goto LAB_0011b309;
        pfStack_2f18 = (fdb_kvs_handle *)0x11b20d;
        fdb_doc_free((fdb_doc *)pfVar24);
        pfStack_2f00 = (fdb_config *)0x0;
        pfStack_2f18 = (fdb_kvs_handle *)0x11b220;
        fVar6 = fdb_iterator_prev((fdb_iterator *)pfStack_2f08);
        ppfVar23 = ppfVar23 + -1;
        pfVar34 = pfVar24;
        if (fVar6 == FDB_RESULT_ITERATOR_FAIL) {
          pfStack_2f18 = (fdb_kvs_handle *)0x11b237;
          fdb_iterator_close((fdb_iterator *)pfStack_2f08);
          pfStack_2f18 = (fdb_kvs_handle *)0x11b241;
          fdb_kvs_close(pfStack_2ef8);
          pfStack_2f18 = (fdb_kvs_handle *)0x11b24b;
          fdb_close(pfStack_2ef0);
          lVar28 = 0;
          do {
            pfStack_2f18 = (fdb_kvs_handle *)0x11b257;
            fdb_doc_free(apfStack_2ed0[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 10);
          pfStack_2f18 = (fdb_kvs_handle *)0x11b265;
          fdb_shutdown();
          pfStack_2f18 = (fdb_kvs_handle *)0x11b26a;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (sequence_iterator_seek_test(bool)::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pfStack_2f18 = (fdb_kvs_handle *)0x11b29b;
          fprintf(_stderr,pcVar27,"sequence iterator seek test");
          return;
        }
      }
LAB_0011b304:
      pfVar24 = pfVar34;
      pfStack_2f18 = (fdb_kvs_handle *)0x11b309;
      sequence_iterator_seek_test();
LAB_0011b309:
      pfStack_2f18 = (fdb_kvs_handle *)0x11b314;
      sequence_iterator_seek_test();
LAB_0011b314:
      ptr_iterator_00 = &pfStack_2f00;
      pfStack_2f18 = (fdb_kvs_handle *)0x11b31f;
      sequence_iterator_seek_test();
      goto LAB_0011b31f;
    }
  }
  else {
LAB_0011b31f:
    pfStack_2f18 = (fdb_kvs_handle *)0x11b324;
    sequence_iterator_seek_test();
LAB_0011b324:
    pfStack_2f18 = (fdb_kvs_handle *)0x11b329;
    sequence_iterator_seek_test();
LAB_0011b329:
    pfStack_2f18 = (fdb_kvs_handle *)0x11b32e;
    sequence_iterator_seek_test();
  }
  pfStack_2f18 = (fdb_kvs_handle *)iterator_concurrent_compaction;
  sequence_iterator_seek_test();
  ppfStack_32c0 = (fdb_doc **)0x11b350;
  ppfStack_2f40 = ptr_iterator_00;
  pbStack_2f38 = pbVar12;
  ppfStack_2f30 = ppfVar23;
  pfStack_2f28 = pfVar24;
  ppfStack_2f20 = ptr_fhandle;
  pfStack_2f18 = pfVar18;
  gettimeofday((timeval *)(auStack_3278 + 0x28),(__timezone_ptr_t)0x0);
  ppfStack_32c0 = (fdb_doc **)0x11b355;
  memleak_start();
  pfStack_32b0 = (fdb_kvs_handle *)0x0;
  ppfStack_32c0 = (fdb_doc **)0x11b36b;
  fdb_get_default_config();
  ppfStack_32c0 = (fdb_doc **)0x11b378;
  fdb_get_default_kvs_config();
  fStack_3240.wal_threshold = 0x400;
  fStack_3240.seqtree_opt = '\x01';
  fStack_3240.flags = 1;
  ppfStack_32c0 = (fdb_doc **)0x11b397;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_32c0 = (fdb_doc **)0x11b3ae;
  fdb_open(&pfStack_3290,"./iterator_test1",&fStack_3240);
  ppfStack_32c0 = (fdb_doc **)0x11b3c5;
  fdb_kvs_open(pfStack_3290,&pfStack_3298,"db",(fdb_kvs_config *)(auStack_3278 + 0x10));
  pcVar27 = "body%d";
  pfVar18 = (fdb_kvs_handle *)(apfStack_3148 + 0x20);
  ppfVar26 = (fdb_doc **)0x0;
  do {
    ppfStack_32c0 = (fdb_doc **)0x11b3f1;
    sprintf((char *)apfStack_3148,"key%d",ppfVar26);
    ppfStack_32c0 = (fdb_doc **)0x11b400;
    sprintf((char *)pfVar18,"body%d",ppfVar26);
    pfVar15 = pfStack_3298;
    ppfStack_32c0 = (fdb_doc **)0x11b40d;
    sVar8 = strlen((char *)apfStack_3148);
    ppfStack_32c0 = (fdb_doc **)0x11b418;
    sVar9 = strlen((char *)pfVar18);
    ppfStack_32c0 = (fdb_doc **)0x11b42c;
    fdb_set_kv(pfVar15,apfStack_3148,sVar8,pfVar18,sVar9);
    uVar35 = (int)ppfVar26 + 1;
    ppfVar26 = (fdb_doc **)(ulong)uVar35;
  } while (uVar35 != 10);
  ppfStack_32c0 = (fdb_doc **)0x11b43f;
  fdb_commit(pfStack_3290,'\0');
  ppfStack_32c0 = (fdb_doc **)0x11b458;
  fdb_open(&pfStack_3280,"./iterator_test1",&fStack_3240);
  ppfVar23 = (fdb_kvs_handle **)(auStack_3278 + 8);
  ppfStack_32c0 = (fdb_doc **)0x11b474;
  fdb_kvs_open(pfStack_3280,ppfVar23,"db",(fdb_kvs_config *)(auStack_3278 + 0x10));
  ppfStack_32c0 = (fdb_doc **)0x11b485;
  fdb_compact(pfStack_3290,"./iterator_test2");
  ppfStack_32c0 = (fdb_doc **)0x11b4a3;
  fVar6 = fdb_iterator_init((fdb_kvs_handle *)auStack_3278._8_8_,&pfStack_32a0,(void *)0x0,0,
                            (void *)0x0,0,0);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    ppfStack_32c0 = (fdb_doc **)0x11b4c1;
    fVar6 = fdb_iterator_sequence_init(pfStack_3298,&pfStack_32a8,0,0,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011b62d;
    pcVar27 = (char *)&pfStack_3288;
    pfVar18 = (fdb_kvs_handle *)auStack_3278;
    ppfVar26 = (fdb_doc **)0x0;
    do {
      ppfStack_32c0 = (fdb_doc **)0x11b4f3;
      sprintf((char *)apfStack_3148,"key%d",ppfVar26);
      pfVar15 = pfStack_3298;
      ppfStack_32c0 = (fdb_doc **)0x11b500;
      sVar8 = strlen((char *)apfStack_3148);
      ppfStack_32c0 = (fdb_doc **)0x11b514;
      fdb_get_kv(pfVar15,apfStack_3148,sVar8,(void **)pcVar27,(size_t *)pfVar18);
      ppfStack_32c0 = (fdb_doc **)0x11b51e;
      fdb_free_block(pfStack_3288);
      uVar35 = (int)ppfVar26 + 1;
      ppfVar26 = (fdb_doc **)(ulong)uVar35;
    } while (uVar35 != 10);
    ppfVar23 = &pfStack_32b0;
    do {
      pfStack_32b0 = (fdb_kvs_handle *)0x0;
      ppfStack_32c0 = (fdb_doc **)0x11b540;
      fVar6 = fdb_iterator_get(pfStack_32a0,(fdb_doc **)ppfVar23);
      if (fVar6 != FDB_RESULT_SUCCESS) {
        ppfStack_32c0 = (fdb_doc **)0x11b623;
        iterator_concurrent_compaction();
        goto LAB_0011b623;
      }
      ppfStack_32c0 = (fdb_doc **)0x11b552;
      fdb_doc_free((fdb_doc *)pfStack_32b0);
      ppfStack_32c0 = (fdb_doc **)0x11b55c;
      fVar6 = fdb_iterator_next(pfStack_32a0);
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_32c0 = (fdb_doc **)0x11b56b;
    fVar6 = fdb_iterator_close(pfStack_32a0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011b632;
    ppfVar23 = &pfStack_32b0;
    do {
      pfStack_32b0 = (fdb_kvs_handle *)0x0;
      ppfStack_32c0 = (fdb_doc **)0x11b58e;
      fVar6 = fdb_iterator_get(pfStack_32a8,(fdb_doc **)ppfVar23);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011b623;
      ppfStack_32c0 = (fdb_doc **)0x11b5a0;
      fdb_doc_free((fdb_doc *)pfStack_32b0);
      ppfStack_32c0 = (fdb_doc **)0x11b5aa;
      fVar6 = fdb_iterator_next(pfStack_32a8);
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
    ppfStack_32c0 = (fdb_doc **)0x11b5b9;
    fVar6 = fdb_iterator_close(pfStack_32a8);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      ppfStack_32c0 = (fdb_doc **)0x11b5c7;
      fdb_close(pfStack_3290);
      ppfStack_32c0 = (fdb_doc **)0x11b5d1;
      fdb_close(pfStack_3280);
      ppfStack_32c0 = (fdb_doc **)0x11b5d6;
      fdb_shutdown();
      ppfStack_32c0 = (fdb_doc **)0x11b5db;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_concurrent_compaction()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      ppfStack_32c0 = (fdb_doc **)0x11b60c;
      fprintf(_stderr,pcVar27,"iterator with concurrent compaction test");
      return;
    }
  }
  else {
LAB_0011b628:
    ppfStack_32c0 = (fdb_doc **)0x11b62d;
    iterator_concurrent_compaction();
LAB_0011b62d:
    ppfStack_32c0 = (fdb_doc **)0x11b632;
    iterator_concurrent_compaction();
LAB_0011b632:
    ppfStack_32c0 = (fdb_doc **)0x11b637;
    iterator_concurrent_compaction();
  }
  doc_00 = (char *)apfStack_3148;
  ppfStack_32c0 = (fdb_doc **)iterator_offset_access_test;
  iterator_concurrent_compaction();
  ppfStack_5598 = (fdb_doc **)0x11b659;
  ppfStack_32e8 = ppfVar23;
  pfStack_32e0 = pfVar18;
  ppfStack_32d0 = (fdb_doc **)doc_00;
  ppfStack_32c8 = (fdb_doc **)pcVar27;
  ppfStack_32c0 = ppfVar26;
  gettimeofday(&tStack_5540,(__timezone_ptr_t)0x0);
  ppfStack_5598 = (fdb_doc **)0x11b65e;
  memleak_start();
  pfStack_5570 = (fdb_doc *)0x0;
  ppfStack_5598 = (fdb_doc **)0x11b673;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar15 = (fdb_kvs_handle *)(auStack_5430 + 0x108);
  ppfStack_5598 = (fdb_doc **)0x11b683;
  fdb_get_default_config();
  ppfStack_5598 = (fdb_doc **)0x11b68d;
  fdb_get_default_kvs_config();
  auStack_5320[8] = '\0';
  auStack_5320[9] = '\x02';
  auStack_5320[10] = '\0';
  auStack_5320[0xb] = '\0';
  auStack_5320[0xc] = '\0';
  auStack_5320[0xd] = '\0';
  auStack_5320[0xe] = '\0';
  auStack_5320[0xf] = '\0';
  auStack_5320[0] = '\0';
  auStack_5320[1] = '\x10';
  auStack_5320[2] = '\0';
  auStack_5320[3] = '\0';
  auStack_5320[4] = '\0';
  auStack_5320[5] = '\0';
  auStack_5320[6] = '\0';
  auStack_5320[7] = '\0';
  uStack_5304 = 1;
  uStack_52fa = 0;
  uStack_530c = 1;
  ppfStack_5598 = (fdb_doc **)0x11b6c0;
  fVar6 = fdb_open(&pfStack_5580,"./iterator_test1",(fdb_config *)pfVar15);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    ppfStack_5598 = (fdb_doc **)0x11b6e3;
    fVar6 = fdb_kvs_open(pfStack_5580,&pfStack_5588,"DB",&fStack_5558);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bb7e;
    ppfStack_5598 = (fdb_doc **)0x11b706;
    fVar6 = fdb_kvs_open(pfStack_5580,&pfStack_5568,"ODB",&fStack_5558);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bb83;
    doc_00 = (char *)apfStack_5530;
    pfVar18 = (fdb_kvs_handle *)auStack_5430;
    pcVar27 = (char *)0x0;
    uVar17 = 0;
    do {
      ppfStack_5598 = (fdb_doc **)0x11b735;
      sprintf(doc_00,"key%d",uVar17 & 0xffffffff);
      ppfStack_5598 = (fdb_doc **)0x11b749;
      sprintf((char *)pfVar18,"body%d",uVar17 & 0xffffffff);
      ppfVar26 = (fdb_doc **)((long)apfStack_5230 + (long)pcVar27);
      ppfStack_5598 = (fdb_doc **)0x11b75c;
      pfVar15 = (fdb_kvs_handle *)strlen(doc_00);
      ppfStack_5598 = (fdb_doc **)0x11b767;
      sVar8 = strlen((char *)pfVar18);
      ppfStack_5598 = (fdb_doc **)0x11b781;
      fdb_doc_create(ppfVar26,doc_00,(size_t)pfVar15,(void *)0x0,0,pfVar18,sVar8);
      ppfStack_5598 = (fdb_doc **)0x11b793;
      fVar6 = fdb_set(pfStack_5588,apfStack_5230[uVar17]);
      pfVar13 = pfStack_5568;
      if (fVar6 != FDB_RESULT_SUCCESS) {
LAB_0011bb4c:
        ppfStack_5598 = (fdb_doc **)0x11bb51;
        iterator_offset_access_test();
        goto LAB_0011bb51;
      }
      ppfStack_5598 = (fdb_doc **)0x11b7a8;
      sVar8 = strlen(doc_00);
      ppfStack_5598 = (fdb_doc **)0x11b7c8;
      fVar6 = fdb_set_kv(pfVar13,doc_00,sVar8,&apfStack_5230[uVar17]->offset,8);
      pfVar15 = pfVar13;
      if (fVar6 != FDB_RESULT_SUCCESS) {
        ppfStack_5598 = (fdb_doc **)0x11bb4c;
        iterator_offset_access_test();
        goto LAB_0011bb4c;
      }
      uVar17 = uVar17 + 1;
      pcVar27 = (char *)((long)pcVar27 + 8);
    } while (uVar17 != 1000);
    ppfStack_5598 = (fdb_doc **)0x11b7f3;
    fVar6 = fdb_commit(pfStack_5580,'\x01');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bb88;
    pfVar15 = (fdb_kvs_handle *)0xfa;
    doc_00 = "key%d";
    pcVar27 = (char *)apfStack_5530;
    do {
      ppfStack_5598 = (fdb_doc **)0x11b81b;
      sprintf(pcVar27,"key%d",pfVar15);
      pfVar18 = pfStack_5588;
      ppfStack_5598 = (fdb_doc **)0x11b828;
      sVar8 = strlen(pcVar27);
      ppfStack_5598 = (fdb_doc **)0x11b836;
      fVar6 = fdb_del_kv(pfVar18,pcVar27,sVar8);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bb51;
      uVar35 = (int)pfVar15 + 1;
      pfVar15 = (fdb_kvs_handle *)(ulong)uVar35;
    } while (uVar35 != 500);
    doc_00 = (char *)apfStack_5530;
    pfVar18 = (fdb_kvs_handle *)auStack_5430;
    pcVar27 = (char *)0x0;
    uVar17 = 0;
    do {
      ppfStack_5598 = (fdb_doc **)0x11b86f;
      sprintf(doc_00,"k0y%d",uVar17 & 0xffffffff);
      ppfStack_5598 = (fdb_doc **)0x11b883;
      sprintf((char *)pfVar18,"b0dy%d",uVar17 & 0xffffffff);
      ppfVar26 = (fdb_doc **)((long)apfStack_5230 + (long)pcVar27);
      ppfStack_5598 = (fdb_doc **)0x11b89b;
      fdb_doc_free(apfStack_5230[uVar17]);
      ppfStack_5598 = (fdb_doc **)0x11b8a3;
      pfVar15 = (fdb_kvs_handle *)strlen(doc_00);
      ppfStack_5598 = (fdb_doc **)0x11b8ae;
      sVar8 = strlen((char *)pfVar18);
      ppfStack_5598 = (fdb_doc **)0x11b8c8;
      fdb_doc_create(ppfVar26,doc_00,(size_t)pfVar15,(void *)0x0,0,pfVar18,sVar8);
      ppfStack_5598 = (fdb_doc **)0x11b8da;
      fVar6 = fdb_set(pfStack_5588,apfStack_5230[uVar17]);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bb56;
      uVar17 = uVar17 + 1;
      pcVar27 = (char *)((long)pcVar27 + 8);
    } while (uVar17 != 0xfa);
    ppfStack_5598 = (fdb_doc **)0x11b902;
    fVar6 = fdb_commit(pfStack_5580,'\0');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bb8d;
    ppfStack_5598 = (fdb_doc **)0x11b92a;
    fdb_iterator_init(pfStack_5568,&pfStack_5578,(void *)0x0,0,(void *)0x0,0,2);
    pfVar18 = (fdb_kvs_handle *)0x1ea;
    pfVar15 = afStack_4290;
    doc_00 = (char *)&pfStack_5570;
    pcVar27 = (char *)&pfStack_5560;
    do {
      ppfStack_5598 = (fdb_doc **)0x11b94f;
      fVar6 = fdb_get_byoffset(pfStack_5588,*(fdb_doc **)&pfVar15->kvs_config);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bb60;
      ppfStack_5598 = (fdb_doc **)0x11b96d;
      fVar6 = fdb_iterator_seek(pfStack_5578,(void *)(*(size_t **)&pfVar15->kvs_config)[4],
                                **(size_t **)&pfVar15->kvs_config,'\0');
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bb5b;
      ppfStack_5598 = (fdb_doc **)0x11b982;
      fVar6 = fdb_iterator_get(pfStack_5578,(fdb_doc **)doc_00);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bb6a;
      pfVar21 = *(fdb_doc **)&pfVar15->kvs_config;
      if (*pfStack_5570->body != (*(fdb_doc **)&pfVar15->kvs_config)->offset) {
        ppfStack_5598 = (fdb_doc **)0x11b9e3;
        iterator_offset_access_test();
        pfVar21 = pfStack_5560;
      }
      ppfStack_5598 = (fdb_doc **)0x11b9a9;
      fVar6 = fdb_del(pfStack_5588,pfVar21);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bb65;
      ppfStack_5598 = (fdb_doc **)0x11b9be;
      fdb_get_metaonly(pfStack_5588,*(fdb_doc **)&pfVar15->kvs_config);
      pfVar18 = (fdb_kvs_handle *)((long)&(pfVar18->kvs_config).custom_cmp + 2);
      pfVar15 = (fdb_kvs_handle *)&pfVar15->dhandle;
    } while (pfVar18 < (fdb_kvs_handle *)0x3de);
    ppfStack_5598 = (fdb_doc **)0x11b9f4;
    fdb_iterator_close(pfStack_5578);
    ppfStack_5598 = (fdb_doc **)0x11ba03;
    fVar6 = fdb_commit(pfStack_5580,'\x01');
    if (fVar6 == FDB_RESULT_SUCCESS) {
      doc_00 = (char *)apfStack_5530;
      pcVar27 = "b1dy%d";
      pfVar18 = (fdb_kvs_handle *)auStack_5430;
      ppfVar26 = (fdb_doc **)0x0;
      do {
        ppfStack_5598 = (fdb_doc **)0x11ba34;
        sprintf(doc_00,"k1y%d",ppfVar26);
        ppfStack_5598 = (fdb_doc **)0x11ba43;
        sprintf((char *)pfVar18,"b1dy%d",ppfVar26);
        pfVar13 = pfStack_5588;
        ppfStack_5598 = (fdb_doc **)0x11ba50;
        pfVar15 = (fdb_kvs_handle *)strlen(doc_00);
        ppfStack_5598 = (fdb_doc **)0x11ba5b;
        sVar8 = strlen((char *)pfVar18);
        ppfStack_5598 = (fdb_doc **)0x11ba6f;
        fVar6 = fdb_set_kv(pfVar13,doc_00,(size_t)pfVar15,pfVar18,sVar8);
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bb6f;
        uVar35 = (int)ppfVar26 + 1;
        ppfVar26 = (fdb_doc **)(ulong)uVar35;
      } while (uVar35 != 0xfa);
      doc_00 = (char *)0x1ea;
      pfVar15 = afStack_4290;
      while( true ) {
        ppfStack_5598 = (fdb_doc **)0x11ba9c;
        fVar6 = fdb_get_byoffset(pfStack_5588,*(fdb_doc **)&pfVar15->kvs_config);
        if (fVar6 != FDB_RESULT_KEY_NOT_FOUND) break;
        if (*(char *)(*(long *)&pfVar15->kvs_config + 0x48) == '\0') {
          ppfStack_5598 = (fdb_doc **)0x11bac9;
          iterator_offset_access_test();
        }
        doc_00 = (char *)((long)doc_00 + 10);
        pfVar15 = (fdb_kvs_handle *)&pfVar15->dhandle;
        if ((fdb_doc **)0x3dd < doc_00) {
          lVar28 = 0;
          do {
            ppfStack_5598 = (fdb_doc **)0x11bada;
            fdb_doc_free(apfStack_5230[lVar28]);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 1000);
          ppfStack_5598 = (fdb_doc **)0x11baf0;
          fdb_doc_free(pfStack_5570);
          ppfStack_5598 = (fdb_doc **)0x11bafa;
          fdb_close(pfStack_5580);
          ppfStack_5598 = (fdb_doc **)0x11baff;
          fdb_shutdown();
          ppfStack_5598 = (fdb_doc **)0x11bb04;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (iterator_offset_access_test()::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          ppfStack_5598 = (fdb_doc **)0x11bb35;
          fprintf(_stderr,pcVar27,"iterator offset access test");
          return;
        }
      }
LAB_0011bb74:
      ppfStack_5598 = (fdb_doc **)0x11bb79;
      iterator_offset_access_test();
      goto LAB_0011bb79;
    }
  }
  else {
LAB_0011bb79:
    ppfStack_5598 = (fdb_doc **)0x11bb7e;
    iterator_offset_access_test();
LAB_0011bb7e:
    ppfStack_5598 = (fdb_doc **)0x11bb83;
    iterator_offset_access_test();
LAB_0011bb83:
    ppfStack_5598 = (fdb_doc **)0x11bb88;
    iterator_offset_access_test();
LAB_0011bb88:
    ppfStack_5598 = (fdb_doc **)0x11bb8d;
    iterator_offset_access_test();
LAB_0011bb8d:
    ppfStack_5598 = (fdb_doc **)0x11bb92;
    iterator_offset_access_test();
  }
  ppfStack_5598 = (fdb_doc **)iterator_deleted_doc_right_before_the_end_test;
  iterator_offset_access_test();
  ppfStack_5a20 = (fdb_iterator **)0x11bbb2;
  pfStack_55b8 = pfVar15;
  pfStack_55b0 = pfVar18;
  ppfStack_55a8 = (fdb_doc **)doc_00;
  ppfStack_55a0 = (fdb_doc **)pcVar27;
  ppfStack_5598 = ppfVar26;
  gettimeofday(&tStack_59e8,(__timezone_ptr_t)0x0);
  ppfStack_5a20 = (fdb_iterator **)0x11bbb7;
  memleak_start();
  ppfStack_5a20 = (fdb_iterator **)0x11bbc7;
  fdb_get_default_config();
  fStack_57b0.buffercache_size = 0;
  ppfStack_5a20 = (fdb_iterator **)0x11bbdf;
  fdb_get_default_kvs_config();
  ppfStack_5a20 = (fdb_iterator **)0x11bc02;
  sprintf(acStack_58b8,"rm -rf  %s*","./dummy");
  ppfStack_5a20 = (fdb_iterator **)0x11bc0a;
  system(acStack_58b8);
  ppfStack_5a20 = (fdb_iterator **)0x11bc1d;
  fdb_open(&pfStack_59f0,"./dummy",&fStack_57b0);
  ppfStack_5a20 = (fdb_iterator **)0x11bc30;
  fdb_kvs_open(pfStack_59f0,&pfStack_59f8,(char *)0x0,&fStack_58d0);
  uVar17 = 0;
  do {
    ppfStack_5a20 = (fdb_iterator **)0x11bc5c;
    sprintf((char *)apfStack_59d8,"k%06d\n",uVar17);
    ppfStack_5a20 = (fdb_iterator **)0x11bc6b;
    sprintf(acStack_56b8,"v%06d\n",uVar17);
    ppfStack_5a20 = (fdb_iterator **)0x11bc86;
    fdb_set_kv(pfStack_59f8,apfStack_59d8,8,acStack_56b8,8);
    uVar35 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar35;
  } while (uVar35 != 3);
  ppfStack_5a20 = (fdb_iterator **)0x11bca8;
  sprintf((char *)apfStack_59d8,"k%06d\n",1);
  ppfStack_5a20 = (fdb_iterator **)0x11bcba;
  fdb_del_kv(pfStack_59f8,apfStack_59d8,8);
  ppfStack_5a20 = (fdb_iterator **)0x11bcc6;
  fdb_commit(pfStack_59f0,'\0');
  apfStack_59d8[0]._0_2_ = 0x61;
  acStack_58b8[0] = 'z';
  acStack_58b8[1] = '\0';
  ppfStack_5a20 = (fdb_iterator **)0x11bcfd;
  fVar6 = fdb_iterator_init(pfStack_59f8,&pfStack_5a08,apfStack_59d8,1,acStack_58b8,1,2);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    ppfStack_5a20 = (fdb_iterator **)0x11bd0f;
    fVar6 = fdb_iterator_seek_to_max(pfStack_5a08);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bf38;
    pfStack_5a00 = (fdb_doc *)0x0;
    ppfStack_5a20 = (fdb_iterator **)0x11bd2d;
    fVar6 = fdb_iterator_get(pfStack_5a08,&pfStack_5a00);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bf3d;
    ppfStack_5a20 = (fdb_iterator **)0x11bd50;
    sprintf((char *)apfStack_59d8,"k%06d\n",2);
    if (*pfStack_5a00->key != CONCAT62(apfStack_59d8[0]._2_6_,apfStack_59d8[0]._0_2_))
    goto LAB_0011bf42;
    ppfStack_5a20 = (fdb_iterator **)0x11bd6a;
    fdb_doc_free(pfStack_5a00);
    ppfStack_5a20 = (fdb_iterator **)0x11bd74;
    fVar6 = fdb_iterator_prev(pfStack_5a08);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bf4c;
    pfStack_5a00 = (fdb_doc *)0x0;
    ppfStack_5a20 = (fdb_iterator **)0x11bd92;
    fVar6 = fdb_iterator_get(pfStack_5a08,&pfStack_5a00);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bf51;
    ppfStack_5a20 = (fdb_iterator **)0x11bdb2;
    sprintf((char *)apfStack_59d8,"k%06d\n",0);
    if (*pfStack_5a00->key != CONCAT62(apfStack_59d8[0]._2_6_,apfStack_59d8[0]._0_2_))
    goto LAB_0011bf56;
    ppfStack_5a20 = (fdb_iterator **)0x11bdcc;
    fdb_doc_free(pfStack_5a00);
    ppfVar14 = &pfStack_5a08;
    ppfStack_5a20 = (fdb_iterator **)0x11bdd9;
    fdb_iterator_close(pfStack_5a08);
    ppfStack_5a20 = (fdb_iterator **)0x11be05;
    fVar6 = fdb_iterator_init(pfStack_59f8,ppfVar14,apfStack_59d8,1,acStack_58b8,1,2);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bf60;
    ppfStack_5a20 = (fdb_iterator **)0x11be17;
    fVar6 = fdb_iterator_seek_to_min(pfStack_5a08);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bf65;
    pfStack_5a00 = (fdb_doc *)0x0;
    ppfStack_5a20 = (fdb_iterator **)0x11be35;
    fVar6 = fdb_iterator_get(pfStack_5a08,&pfStack_5a00);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bf6a;
    ppfVar14 = apfStack_59d8;
    ppfStack_5a20 = (fdb_iterator **)0x11be55;
    sprintf((char *)ppfVar14,"k%06d\n",0);
    if (*pfStack_5a00->key != CONCAT62(apfStack_59d8[0]._2_6_,apfStack_59d8[0]._0_2_))
    goto LAB_0011bf6f;
    ppfStack_5a20 = (fdb_iterator **)0x11be6f;
    fdb_doc_free(pfStack_5a00);
    ppfStack_5a20 = (fdb_iterator **)0x11be79;
    fVar6 = fdb_iterator_next(pfStack_5a08);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bf79;
    pfStack_5a00 = (fdb_doc *)0x0;
    ppfStack_5a20 = (fdb_iterator **)0x11be97;
    fVar6 = fdb_iterator_get(pfStack_5a08,&pfStack_5a00);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011bf7e;
    ppfVar14 = apfStack_59d8;
    ppfStack_5a20 = (fdb_iterator **)0x11beba;
    sprintf((char *)ppfVar14,"k%06d\n",2);
    if (*pfStack_5a00->key == CONCAT62(apfStack_59d8[0]._2_6_,apfStack_59d8[0]._0_2_)) {
      ppfStack_5a20 = (fdb_iterator **)0x11bed4;
      fdb_doc_free(pfStack_5a00);
      ppfStack_5a20 = (fdb_iterator **)0x11bede;
      fdb_iterator_close(pfStack_5a08);
      ppfStack_5a20 = (fdb_iterator **)0x11bee8;
      fdb_close(pfStack_59f0);
      ppfStack_5a20 = (fdb_iterator **)0x11beed;
      fdb_shutdown();
      ppfStack_5a20 = (fdb_iterator **)0x11bef2;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_deleted_doc_right_before_the_end_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      ppfStack_5a20 = (fdb_iterator **)0x11bf23;
      fprintf(_stderr,pcVar27,"iterator deleted doc right before the end of iteration test");
      return;
    }
  }
  else {
    ppfStack_5a20 = (fdb_iterator **)0x11bf38;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf38:
    ppfStack_5a20 = (fdb_iterator **)0x11bf3d;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf3d:
    ppfStack_5a20 = (fdb_iterator **)0x11bf42;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf42:
    ppfStack_5a20 = (fdb_iterator **)0x11bf4c;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf4c:
    ppfStack_5a20 = (fdb_iterator **)0x11bf51;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf51:
    ppfStack_5a20 = (fdb_iterator **)0x11bf56;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf56:
    ppfVar14 = apfStack_59d8;
    ppfStack_5a20 = (fdb_iterator **)0x11bf60;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf60:
    ppfStack_5a20 = (fdb_iterator **)0x11bf65;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf65:
    ppfStack_5a20 = (fdb_iterator **)0x11bf6a;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf6a:
    ppfStack_5a20 = (fdb_iterator **)0x11bf6f;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf6f:
    ppfStack_5a20 = (fdb_iterator **)0x11bf79;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf79:
    ppfStack_5a20 = (fdb_iterator **)0x11bf7e;
    iterator_deleted_doc_right_before_the_end_test();
LAB_0011bf7e:
    ppfStack_5a20 = (fdb_iterator **)0x11bf83;
    iterator_deleted_doc_right_before_the_end_test();
  }
  ppfStack_5a20 = (fdb_iterator **)iterator_uncommited_seeks;
  iterator_deleted_doc_right_before_the_end_test();
  pcStack_5b78 = (code *)0x11bfa1;
  ppfStack_5a20 = ppfVar14;
  gettimeofday(&tStack_5b28,(__timezone_ptr_t)0x0);
  pfStack_5b60 = (fdb_doc *)0x0;
  pcStack_5b78 = (code *)0x11bfaf;
  memleak_start();
  pfVar24 = &fStack_5b18;
  pcStack_5b78 = (code *)0x11bfbc;
  fdb_get_default_config();
  pcStack_5b78 = (code *)0x11bfc6;
  fdb_get_default_kvs_config();
  pcStack_5b78 = (code *)0x11bfd2;
  system("rm -rf  iterator_test* > errorlog.txt");
  pcStack_5b78 = (code *)0x11bfe6;
  fVar6 = fdb_open(&pfStack_5b48,"./iterator_test1",pfVar24);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pcStack_5b78 = (code *)0x11c002;
    fVar6 = fdb_kvs_open_default(pfStack_5b48,&pfStack_5b50,&fStack_5b40);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c20d;
    pcStack_5b78 = (code *)0x11c025;
    fdb_set_kv(pfStack_5b50,"a",1,(void *)0x0,0);
    pfVar24 = (fdb_config *)0x154b95;
    pcStack_5b78 = (code *)0x11c043;
    fdb_set_kv(pfStack_5b50,"b",1,(void *)0x0,0);
    pcStack_5b78 = (code *)0x11c05e;
    fdb_set_kv(pfStack_5b50,"c",1,(void *)0x0,0);
    pcStack_5b78 = (code *)0x11c082;
    fVar6 = fdb_iterator_init(pfStack_5b50,&pfStack_5b58,"b",1,(void *)0x0,0,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c214;
    pcStack_5b78 = (code *)0x11c094;
    fVar6 = fdb_iterator_seek_to_min(pfStack_5b58);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c219;
    pcStack_5b78 = (code *)0x11c0ab;
    fVar6 = fdb_iterator_get(pfStack_5b58,&pfStack_5b60);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c220;
    if (*pfStack_5b60->key != 'b') goto LAB_0011c227;
    pcStack_5b78 = (code *)0x11c0ca;
    fdb_doc_free(pfStack_5b60);
    pfStack_5b60 = (fdb_doc *)0x0;
    pcStack_5b78 = (code *)0x11c0dd;
    fVar6 = fdb_iterator_seek_to_max(pfStack_5b58);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c22f;
    pcStack_5b78 = (code *)0x11c0f4;
    fVar6 = fdb_iterator_get(pfStack_5b58,&pfStack_5b60);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c236;
    if (*pfStack_5b60->key != 'c') goto LAB_0011c23d;
    pcStack_5b78 = (code *)0x11c113;
    fdb_doc_free(pfStack_5b60);
    pfStack_5b60 = (fdb_doc *)0x0;
    pcStack_5b78 = (code *)0x11c126;
    fVar6 = fdb_iterator_prev(pfStack_5b58);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c245;
    pcStack_5b78 = (code *)0x11c13d;
    fVar6 = fdb_iterator_get(pfStack_5b58,&pfStack_5b60);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c24c;
    if (*pfStack_5b60->key != 'b') goto LAB_0011c253;
    pcStack_5b78 = (code *)0x11c15c;
    fdb_doc_free(pfStack_5b60);
    pfStack_5b60 = (fdb_doc *)0x0;
    pcStack_5b78 = (code *)0x11c16f;
    fVar6 = fdb_iterator_next(pfStack_5b58);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c25b;
    pcStack_5b78 = (code *)0x11c186;
    fVar6 = fdb_iterator_get(pfStack_5b58,&pfStack_5b60);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c262;
    if (*pfStack_5b60->key == 'c') {
      pcStack_5b78 = (code *)0x11c1a5;
      fdb_doc_free(pfStack_5b60);
      pfStack_5b60 = (fdb_doc *)0x0;
      pcStack_5b78 = (code *)0x11c1b8;
      fdb_iterator_close(pfStack_5b58);
      pcStack_5b78 = (code *)0x11c1c2;
      fdb_close(pfStack_5b48);
      pcStack_5b78 = (code *)0x11c1c7;
      fdb_shutdown();
      pcStack_5b78 = (code *)0x11c1cc;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_uncommited_seeks()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pcStack_5b78 = (code *)0x11c1fd;
      fprintf(_stderr,pcVar27,"iterator single doc range");
      return;
    }
  }
  else {
    pcStack_5b78 = (code *)0x11c20d;
    iterator_uncommited_seeks();
LAB_0011c20d:
    pcStack_5b78 = (code *)0x11c214;
    iterator_uncommited_seeks();
LAB_0011c214:
    pcStack_5b78 = (code *)0x11c219;
    iterator_uncommited_seeks();
LAB_0011c219:
    pcStack_5b78 = (code *)0x11c220;
    iterator_uncommited_seeks();
LAB_0011c220:
    pcStack_5b78 = (code *)0x11c227;
    iterator_uncommited_seeks();
LAB_0011c227:
    pcStack_5b78 = (code *)0x11c22f;
    iterator_uncommited_seeks();
LAB_0011c22f:
    pcStack_5b78 = (code *)0x11c236;
    iterator_uncommited_seeks();
LAB_0011c236:
    pcStack_5b78 = (code *)0x11c23d;
    iterator_uncommited_seeks();
LAB_0011c23d:
    pcStack_5b78 = (code *)0x11c245;
    iterator_uncommited_seeks();
LAB_0011c245:
    pcStack_5b78 = (code *)0x11c24c;
    iterator_uncommited_seeks();
LAB_0011c24c:
    pcStack_5b78 = (code *)0x11c253;
    iterator_uncommited_seeks();
LAB_0011c253:
    pcStack_5b78 = (code *)0x11c25b;
    iterator_uncommited_seeks();
LAB_0011c25b:
    pcStack_5b78 = (code *)0x11c262;
    iterator_uncommited_seeks();
LAB_0011c262:
    pcStack_5b78 = (code *)0x11c269;
    iterator_uncommited_seeks();
  }
  pcStack_5b78 = iterator_init_using_substring_test;
  iterator_uncommited_seeks();
  pfStack_5f20 = (fdb_config *)0x11c28b;
  pfStack_5b88 = pfVar24;
  pcStack_5b80 = (char *)apfStack_59d8;
  pcStack_5b78 = (code *)uVar17;
  gettimeofday(&tStack_5e98,(__timezone_ptr_t)0x0);
  pfStack_5f20 = (fdb_config *)0x11c290;
  memleak_start();
  pfVar24 = &fStack_5d80;
  pfStack_5f20 = (fdb_config *)0x11c2a0;
  fdb_get_default_config();
  fStack_5d80.buffercache_size = 0;
  pfStack_5f20 = (fdb_config *)0x11c2b2;
  fdb_get_default_kvs_config();
  pfStack_5f20 = (fdb_config *)0x11c2d2;
  sprintf(acStack_5c88,"rm -rf  %s*","./iterator_test");
  pfStack_5f20 = (fdb_config *)0x11c2da;
  system(acStack_5c88);
  pfStack_5f20 = (fdb_config *)0x11c2ee;
  fVar6 = fdb_open(&pfStack_5ef8,"./iterator_test1",pfVar24);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pfStack_5f20 = (fdb_config *)0x11c30c;
    fVar6 = fdb_kvs_open(pfStack_5ef8,&pfStack_5f00,(char *)0x0,&fStack_5eb0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c4a6;
    uStack_5ec0 = 0x34323634353773;
    uStack_5eb9 = 0xff;
    uStack_5ed8 = 0x34323634353773;
    uStack_5ed1 = 0x10000ff;
    uStack_5ec8._0_4_ = 0x34353773;
    uStack_5ec8._4_1_ = true;
    uStack_5ec8._5_1_ = true;
    uStack_5ec8._6_1_ = '4';
    uStack_5ec8._7_1_ = 0xff;
    uStack_5ee8 = 0xff34323634353773;
    uStack_5ee0 = 0xff;
    uStack_5e88 = 0x3179656b;
    uStack_5e84 = 0;
    pfStack_5f20 = (fdb_config *)0x11c370;
    fVar6 = fdb_set_kv(pfStack_5f00,&uStack_5ec0,0xb,&uStack_5e88,4);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c4ab;
    uStack_5e84 = 0;
    uStack_5e88 = 0x3279656b;
    pfStack_5f20 = (fdb_config *)0x11c3a4;
    fVar6 = fdb_set_kv(pfStack_5f00,&uStack_5ed8,0xb,&uStack_5e88,4);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c4b0;
    pfStack_5f20 = (fdb_config *)0x11c3bb;
    fVar6 = fdb_commit(pfStack_5ef8,'\x01');
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c4b5;
    pfStack_5f20 = (fdb_config *)0x11c3ee;
    fVar6 = fdb_iterator_init(pfStack_5f00,&pfStack_5f08,&uStack_5ec8,8,&uStack_5ee8,9,10);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c4ba;
    iVar7 = 0;
    pfVar24 = (fdb_config *)&pfStack_5ef0;
    do {
      pfStack_5ef0 = (fdb_doc *)0x0;
      pfStack_5f20 = (fdb_config *)0x11c413;
      fVar6 = fdb_iterator_get(pfStack_5f08,(fdb_doc **)pfVar24);
      if (fVar6 != FDB_RESULT_SUCCESS) break;
      iVar7 = iVar7 + 1;
      pfStack_5f20 = (fdb_config *)0x11c423;
      fdb_doc_free(pfStack_5ef0);
      pfStack_5f20 = (fdb_config *)0x11c42d;
      fVar6 = fdb_iterator_next(pfStack_5f08);
    } while (fVar6 == FDB_RESULT_SUCCESS);
    if (iVar7 != 2) goto LAB_0011c4bf;
    pfStack_5f20 = (fdb_config *)0x11c444;
    fVar6 = fdb_iterator_close(pfStack_5f08);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c4c4;
    pfStack_5f20 = (fdb_config *)0x11c452;
    fVar6 = fdb_close(pfStack_5ef8);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c4c9;
    pfStack_5f20 = (fdb_config *)0x11c45b;
    fVar6 = fdb_shutdown();
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pfStack_5f20 = (fdb_config *)0x11c464;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_init_using_substring_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pfStack_5f20 = (fdb_config *)0x11c495;
      fprintf(_stderr,pcVar27,"iterator init using substring test");
      return;
    }
  }
  else {
    pfStack_5f20 = (fdb_config *)0x11c4a6;
    iterator_init_using_substring_test();
LAB_0011c4a6:
    pfStack_5f20 = (fdb_config *)0x11c4ab;
    iterator_init_using_substring_test();
LAB_0011c4ab:
    pfStack_5f20 = (fdb_config *)0x11c4b0;
    iterator_init_using_substring_test();
LAB_0011c4b0:
    pfStack_5f20 = (fdb_config *)0x11c4b5;
    iterator_init_using_substring_test();
LAB_0011c4b5:
    pfStack_5f20 = (fdb_config *)0x11c4ba;
    iterator_init_using_substring_test();
LAB_0011c4ba:
    pfStack_5f20 = (fdb_config *)0x11c4bf;
    iterator_init_using_substring_test();
LAB_0011c4bf:
    pfStack_5f20 = (fdb_config *)0x11c4c4;
    iterator_init_using_substring_test();
LAB_0011c4c4:
    pfStack_5f20 = (fdb_config *)0x11c4c9;
    iterator_init_using_substring_test();
LAB_0011c4c9:
    pfStack_5f20 = (fdb_config *)0x11c4ce;
    iterator_init_using_substring_test();
  }
  pfStack_5f20 = (fdb_config *)iterator_seek_to_max_key_with_deletes_test;
  iterator_init_using_substring_test();
  pfStack_6078 = (fdb_config *)0x11c4e9;
  pfStack_5f20 = pfVar24;
  gettimeofday(&tStack_6028,(__timezone_ptr_t)0x0);
  pfStack_6078 = (fdb_config *)0x11c4ee;
  memleak_start();
  pfStack_6060 = (fdb_iterator *)0x0;
  pfStack_6050 = (fdb_doc *)0x0;
  pfVar24 = &fStack_6018;
  pfStack_6078 = (fdb_config *)0x11c505;
  fdb_get_default_config();
  pfStack_6078 = (fdb_config *)0x11c50f;
  fdb_get_default_kvs_config();
  pfStack_6078 = (fdb_config *)0x11c51b;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfStack_6078 = (fdb_config *)0x11c52f;
  fVar6 = fdb_open(&pfStack_6048,"./iterator_test1",pfVar24);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pfStack_6078 = (fdb_config *)0x11c54b;
    fVar6 = fdb_kvs_open_default(pfStack_6048,&pfStack_6058,&fStack_6040);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c708;
    pfStack_6078 = (fdb_config *)0x11c56e;
    fdb_set_kv(pfStack_6058,"A",1,(void *)0x0,0);
    pfVar24 = (fdb_config *)0x154dcc;
    pfStack_6078 = (fdb_config *)0x11c58c;
    fdb_set_kv(pfStack_6058,"B",1,(void *)0x0,0);
    pfStack_6078 = (fdb_config *)0x11c5b7;
    fVar6 = fdb_iterator_init(pfStack_6058,&pfStack_6060,"B",1,"Bzz",3,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c70f;
    pfStack_6078 = (fdb_config *)0x11c5c9;
    fVar6 = fdb_iterator_seek_to_max(pfStack_6060);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c714;
    pfStack_6078 = (fdb_config *)0x11c5e0;
    fVar6 = fdb_iterator_get(pfStack_6060,&pfStack_6050);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c71b;
    if (*pfStack_6050->key != 'B') goto LAB_0011c722;
    pfStack_6078 = (fdb_config *)0x11c5ff;
    fdb_doc_free(pfStack_6050);
    pfStack_6050 = (fdb_doc *)0x0;
    pfStack_6078 = (fdb_config *)0x11c612;
    fVar6 = fdb_iterator_close(pfStack_6060);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c72a;
    pfStack_6060 = (fdb_iterator *)0x0;
    pfStack_6078 = (fdb_config *)0x11c639;
    fVar6 = fdb_del_kv(pfStack_6058,"B",1);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c731;
    pfStack_6078 = (fdb_config *)0x11c670;
    fVar6 = fdb_iterator_init(pfStack_6058,&pfStack_6060,"B",1,"Bzz",3,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c738;
    pfStack_6078 = (fdb_config *)0x11c687;
    fVar6 = fdb_iterator_get(pfStack_6060,&pfStack_6050);
    if (fVar6 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c73d;
    pfStack_6078 = (fdb_config *)0x11c69a;
    fVar6 = fdb_iterator_seek_to_max(pfStack_6060);
    if (fVar6 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c742;
    pfStack_6078 = (fdb_config *)0x11c6ad;
    fVar6 = fdb_close(pfStack_6048);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c747;
    pfStack_6078 = (fdb_config *)0x11c6ba;
    fVar6 = fdb_shutdown();
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pfStack_6078 = (fdb_config *)0x11c6c7;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (iterator_seek_to_max_key_with_deletes_test()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pfStack_6078 = (fdb_config *)0x11c6f8;
      fprintf(_stderr,pcVar27,"iterator seek to max test");
      return;
    }
  }
  else {
    pfStack_6078 = (fdb_config *)0x11c708;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c708:
    pfStack_6078 = (fdb_config *)0x11c70f;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c70f:
    pfStack_6078 = (fdb_config *)0x11c714;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c714:
    pfStack_6078 = (fdb_config *)0x11c71b;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c71b:
    pfStack_6078 = (fdb_config *)0x11c722;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c722:
    pfStack_6078 = (fdb_config *)0x11c72a;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c72a:
    pfStack_6078 = (fdb_config *)0x11c731;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c731:
    pfStack_6078 = (fdb_config *)0x11c738;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c738:
    pfStack_6078 = (fdb_config *)0x11c73d;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c73d:
    pfStack_6078 = (fdb_config *)0x11c742;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c742:
    pfStack_6078 = (fdb_config *)0x11c747;
    iterator_seek_to_max_key_with_deletes_test();
LAB_0011c747:
    pfStack_6078 = (fdb_config *)0x11c74e;
    iterator_seek_to_max_key_with_deletes_test();
  }
  pfStack_6078 = (fdb_config *)iterator_seek_to_min_key_with_deletes_test;
  iterator_seek_to_max_key_with_deletes_test();
  pfStack_6078 = pfVar24;
  gettimeofday(&tStack_6180,(__timezone_ptr_t)0x0);
  memleak_start();
  pfStack_61b8 = (fdb_iterator *)0x0;
  pfStack_61a0 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar6 = fdb_open(&pfStack_61a8,"./iterator_test1",&fStack_6170);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    fVar6 = fdb_kvs_open_default(pfStack_61a8,&pfStack_61b0,&fStack_6198);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c8f5;
    fdb_set_kv(pfStack_61b0,"B",1,(void *)0x0,0);
    fdb_set_kv(pfStack_61b0,"C",1,(void *)0x0,0);
    fVar6 = fdb_del_kv(pfStack_61b0,"B",1);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c8fc;
    fVar6 = fdb_iterator_init(pfStack_61b0,&pfStack_61b8,"A",1,"B",1,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c903;
    fVar6 = fdb_iterator_get(pfStack_61b8,&pfStack_61a0);
    if (fVar6 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c908;
    fVar6 = fdb_iterator_seek_to_min(pfStack_61b8);
    if (fVar6 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011c90d;
    fVar6 = fdb_iterator_close(pfStack_61b8);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011c912;
    fVar6 = fdb_close(pfStack_61a8);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      fVar6 = fdb_shutdown();
      if (fVar6 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar27 = "%s PASSED\n";
        if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
          pcVar27 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar27,"iterator seek to min test");
        return;
      }
      goto LAB_0011c920;
    }
  }
  else {
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8f5:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c8fc:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c903:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c908:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c90d:
    iterator_seek_to_min_key_with_deletes_test();
LAB_0011c912:
    iterator_seek_to_min_key_with_deletes_test();
  }
  iterator_seek_to_min_key_with_deletes_test();
LAB_0011c920:
  iterator_seek_to_min_key_with_deletes_test();
  iterator_test();
  iterator_with_concurrent_updates_test();
  iterator_compact_uncommitted_db();
  iterator_seek_test();
  iVar7 = 0;
  do {
    iterator_complete_test(iVar7,0);
    iterator_complete_test(iVar7,1);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 7);
  iterator_extreme_key_test();
  iterator_inmem_snapshot_seek_test(false);
  iterator_inmem_snapshot_seek_test(true);
  iterator_no_deletes_test();
  iterator_set_del_docs_test();
  iterator_del_next_test();
  sequence_iterator_test();
  sequence_iterator_duplicate_test();
  sequence_iterator_range_test();
  reverse_seek_to_max_nokey();
  reverse_sequence_iterator_test();
  reverse_sequence_iterator_kvs_test();
  reverse_iterator_test();
  iterator_seek_wal_only_test();
  iterator_after_wal_threshold();
  iterator_manual_wal_flush();
  sequence_iterator_seek_test(true);
  sequence_iterator_seek_test(false);
  iterator_concurrent_compaction();
  iterator_offset_access_test();
  iterator_deleted_doc_right_before_the_end_test();
  iterator_uncommited_seeks();
  iterator_init_using_substring_test();
  iterator_seek_to_max_key_with_deletes_test();
  iterator_seek_to_min_key_with_deletes_test();
  return;
}

Assistant:

void sequence_iterator_duplicate_test()
{
    // Unit test for MB-12225
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 100;
    int count;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_seqnum_t seqnum;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1; // retain deletes until compaction

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "sequence_iterator_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents first time
    for (i=0;i<n;i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d(first)", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents second time
    for (i=0;i<n;i++){
        sprintf(bodybuf, "body%d(second)", i);
        fdb_doc_update(&doc[i], NULL, 0, bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents third time (only even number documents)
    for (i=0;i<n;i+=2){
        sprintf(bodybuf, "body%d(third)", i);
        fdb_doc_update(&doc[i], NULL, 0, bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without WAL flushing
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator over sequence number
    fdb_iterator_sequence_init(db, &iterator, 0, 220, FDB_ITR_NONE);

    // repeat until fail
    count = 0;
    seqnum = 100;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (seqnum < 140) { // point where WAL range & trie range overlap ends!
            seqnum += 2; // WAL overlap with trie, get unique trie keys only
        } else { // beyond this even keys in trie are also in WAL but outside..
            seqnum ++; // the iteration range, so they can be sequentially got
        }

        if (seqnum <= 200) { // uptil WAL, unique trie items are returned...
            i = seqnum - 101;
            sprintf(bodybuf, "body%d(second)", i);
        } else { // once seqnum enters WAL range only WAL elements are returned..
            i = ((seqnum - 101) % n) * 2;
            sprintf(bodybuf, "body%d(third)", i);
        }
        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        TEST_CHK(rdoc->seqnum == seqnum);

        count++;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count==n); // since 220 > n all keys should be iterated
    fdb_iterator_close(iterator);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);
    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }
    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("sequence iterator duplicate test");
}